

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O1

size_t ZSTD_compressBlock_btultra2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  optState_t *poVar1;
  ulong *puVar2;
  ulong *puVar3;
  BYTE **ppBVar4;
  ulong *puVar5;
  ZSTD_optimal_t *pZVar6;
  ZSTD_match_t *pZVar7;
  ulong uVar8;
  seqDef *psVar9;
  ulong uVar10;
  undefined8 uVar11;
  uint uVar12;
  U32 UVar13;
  U32 UVar14;
  U32 UVar15;
  U32 UVar16;
  BYTE *op;
  ulong uVar17;
  ZSTD_optimal_t *pZVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  uint uVar23;
  uint *puVar24;
  BYTE *base;
  bool bVar25;
  uint uVar26;
  uint uVar27;
  undefined8 unaff_RBP;
  BYTE *pStart_29;
  ulong uVar28;
  ulong *puVar29;
  ulong *puVar30;
  uint uVar31;
  int iVar32;
  int iVar33;
  ulong uVar34;
  ulong *puVar35;
  ZSTD_optimal_t *pZVar36;
  BYTE *pBVar37;
  BYTE *pStart;
  ulong *puVar38;
  ulong *puVar39;
  ulong uVar40;
  BYTE *pStart_3;
  ulong *puVar41;
  ulong *puVar42;
  ZSTD_optimal_t *pZVar43;
  ulong *puVar44;
  BYTE *pBVar45;
  BYTE *pBVar46;
  uint uVar47;
  U32 UVar48;
  int iVar49;
  BYTE *pStart_11;
  ulong *puVar50;
  ulong uVar51;
  ulong uVar52;
  BYTE *pBVar53;
  uint uVar54;
  BYTE *pStart_10;
  ulong *puVar55;
  BYTE *pBVar56;
  int iVar57;
  BYTE *pBVar58;
  U32 *pUVar59;
  ZSTD_matchState_t *pZVar60;
  bool bVar61;
  bool bVar62;
  repcodes_t rVar63;
  BYTE *pStart_17;
  BYTE *pInLoopLimit;
  BYTE *pInLoopLimit_16;
  U32 dummy32;
  U32 dummy32_4;
  ulong *local_1f0;
  U32 local_1e8;
  ulong *local_1d8;
  BYTE *local_1c8;
  ZSTD_optimal_t *local_1c0;
  uint *local_1b8;
  uint *local_1b0;
  uint *local_1a8;
  ulong *local_1a0;
  ulong *local_198;
  uint *local_188;
  uint *local_180;
  ulong *local_178;
  ZSTD_optimal_t *local_168;
  uint *local_148;
  uint *local_140;
  ZSTD_optimal_t *local_130;
  BYTE *local_128;
  uint local_114;
  ZSTD_optimal_t *local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  U32 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  ulong *local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  U32 local_b4;
  U32 *local_b0;
  undefined8 local_a8;
  U32 *local_a0;
  U32 *local_98;
  undefined8 local_90;
  ulong local_88;
  ZSTD_optimal_t *local_80;
  ulong *local_78;
  U32 *local_70;
  U32 *local_68;
  U32 *local_60;
  ulong local_58;
  ulong *local_50;
  undefined8 local_48;
  U32 local_40;
  size_t local_38;
  
  local_98 = rep;
  local_78 = (ulong *)src;
  if (((ms->opt).litLengthSum == 0) && (seqStore->sequences == seqStore->sequencesStart)) {
    uVar12 = (ms->window).dictLimit;
    if ((uVar12 == (ms->window).lowLimit) &&
       ((0x400 < srcSize && (pBVar37 = (ms->window).base, uVar12 == (int)src - (int)pBVar37)))) {
      local_f0 = rep[2];
      local_f8 = *(undefined8 *)rep;
      poVar1 = &ms->opt;
      puVar50 = (ulong *)((long)src + (srcSize - 8));
      uVar19 = (ms->cParams).targetLength;
      if (0xffe < uVar19) {
        uVar19 = 0xfff;
      }
      local_90 = CONCAT44(local_90._4_4_,uVar19);
      bVar61 = (ms->cParams).minMatch != 3;
      uVar28 = CONCAT71((int7)((ulong)unaff_RBP >> 8),bVar61);
      pZVar7 = (ms->opt).matchTable;
      pZVar36 = (ms->opt).priceTable;
      ms->nextToUpdate3 = ms->nextToUpdate;
      local_38 = srcSize;
      ZSTD_rescaleFreqs(poVar1,(BYTE *)src,srcSize,2);
      puVar38 = (ulong *)((ulong)(pBVar37 + uVar12 == (BYTE *)src) + (long)src);
      if (puVar38 < puVar50) {
        puVar5 = (ulong *)((long)local_78 + local_38);
        uVar12 = (uint)bVar61;
        uVar19 = uVar12 + 3;
        local_d0 = (ulong *)(ulong)(uVar12 + 2);
        puVar55 = (ulong *)((long)puVar5 - 7);
        puVar2 = (ulong *)((long)puVar5 - 3);
        puVar3 = (ulong *)((long)puVar5 - 1);
        local_68 = pZVar36->rep;
        local_c8 = (ZSTD_optimal_t *)(ulong)uVar19;
        local_70 = (U32 *)(ulong)uVar19;
        pZVar6 = pZVar36 + 1;
        local_1d8 = local_78;
        local_80 = (ZSTD_optimal_t *)local_78;
        local_e0 = local_78;
        local_110 = pZVar36;
        do {
          iVar32 = (int)puVar38;
          uVar12 = iVar32 - (int)local_1d8;
          pBVar37 = (ms->window).base;
          uVar17 = (ulong)ms->nextToUpdate;
          local_1f0._0_4_ = 0;
          if (pBVar37 + uVar17 <= puVar38) {
            uVar19 = (ms->cParams).minMatch;
            uVar21 = (ulong)uVar19;
            uVar26 = iVar32 - (int)pBVar37;
            for (; pZVar36 = local_110, (uint)uVar17 < uVar26;
                uVar17 = (ulong)((uint)uVar17 + UVar13)) {
              UVar13 = ZSTD_insertBt1(ms,pBVar37 + uVar17,(BYTE *)puVar5,uVar19,0);
            }
            ms->nextToUpdate = uVar26;
            if (uVar19 - 6 < 2) {
              uVar17 = (ulong)(uVar12 == 0);
              uVar19 = (ms->cParams).targetLength;
              if (0xffe < uVar19) {
                uVar19 = 0xfff;
              }
              local_d8 = (uint *)(ms->window).base;
              uVar20 = iVar32 - (int)local_d8;
              local_a0 = (U32 *)(*puVar38 * -0x30e4432340650000 >>
                                (-(char)(ms->cParams).hashLog & 0x3fU));
              pUVar59 = ms->chainTable;
              uVar31 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
              uVar23 = uVar20 - uVar31;
              uVar26 = 0;
              if (uVar20 < uVar31) {
                uVar23 = 0;
              }
              UVar13 = (ms->window).lowLimit;
              uVar21 = (ulong)((uVar31 & uVar20) * 2);
              local_1b8 = pUVar59 + uVar21;
              local_1a8 = pUVar59 + uVar21 + 1;
              uVar54 = uVar20 - (ms->window).dictLimit;
              local_88 = CONCAT44(local_88._4_4_,uVar54);
              iVar57 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
              bVar61 = true;
              local_b0 = ms->hashTable;
              uVar34 = (ulong)local_b0[(long)local_a0];
              local_e8 = (ulong *)(ulong)uVar20;
              iVar32 = uVar20 + 9;
              uVar21 = uVar17 + 3;
              puVar39 = (ulong *)((long)puVar38 + 4);
              local_108 = (ulong *)((long)puVar38 + 0xc);
              puVar35 = local_d0;
              local_1f0 = local_108;
              do {
                uVar47 = (U32)local_f8 - 1;
                if (uVar17 != 3) {
                  uVar47 = *(uint *)((long)&local_f8 + uVar17 * 4);
                }
                uVar27 = 0;
                if ((uVar47 - 1 < uVar54) &&
                   (uVar27 = 0, (uint)*puVar38 == *(uint *)((long)puVar38 - (ulong)uVar47))) {
                  puVar41 = (ulong *)((long)puVar39 - (ulong)uVar47);
                  puVar44 = puVar39;
                  if (puVar39 < puVar55) {
                    uVar40 = *puVar39 ^ *puVar41;
                    uVar52 = 0;
                    if (uVar40 != 0) {
                      for (; (uVar40 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                      }
                    }
                    uVar52 = uVar52 >> 3 & 0x1fffffff;
                    iVar33 = (int)uVar52;
                    puVar44 = local_108;
                    if (*puVar41 == *puVar39) {
                      do {
                        puVar41 = puVar41 + 1;
                        if (puVar55 <= puVar44) goto LAB_0011c92f;
                        uVar40 = *puVar41;
                        uVar51 = *puVar44;
                        uVar8 = 0;
                        if ((uVar51 ^ uVar40) != 0) {
                          for (; ((uVar51 ^ uVar40) >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                          }
                        }
                        puVar30 = (ulong *)((uVar8 >> 3 & 0x1fffffff) + (long)puVar44);
                        puVar44 = puVar44 + 1;
                        if (uVar40 != uVar51) {
                          uVar52 = (long)puVar30 - (long)puVar39;
                          puVar44 = puVar30;
                        }
                        iVar33 = (int)uVar52;
                      } while (uVar40 == uVar51);
                    }
                  }
                  else {
LAB_0011c92f:
                    if ((puVar44 < puVar2) && ((uint)*puVar41 == (uint)*puVar44)) {
                      puVar44 = (ulong *)((long)puVar44 + 4);
                      puVar41 = (ulong *)((long)puVar41 + 4);
                    }
                    if ((puVar44 < puVar3) && ((short)*puVar41 == (short)*puVar44)) {
                      puVar44 = (ulong *)((long)puVar44 + 2);
                      puVar41 = (ulong *)((long)puVar41 + 2);
                    }
                    if (puVar44 < puVar5) {
                      puVar44 = (ulong *)((long)puVar44 + (ulong)((BYTE)*puVar41 == (BYTE)*puVar44))
                      ;
                    }
                    iVar33 = (int)puVar44 - (int)puVar39;
                  }
                  uVar27 = iVar33 + 4;
                }
                puVar44 = (ulong *)(ulong)uVar27;
                bVar25 = true;
                if (puVar35 < puVar44) {
                  pZVar7[uVar26].off = (int)uVar17 - (uint)(uVar12 == 0);
                  uVar47 = uVar26 + 1;
                  pZVar7[uVar26].len = uVar27;
                  bVar62 = (ulong *)((long)puVar38 + (long)puVar44) != puVar5;
                  bVar25 = bVar62 && uVar27 <= uVar19;
                  local_1f0 = (ulong *)((ulong)local_1f0 & 0xffffffff);
                  puVar35 = puVar44;
                  uVar26 = uVar47;
                  if (!bVar62 || uVar27 > uVar19) {
                    local_1f0 = (ulong *)(ulong)uVar47;
                  }
                }
                if (!bVar25) break;
                uVar17 = uVar17 + 1;
                bVar61 = uVar17 < uVar21;
              } while (bVar61);
              if (!bVar61) {
                local_b0[(long)local_a0] = uVar20;
                local_e8 = (ulong *)(ulong)(uVar20 + 2);
                local_1f0 = (ulong *)0x0;
                puVar39 = (ulong *)0x0;
                do {
                  bVar61 = iVar57 == 0;
                  iVar57 = iVar57 + -1;
                  if ((bVar61) || (uVar19 = (uint)uVar34, uVar19 < UVar13 + (UVar13 == 0))) break;
                  puVar44 = local_1f0;
                  if (puVar39 < local_1f0) {
                    puVar44 = puVar39;
                  }
                  puVar41 = (ulong *)((long)puVar38 + (long)puVar44);
                  puVar30 = (ulong *)(uVar34 + (long)local_d8 + (long)puVar44);
                  puVar29 = puVar41;
                  if (puVar41 < puVar55) {
                    uVar21 = *puVar41 ^ *puVar30;
                    uVar17 = 0;
                    if (uVar21 != 0) {
                      for (; (uVar21 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                      }
                    }
                    pBVar37 = (BYTE *)(uVar17 >> 3 & 0x1fffffff);
                    if (*puVar30 == *puVar41) {
                      do {
                        puVar29 = puVar29 + 1;
                        puVar30 = puVar30 + 1;
                        if (puVar55 <= puVar29) goto LAB_0011cb11;
                        uVar21 = *puVar29 ^ *puVar30;
                        uVar17 = 0;
                        if (uVar21 != 0) {
                          for (; (uVar21 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                          }
                        }
                        pBVar37 = (BYTE *)((long)puVar29 +
                                          ((uVar17 >> 3 & 0x1fffffff) - (long)puVar41));
                        pZVar36 = local_110;
                      } while (*puVar30 == *puVar29);
                    }
                  }
                  else {
LAB_0011cb11:
                    if ((puVar29 < puVar2) && ((uint)*puVar30 == (uint)*puVar29)) {
                      puVar29 = (ulong *)((long)puVar29 + 4);
                      puVar30 = (ulong *)((long)puVar30 + 4);
                    }
                    if ((puVar29 < puVar3) && ((short)*puVar30 == (short)*puVar29)) {
                      puVar29 = (ulong *)((long)puVar29 + 2);
                      puVar30 = (ulong *)((long)puVar30 + 2);
                    }
                    if (puVar29 < puVar5) {
                      puVar29 = (ulong *)((long)puVar29 + (ulong)((BYTE)*puVar30 == (BYTE)*puVar29))
                      ;
                    }
                    pBVar37 = (BYTE *)((long)puVar29 - (long)puVar41);
                  }
                  puVar44 = (ulong *)(pBVar37 + (long)puVar44);
                  if (puVar35 < puVar44) {
                    iVar33 = uVar19 + (U32)puVar44;
                    if (puVar44 <= (ulong *)(ulong)(iVar32 - uVar19)) {
                      iVar33 = iVar32;
                    }
                    pZVar7[uVar26].off = (int)local_e8 - uVar19;
                    pZVar7[uVar26].len = (U32)puVar44;
                    uVar26 = uVar26 + 1;
                    bVar61 = false;
                    puVar35 = puVar44;
                    iVar32 = iVar33;
                    if ((puVar44 < (ulong *)0x1001) &&
                       ((ulong *)((long)puVar38 + (long)puVar44) != puVar5)) goto LAB_0011cbd1;
                  }
                  else {
LAB_0011cbd1:
                    puVar24 = pUVar59 + (uVar19 & uVar31) * 2;
                    if (*(byte *)(uVar34 + (long)local_d8 + (long)puVar44) <
                        *(byte *)((long)puVar38 + (long)puVar44)) {
                      *local_1b8 = uVar19;
                      puVar39 = puVar44;
                      if (uVar23 < uVar19) {
                        puVar24 = puVar24 + 1;
                        local_1b8 = puVar24;
LAB_0011cc31:
                        uVar34 = (ulong)*puVar24;
                        bVar61 = true;
                      }
                      else {
                        bVar61 = false;
                        local_1b8 = &local_114;
                      }
                    }
                    else {
                      *local_1a8 = uVar19;
                      local_1f0 = puVar44;
                      local_1a8 = puVar24;
                      if (uVar23 < uVar19) goto LAB_0011cc31;
                      bVar61 = false;
                      local_1a8 = &local_114;
                    }
                  }
                } while (bVar61);
LAB_0011d6f5:
                local_1f0._0_4_ = uVar26;
                *local_1a8 = 0;
                *local_1b8 = 0;
                ms->nextToUpdate = iVar32 - 8;
              }
            }
            else if (uVar19 == 5) {
              uVar17 = (ulong)(uVar12 == 0);
              uVar19 = (ms->cParams).targetLength;
              if (0xffe < uVar19) {
                uVar19 = 0xfff;
              }
              local_d8 = (uint *)(ms->window).base;
              uVar20 = iVar32 - (int)local_d8;
              local_a0 = (U32 *)(*puVar38 * -0x30e4432345000000 >>
                                (-(char)(ms->cParams).hashLog & 0x3fU));
              pUVar59 = ms->chainTable;
              uVar31 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
              uVar23 = uVar20 - uVar31;
              if (uVar20 < uVar31) {
                uVar23 = 0;
              }
              UVar13 = (ms->window).lowLimit;
              uVar21 = (ulong)((uVar31 & uVar20) * 2);
              local_1b8 = pUVar59 + uVar21;
              local_1a8 = pUVar59 + uVar21 + 1;
              uVar47 = uVar20 - (ms->window).dictLimit;
              local_88 = CONCAT44(local_88._4_4_,uVar47);
              iVar57 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
              bVar61 = true;
              local_b0 = ms->hashTable;
              uVar34 = (ulong)local_b0[(long)local_a0];
              local_e8 = (ulong *)(ulong)uVar20;
              iVar32 = uVar20 + 9;
              uVar21 = uVar17 + 3;
              puVar39 = (ulong *)((long)puVar38 + 4);
              local_108 = (ulong *)((long)puVar38 + 0xc);
              puVar35 = local_d0;
              local_1f0 = local_108;
              uVar54 = 0;
              do {
                uVar26 = (U32)local_f8 - 1;
                if (uVar17 != 3) {
                  uVar26 = *(uint *)((long)&local_f8 + uVar17 * 4);
                }
                uVar27 = 0;
                if ((uVar26 - 1 < uVar47) &&
                   (uVar27 = 0, (uint)*puVar38 == *(uint *)((long)puVar38 - (ulong)uVar26))) {
                  puVar41 = (ulong *)((long)puVar39 - (ulong)uVar26);
                  puVar44 = puVar39;
                  if (puVar39 < puVar55) {
                    uVar40 = *puVar39 ^ *puVar41;
                    uVar52 = 0;
                    if (uVar40 != 0) {
                      for (; (uVar40 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                      }
                    }
                    uVar52 = uVar52 >> 3 & 0x1fffffff;
                    iVar33 = (int)uVar52;
                    puVar44 = local_108;
                    if (*puVar41 == *puVar39) {
                      do {
                        puVar41 = puVar41 + 1;
                        if (puVar55 <= puVar44) goto LAB_0011ce81;
                        uVar40 = *puVar41;
                        uVar51 = *puVar44;
                        uVar8 = 0;
                        if ((uVar51 ^ uVar40) != 0) {
                          for (; ((uVar51 ^ uVar40) >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                          }
                        }
                        puVar30 = (ulong *)((uVar8 >> 3 & 0x1fffffff) + (long)puVar44);
                        puVar44 = puVar44 + 1;
                        if (uVar40 != uVar51) {
                          uVar52 = (long)puVar30 - (long)puVar39;
                          puVar44 = puVar30;
                        }
                        iVar33 = (int)uVar52;
                      } while (uVar40 == uVar51);
                    }
                  }
                  else {
LAB_0011ce81:
                    if ((puVar44 < puVar2) && ((uint)*puVar41 == (uint)*puVar44)) {
                      puVar44 = (ulong *)((long)puVar44 + 4);
                      puVar41 = (ulong *)((long)puVar41 + 4);
                    }
                    if ((puVar44 < puVar3) && ((short)*puVar41 == (short)*puVar44)) {
                      puVar44 = (ulong *)((long)puVar44 + 2);
                      puVar41 = (ulong *)((long)puVar41 + 2);
                    }
                    if (puVar44 < puVar5) {
                      puVar44 = (ulong *)((long)puVar44 + (ulong)((BYTE)*puVar41 == (BYTE)*puVar44))
                      ;
                    }
                    iVar33 = (int)puVar44 - (int)puVar39;
                  }
                  uVar27 = iVar33 + 4;
                }
                puVar44 = (ulong *)(ulong)uVar27;
                bVar25 = true;
                uVar26 = uVar54;
                if (puVar35 < puVar44) {
                  pZVar7[uVar54].off = (int)uVar17 - (uint)(uVar12 == 0);
                  uVar26 = uVar54 + 1;
                  pZVar7[uVar54].len = uVar27;
                  bVar62 = (ulong *)((long)puVar38 + (long)puVar44) != puVar5;
                  bVar25 = bVar62 && uVar27 <= uVar19;
                  local_1f0 = (ulong *)((ulong)local_1f0 & 0xffffffff);
                  puVar35 = puVar44;
                  if (!bVar62 || uVar27 > uVar19) {
                    local_1f0 = (ulong *)(ulong)uVar26;
                  }
                }
                if (!bVar25) break;
                uVar17 = uVar17 + 1;
                bVar61 = uVar17 < uVar21;
                uVar54 = uVar26;
              } while (bVar61);
              if (!bVar61) {
                local_b0[(long)local_a0] = uVar20;
                local_e8 = (ulong *)(ulong)(uVar20 + 2);
                local_1f0 = (ulong *)0x0;
                puVar39 = (ulong *)0x0;
                do {
                  bVar61 = iVar57 == 0;
                  iVar57 = iVar57 + -1;
                  if ((bVar61) || (uVar19 = (uint)uVar34, uVar19 < UVar13 + (UVar13 == 0))) break;
                  puVar44 = local_1f0;
                  if (puVar39 < local_1f0) {
                    puVar44 = puVar39;
                  }
                  puVar41 = (ulong *)((long)puVar38 + (long)puVar44);
                  puVar30 = (ulong *)(uVar34 + (long)local_d8 + (long)puVar44);
                  puVar29 = puVar41;
                  if (puVar41 < puVar55) {
                    uVar21 = *puVar41 ^ *puVar30;
                    uVar17 = 0;
                    if (uVar21 != 0) {
                      for (; (uVar21 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                      }
                    }
                    pBVar37 = (BYTE *)(uVar17 >> 3 & 0x1fffffff);
                    if (*puVar30 == *puVar41) {
                      do {
                        puVar29 = puVar29 + 1;
                        puVar30 = puVar30 + 1;
                        if (puVar55 <= puVar29) goto LAB_0011d053;
                        uVar21 = *puVar29 ^ *puVar30;
                        uVar17 = 0;
                        if (uVar21 != 0) {
                          for (; (uVar21 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                          }
                        }
                        pBVar37 = (BYTE *)((long)puVar29 +
                                          ((uVar17 >> 3 & 0x1fffffff) - (long)puVar41));
                        pZVar36 = local_110;
                      } while (*puVar30 == *puVar29);
                    }
                  }
                  else {
LAB_0011d053:
                    if ((puVar29 < puVar2) && ((uint)*puVar30 == (uint)*puVar29)) {
                      puVar29 = (ulong *)((long)puVar29 + 4);
                      puVar30 = (ulong *)((long)puVar30 + 4);
                    }
                    if ((puVar29 < puVar3) && ((short)*puVar30 == (short)*puVar29)) {
                      puVar29 = (ulong *)((long)puVar29 + 2);
                      puVar30 = (ulong *)((long)puVar30 + 2);
                    }
                    if (puVar29 < puVar5) {
                      puVar29 = (ulong *)((long)puVar29 + (ulong)((BYTE)*puVar30 == (BYTE)*puVar29))
                      ;
                    }
                    pBVar37 = (BYTE *)((long)puVar29 - (long)puVar41);
                  }
                  puVar44 = (ulong *)(pBVar37 + (long)puVar44);
                  if (puVar35 < puVar44) {
                    iVar33 = uVar19 + (U32)puVar44;
                    if (puVar44 <= (ulong *)(ulong)(iVar32 - uVar19)) {
                      iVar33 = iVar32;
                    }
                    pZVar7[uVar26].off = (int)local_e8 - uVar19;
                    pZVar7[uVar26].len = (U32)puVar44;
                    uVar26 = uVar26 + 1;
                    bVar61 = false;
                    puVar35 = puVar44;
                    iVar32 = iVar33;
                    if ((puVar44 < (ulong *)0x1001) &&
                       ((ulong *)((long)puVar38 + (long)puVar44) != puVar5)) goto LAB_0011d113;
                  }
                  else {
LAB_0011d113:
                    puVar24 = pUVar59 + (uVar19 & uVar31) * 2;
                    if (*(byte *)(uVar34 + (long)local_d8 + (long)puVar44) <
                        *(byte *)((long)puVar38 + (long)puVar44)) {
                      *local_1b8 = uVar19;
                      puVar39 = puVar44;
                      if (uVar23 < uVar19) {
                        puVar24 = puVar24 + 1;
                        local_1b8 = puVar24;
LAB_0011d173:
                        uVar34 = (ulong)*puVar24;
                        bVar61 = true;
                      }
                      else {
                        bVar61 = false;
                        local_1b8 = &local_114;
                      }
                    }
                    else {
                      *local_1a8 = uVar19;
                      local_1f0 = puVar44;
                      local_1a8 = puVar24;
                      if (uVar23 < uVar19) goto LAB_0011d173;
                      bVar61 = false;
                      local_1a8 = &local_114;
                    }
                  }
                } while (bVar61);
                goto LAB_0011d6f5;
              }
            }
            else if (uVar19 == 3) {
              uVar17 = (ulong)(uVar12 == 0);
              uVar19 = (ms->cParams).targetLength;
              if (0xffe < uVar19) {
                uVar19 = 0xfff;
              }
              pBVar37 = (ms->window).base;
              uVar31 = iVar32 - (int)pBVar37;
              local_a0 = (U32 *)(ulong)((uint)*puVar38 * -0x61c8864f >>
                                       (-(char)(ms->cParams).hashLog & 0x1fU));
              pUVar59 = ms->chainTable;
              uVar23 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
              uVar26 = uVar31 - uVar23;
              if (uVar31 < uVar23) {
                uVar26 = 0;
              }
              UVar13 = (ms->window).lowLimit;
              uVar20 = UVar13 + (UVar13 == 0);
              uVar34 = (ulong)((uVar23 & uVar31) * 2);
              local_1a8 = pUVar59 + uVar34;
              local_d8 = pUVar59 + uVar34 + 1;
              UVar13 = (ms->window).dictLimit;
              local_88 = CONCAT44(local_88._4_4_,1 << ((byte)(ms->cParams).searchLog & 0x1f));
              bVar61 = true;
              local_b0 = ms->hashTable;
              local_108 = (ulong *)(ulong)ms->hashTable[(long)local_a0];
              iVar32 = uVar31 + 9;
              uVar34 = uVar17 + 3;
              puVar39 = (ulong *)((long)puVar38 + 3);
              local_e8 = (ulong *)((long)puVar38 + 0xb);
              local_1c0 = (ZSTD_optimal_t *)local_d0;
              uVar52 = 0;
              do {
                uVar54 = (U32)local_f8 - 1;
                if (uVar17 != 3) {
                  uVar54 = *(uint *)((long)&local_f8 + uVar17 * 4);
                }
                uVar47 = 0;
                if ((uVar54 - 1 < uVar31 - UVar13) &&
                   (uVar47 = 0,
                   ((*(uint *)((long)puVar38 - (ulong)uVar54) ^ (uint)*puVar38) & 0xffffff) == 0)) {
                  puVar44 = (ulong *)((long)puVar39 - (ulong)uVar54);
                  puVar35 = puVar39;
                  if (puVar39 < puVar55) {
                    uVar51 = *puVar39 ^ *puVar44;
                    uVar40 = 0;
                    if (uVar51 != 0) {
                      for (; (uVar51 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                      }
                    }
                    uVar40 = uVar40 >> 3 & 0x1fffffff;
                    iVar57 = (int)uVar40;
                    puVar35 = (ulong *)((long)puVar38 + 0xb);
                    if (*puVar44 == *puVar39) {
                      do {
                        puVar44 = puVar44 + 1;
                        if (puVar55 <= puVar35) goto LAB_0011c646;
                        uVar51 = *puVar44;
                        uVar8 = *puVar35;
                        uVar10 = 0;
                        if ((uVar8 ^ uVar51) != 0) {
                          for (; ((uVar8 ^ uVar51) >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                          }
                        }
                        puVar41 = (ulong *)((uVar10 >> 3 & 0x1fffffff) + (long)puVar35);
                        puVar35 = puVar35 + 1;
                        if (uVar51 != uVar8) {
                          uVar40 = (long)puVar41 - (long)puVar39;
                          puVar35 = puVar41;
                        }
                        iVar57 = (int)uVar40;
                      } while (uVar51 == uVar8);
                    }
                  }
                  else {
LAB_0011c646:
                    if ((puVar35 < puVar2) && ((uint)*puVar44 == (uint)*puVar35)) {
                      puVar35 = (ulong *)((long)puVar35 + 4);
                      puVar44 = (ulong *)((long)puVar44 + 4);
                    }
                    if ((puVar35 < puVar3) && ((short)*puVar44 == (short)*puVar35)) {
                      puVar35 = (ulong *)((long)puVar35 + 2);
                      puVar44 = (ulong *)((long)puVar44 + 2);
                    }
                    if (puVar35 < puVar5) {
                      puVar35 = (ulong *)((long)puVar35 + (ulong)((BYTE)*puVar44 == (BYTE)*puVar35))
                      ;
                    }
                    iVar57 = (int)puVar35 - (int)puVar39;
                  }
                  uVar47 = iVar57 + 3;
                }
                puVar35 = (ulong *)(ulong)uVar47;
                bVar25 = true;
                uVar40 = uVar52;
                if (local_1c0 < puVar35) {
                  pZVar7[uVar52].off = (int)uVar17 - (uint)(uVar12 == 0);
                  uVar40 = (ulong)((int)uVar52 + 1);
                  pZVar7[uVar52].len = uVar47;
                  bVar62 = (ulong *)((long)puVar38 + (long)puVar35) != puVar5;
                  bVar25 = bVar62 && uVar47 <= uVar19;
                  local_1c0 = (ZSTD_optimal_t *)puVar35;
                  if (!bVar62 || uVar47 > uVar19) {
                    uVar21 = uVar40;
                  }
                }
                local_1f0._0_4_ = (uint)uVar21;
                if (!bVar25) break;
                uVar17 = uVar17 + 1;
                bVar61 = uVar17 < uVar34;
                uVar52 = uVar40;
              } while (bVar61);
              if (!bVar61) {
                if (local_1c0 < (ulong *)0x3) {
                  UVar13 = ZSTD_insertAndFindFirstIndexHash3(ms,(BYTE *)puVar38);
                  bVar61 = true;
                  if ((uVar20 <= UVar13) && (uVar31 - UVar13 < 0x40000)) {
                    puVar35 = (ulong *)(pBVar37 + UVar13);
                    puVar39 = puVar38;
                    if (puVar38 < puVar55) {
                      uVar21 = *puVar38 ^ *puVar35;
                      uVar17 = 0;
                      if (uVar21 != 0) {
                        for (; (uVar21 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                        }
                      }
                      puVar44 = (ulong *)(uVar17 >> 3 & 0x1fffffff);
                      if (*puVar35 == *puVar38) {
                        do {
                          puVar39 = puVar39 + 1;
                          puVar35 = puVar35 + 1;
                          if (puVar55 <= puVar39) goto LAB_0011d824;
                          uVar21 = *puVar39 ^ *puVar35;
                          uVar17 = 0;
                          if (uVar21 != 0) {
                            for (; (uVar21 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                            }
                          }
                          puVar44 = (ulong *)((long)puVar39 +
                                             ((uVar17 >> 3 & 0x1fffffff) - (long)puVar38));
                        } while (*puVar35 == *puVar39);
                      }
                    }
                    else {
LAB_0011d824:
                      if ((puVar39 < puVar2) && ((uint)*puVar35 == (uint)*puVar39)) {
                        puVar39 = (ulong *)((long)puVar39 + 4);
                        puVar35 = (ulong *)((long)puVar35 + 4);
                      }
                      if ((puVar39 < puVar3) && ((short)*puVar35 == (short)*puVar39)) {
                        puVar39 = (ulong *)((long)puVar39 + 2);
                        puVar35 = (ulong *)((long)puVar35 + 2);
                      }
                      if (puVar39 < puVar5) {
                        puVar39 = (ulong *)((long)puVar39 +
                                           (ulong)((BYTE)*puVar35 == (BYTE)*puVar39));
                      }
                      puVar44 = (ulong *)((long)puVar39 - (long)puVar38);
                    }
                    if ((ulong *)0x2 < puVar44) {
                      pZVar7->off = (uVar31 - UVar13) + 2;
                      pZVar7->len = (U32)puVar44;
                      local_1c0 = (ZSTD_optimal_t *)puVar44;
                      if (((ulong *)(ulong)uVar19 < puVar44) ||
                         (uVar40 = 1, (ulong *)((long)puVar38 + (long)puVar44) == puVar5)) {
                        ms->nextToUpdate = uVar31 + 1;
                        uVar40 = 1;
                        bVar61 = false;
                        local_1f0._0_4_ = 1;
                      }
                    }
                  }
                  if (!bVar61) goto LAB_0011db82;
                }
                local_b0[(long)local_a0] = uVar31;
                puVar39 = (ulong *)0x0;
                puVar35 = (ulong *)0x0;
                puVar44 = local_108;
                local_1f0 = (ulong *)uVar40;
                do {
                  if (((U32)local_88 == 0) || (uVar19 = (uint)puVar44, uVar19 < uVar20)) break;
                  local_88 = CONCAT44(local_88._4_4_,(U32)local_88 + -1);
                  puVar41 = puVar39;
                  if (puVar35 < puVar39) {
                    puVar41 = puVar35;
                  }
                  puVar30 = (ulong *)((long)puVar38 + (long)puVar41);
                  puVar29 = (ulong *)(pBVar37 + ((ulong)puVar44 & 0xffffffff) + (long)puVar41);
                  puVar42 = puVar30;
                  if (puVar30 < puVar55) {
                    uVar21 = *puVar30 ^ *puVar29;
                    uVar17 = 0;
                    if (uVar21 != 0) {
                      for (; (uVar21 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                      }
                    }
                    pBVar46 = (BYTE *)(uVar17 >> 3 & 0x1fffffff);
                    if (*puVar29 == *puVar30) {
                      do {
                        puVar42 = puVar42 + 1;
                        puVar29 = puVar29 + 1;
                        if (puVar55 <= puVar42) goto LAB_0011d9ca;
                        uVar21 = *puVar42 ^ *puVar29;
                        uVar17 = 0;
                        if (uVar21 != 0) {
                          for (; (uVar21 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                          }
                        }
                        pBVar46 = (BYTE *)((long)puVar42 +
                                          ((uVar17 >> 3 & 0x1fffffff) - (long)puVar30));
                      } while (*puVar29 == *puVar42);
                    }
                  }
                  else {
LAB_0011d9ca:
                    if ((puVar42 < puVar2) && ((uint)*puVar29 == (uint)*puVar42)) {
                      puVar42 = (ulong *)((long)puVar42 + 4);
                      puVar29 = (ulong *)((long)puVar29 + 4);
                    }
                    if ((puVar42 < puVar3) && ((short)*puVar29 == (short)*puVar42)) {
                      puVar42 = (ulong *)((long)puVar42 + 2);
                      puVar29 = (ulong *)((long)puVar29 + 2);
                    }
                    if (puVar42 < puVar5) {
                      puVar42 = (ulong *)((long)puVar42 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar42))
                      ;
                    }
                    pBVar46 = (BYTE *)((long)puVar42 - (long)puVar30);
                  }
                  puVar41 = (ulong *)(pBVar46 + (long)puVar41);
                  iVar57 = iVar32;
                  if (local_1c0 < puVar41) {
                    iVar57 = (U32)puVar41 + uVar19;
                    if (puVar41 <= (ulong *)(ulong)(iVar32 - uVar19)) {
                      iVar57 = iVar32;
                    }
                    pZVar7[(long)local_1f0].off = (uVar31 + 2) - uVar19;
                    pZVar7[(long)local_1f0].len = (U32)puVar41;
                    local_1f0 = (ulong *)(ulong)((uint)local_1f0 + 1);
                    bVar61 = false;
                    iVar32 = iVar57;
                    local_1c0 = (ZSTD_optimal_t *)puVar41;
                    if (puVar41 < (ulong *)0x1001) {
                      if ((ulong *)((long)puVar38 + (long)puVar41) != puVar5) goto LAB_0011daa1;
LAB_0011db29:
                      bVar61 = false;
                      iVar32 = iVar57;
                    }
                  }
                  else {
LAB_0011daa1:
                    puVar24 = pUVar59 + (uVar19 & uVar23) * 2;
                    iVar32 = iVar57;
                    if ((pBVar37 + ((ulong)puVar44 & 0xffffffff))[(long)puVar41] <
                        *(byte *)((long)puVar38 + (long)puVar41)) {
                      *local_1a8 = uVar19;
                      puVar35 = puVar41;
                      if (uVar19 <= uVar26) {
                        bVar61 = false;
                        local_1a8 = &local_114;
                        goto LAB_0011db3b;
                      }
                      puVar24 = puVar24 + 1;
                      local_1a8 = puVar24;
                    }
                    else {
                      *local_d8 = uVar19;
                      puVar39 = puVar41;
                      if (uVar19 <= uVar26) {
                        local_d8 = &local_114;
                        goto LAB_0011db29;
                      }
                      local_d8 = puVar24;
                    }
                    puVar44 = (ulong *)(ulong)*puVar24;
                    bVar61 = true;
                  }
LAB_0011db3b:
                } while (bVar61);
                *local_d8 = 0;
                *local_1a8 = 0;
                ms->nextToUpdate = iVar32 - 8;
              }
            }
            else {
              uVar17 = (ulong)(uVar12 == 0);
              uVar19 = (ms->cParams).targetLength;
              if (0xffe < uVar19) {
                uVar19 = 0xfff;
              }
              local_d8 = (uint *)(ms->window).base;
              uVar31 = iVar32 - (int)local_d8;
              local_a0 = (U32 *)(ulong)((uint)*puVar38 * -0x61c8864f >>
                                       (-(char)(ms->cParams).hashLog & 0x1fU));
              pUVar59 = ms->chainTable;
              uVar20 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
              uVar23 = uVar31 - uVar20;
              uVar26 = 0;
              if (uVar31 < uVar20) {
                uVar23 = 0;
              }
              UVar13 = (ms->window).lowLimit;
              uVar21 = (ulong)((uVar20 & uVar31) * 2);
              local_1b8 = pUVar59 + uVar21;
              local_1a8 = pUVar59 + uVar21 + 1;
              uVar54 = uVar31 - (ms->window).dictLimit;
              local_88 = CONCAT44(local_88._4_4_,uVar54);
              iVar57 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
              bVar61 = true;
              local_b0 = ms->hashTable;
              uVar34 = (ulong)local_b0[(long)local_a0];
              local_e8 = (ulong *)(ulong)uVar31;
              iVar32 = uVar31 + 9;
              uVar21 = uVar17 + 3;
              puVar39 = (ulong *)((long)puVar38 + 4);
              local_108 = (ulong *)((long)puVar38 + 0xc);
              puVar35 = local_d0;
              local_1f0 = local_108;
              do {
                uVar47 = (U32)local_f8 - 1;
                if (uVar17 != 3) {
                  uVar47 = *(uint *)((long)&local_f8 + uVar17 * 4);
                }
                uVar27 = 0;
                if ((uVar47 - 1 < uVar54) &&
                   (uVar27 = 0, (uint)*puVar38 == *(uint *)((long)puVar38 - (ulong)uVar47))) {
                  puVar41 = (ulong *)((long)puVar39 - (ulong)uVar47);
                  puVar44 = puVar39;
                  if (puVar39 < puVar55) {
                    uVar40 = *puVar39 ^ *puVar41;
                    uVar52 = 0;
                    if (uVar40 != 0) {
                      for (; (uVar40 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                      }
                    }
                    uVar52 = uVar52 >> 3 & 0x1fffffff;
                    iVar33 = (int)uVar52;
                    puVar44 = local_108;
                    if (*puVar41 == *puVar39) {
                      do {
                        puVar41 = puVar41 + 1;
                        if (puVar55 <= puVar44) goto LAB_0011d3ba;
                        uVar40 = *puVar41;
                        uVar51 = *puVar44;
                        uVar8 = 0;
                        if ((uVar51 ^ uVar40) != 0) {
                          for (; ((uVar51 ^ uVar40) >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                          }
                        }
                        puVar30 = (ulong *)((uVar8 >> 3 & 0x1fffffff) + (long)puVar44);
                        puVar44 = puVar44 + 1;
                        if (uVar40 != uVar51) {
                          uVar52 = (long)puVar30 - (long)puVar39;
                          puVar44 = puVar30;
                        }
                        iVar33 = (int)uVar52;
                      } while (uVar40 == uVar51);
                    }
                  }
                  else {
LAB_0011d3ba:
                    if ((puVar44 < puVar2) && ((uint)*puVar41 == (uint)*puVar44)) {
                      puVar44 = (ulong *)((long)puVar44 + 4);
                      puVar41 = (ulong *)((long)puVar41 + 4);
                    }
                    if ((puVar44 < puVar3) && ((short)*puVar41 == (short)*puVar44)) {
                      puVar44 = (ulong *)((long)puVar44 + 2);
                      puVar41 = (ulong *)((long)puVar41 + 2);
                    }
                    if (puVar44 < puVar5) {
                      puVar44 = (ulong *)((long)puVar44 + (ulong)((BYTE)*puVar41 == (BYTE)*puVar44))
                      ;
                    }
                    iVar33 = (int)puVar44 - (int)puVar39;
                  }
                  uVar27 = iVar33 + 4;
                }
                puVar44 = (ulong *)(ulong)uVar27;
                bVar25 = true;
                if (puVar35 < puVar44) {
                  pZVar7[uVar26].off = (int)uVar17 - (uint)(uVar12 == 0);
                  uVar47 = uVar26 + 1;
                  pZVar7[uVar26].len = uVar27;
                  bVar62 = (ulong *)((long)puVar38 + (long)puVar44) != puVar5;
                  bVar25 = bVar62 && uVar27 <= uVar19;
                  local_1f0 = (ulong *)((ulong)local_1f0 & 0xffffffff);
                  puVar35 = puVar44;
                  uVar26 = uVar47;
                  if (!bVar62 || uVar27 > uVar19) {
                    local_1f0 = (ulong *)(ulong)uVar47;
                  }
                }
                if (!bVar25) break;
                uVar17 = uVar17 + 1;
                bVar61 = uVar17 < uVar21;
              } while (bVar61);
              if (!bVar61) {
                local_b0[(long)local_a0] = uVar31;
                local_e8 = (ulong *)(ulong)(uVar31 + 2);
                local_1f0 = (ulong *)0x0;
                puVar39 = (ulong *)0x0;
                do {
                  bVar61 = iVar57 == 0;
                  iVar57 = iVar57 + -1;
                  if ((bVar61) || (uVar19 = (uint)uVar34, uVar19 < UVar13 + (UVar13 == 0))) break;
                  puVar44 = local_1f0;
                  if (puVar39 < local_1f0) {
                    puVar44 = puVar39;
                  }
                  puVar41 = (ulong *)((long)puVar38 + (long)puVar44);
                  puVar30 = (ulong *)(uVar34 + (long)local_d8 + (long)puVar44);
                  puVar29 = puVar41;
                  if (puVar41 < puVar55) {
                    uVar21 = *puVar41 ^ *puVar30;
                    uVar17 = 0;
                    if (uVar21 != 0) {
                      for (; (uVar21 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                      }
                    }
                    pBVar37 = (BYTE *)(uVar17 >> 3 & 0x1fffffff);
                    if (*puVar30 == *puVar41) {
                      do {
                        puVar29 = puVar29 + 1;
                        puVar30 = puVar30 + 1;
                        if (puVar55 <= puVar29) goto LAB_0011d58c;
                        uVar21 = *puVar29 ^ *puVar30;
                        uVar17 = 0;
                        if (uVar21 != 0) {
                          for (; (uVar21 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                          }
                        }
                        pBVar37 = (BYTE *)((long)puVar29 +
                                          ((uVar17 >> 3 & 0x1fffffff) - (long)puVar41));
                        pZVar36 = local_110;
                      } while (*puVar30 == *puVar29);
                    }
                  }
                  else {
LAB_0011d58c:
                    if ((puVar29 < puVar2) && ((uint)*puVar30 == (uint)*puVar29)) {
                      puVar29 = (ulong *)((long)puVar29 + 4);
                      puVar30 = (ulong *)((long)puVar30 + 4);
                    }
                    if ((puVar29 < puVar3) && ((short)*puVar30 == (short)*puVar29)) {
                      puVar29 = (ulong *)((long)puVar29 + 2);
                      puVar30 = (ulong *)((long)puVar30 + 2);
                    }
                    if (puVar29 < puVar5) {
                      puVar29 = (ulong *)((long)puVar29 + (ulong)((BYTE)*puVar30 == (BYTE)*puVar29))
                      ;
                    }
                    pBVar37 = (BYTE *)((long)puVar29 - (long)puVar41);
                  }
                  puVar44 = (ulong *)(pBVar37 + (long)puVar44);
                  if (puVar35 < puVar44) {
                    iVar33 = uVar19 + (U32)puVar44;
                    if (puVar44 <= (ulong *)(ulong)(iVar32 - uVar19)) {
                      iVar33 = iVar32;
                    }
                    pZVar7[uVar26].off = (int)local_e8 - uVar19;
                    pZVar7[uVar26].len = (U32)puVar44;
                    uVar26 = uVar26 + 1;
                    bVar61 = false;
                    puVar35 = puVar44;
                    iVar32 = iVar33;
                    if ((puVar44 < (ulong *)0x1001) &&
                       ((ulong *)((long)puVar38 + (long)puVar44) != puVar5)) goto LAB_0011d64c;
                  }
                  else {
LAB_0011d64c:
                    puVar24 = pUVar59 + (uVar19 & uVar20) * 2;
                    if (*(byte *)(uVar34 + (long)local_d8 + (long)puVar44) <
                        *(byte *)((long)puVar38 + (long)puVar44)) {
                      *local_1b8 = uVar19;
                      puVar39 = puVar44;
                      if (uVar23 < uVar19) {
                        puVar24 = puVar24 + 1;
                        local_1b8 = puVar24;
LAB_0011d6ac:
                        uVar34 = (ulong)*puVar24;
                        bVar61 = true;
                      }
                      else {
                        bVar61 = false;
                        local_1b8 = &local_114;
                      }
                    }
                    else {
                      *local_1a8 = uVar19;
                      local_1f0 = puVar44;
                      local_1a8 = puVar24;
                      if (uVar23 < uVar19) goto LAB_0011d6ac;
                      bVar61 = false;
                      local_1a8 = &local_114;
                    }
                  }
                } while (bVar61);
                local_1f0._0_4_ = uVar26;
                *local_1a8 = 0;
                *local_1b8 = 0;
                ms->nextToUpdate = iVar32 - 8;
              }
            }
          }
LAB_0011db82:
          if ((uint)local_1f0 == 0) {
            puVar38 = (ulong *)((long)puVar38 + 1);
            uVar17 = 0;
            iVar32 = 2;
          }
          else {
            local_68[2] = local_f0;
            *(undefined8 *)local_68 = local_f8;
            pZVar36->mlen = 0;
            pZVar36->litlen = uVar12;
            iVar32 = ZSTD_literalsContribution((BYTE *)local_1d8,uVar12,poVar1,2);
            pZVar36->price = iVar32;
            uVar19 = pZVar7[(uint)local_1f0 - 1].len;
            if ((uint)local_90 < uVar19) {
              local_b4 = pZVar7[(uint)local_1f0 - 1].off;
              uVar17 = (ulong)(uVar19 + uVar12);
              uVar28 = 0;
              iVar32 = 7;
              local_e0 = (ulong *)(ulong)uVar19;
              local_80 = (ZSTD_optimal_t *)(ulong)uVar12;
            }
            else {
              UVar13 = ZSTD_litLengthPrice(0,poVar1,2);
              pUVar59 = (U32 *)0x1;
              pZVar18 = pZVar6;
              do {
                pZVar18->price = 0x40000000;
                pUVar59 = (U32 *)((long)pUVar59 + 1);
                pZVar18 = pZVar18 + 1;
              } while (local_70 != pUVar59);
              uVar17 = 0;
              do {
                UVar14 = pZVar7[uVar17].off;
                uVar19 = pZVar7[uVar17].len;
                rVar63 = ZSTD_updateRep((U32 *)&local_f8,UVar14,(uint)(uVar12 == 0));
                if ((uint)pUVar59 <= uVar19) {
                  uVar26 = 0x1f;
                  if (UVar14 + 1 != 0) {
                    for (; UVar14 + 1 >> uVar26 == 0; uVar26 = uVar26 - 1) {
                    }
                  }
                  uVar23 = (uint)pUVar59 * 0x100 - 0x200;
                  do {
                    UVar15 = (U32)pUVar59;
                    if ((ms->opt).priceType == zop_predef) {
                      iVar57 = 0x1f;
                      if (UVar15 - 2 != 0) {
                        for (; UVar15 - 2 >> iVar57 == 0; iVar57 = iVar57 + -1) {
                        }
                      }
                      iVar57 = (iVar57 + uVar26) * 0x100 + (uVar23 >> ((byte)iVar57 & 0x1f)) +
                               0x1000;
                    }
                    else {
                      uVar20 = UVar15 - 3;
                      uVar31 = (ms->opt).offCodeFreq[uVar26] + 1;
                      iVar57 = 0x1f;
                      if (uVar31 != 0) {
                        for (; uVar31 >> iVar57 == 0; iVar57 = iVar57 + -1) {
                        }
                      }
                      if (uVar20 < 0x80) {
                        uVar20 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar20];
                      }
                      else {
                        uVar54 = 0x1f;
                        if (uVar20 != 0) {
                          for (; uVar20 >> uVar54 == 0; uVar54 = uVar54 - 1) {
                          }
                        }
                        uVar20 = (uVar54 ^ 0xffffffe0) + 0x44;
                      }
                      uVar54 = (ms->opt).matchLengthFreq[uVar20] + 1;
                      iVar33 = 0x1f;
                      if (uVar54 != 0) {
                        for (; uVar54 >> iVar33 == 0; iVar33 = iVar33 + -1) {
                        }
                      }
                      iVar57 = (((ms->opt).offCodeSumBasePrice + (ms->opt).matchLengthSumBasePrice)
                               - ((uVar31 * 0x100 >> ((byte)iVar57 & 0x1f)) +
                                 (uVar54 * 0x100 >> ((byte)iVar33 & 0x1f)))) +
                               ((ML_bits[uVar20] + uVar26) - (iVar57 + iVar33)) * 0x100 + 0x33;
                      pZVar36 = local_110;
                    }
                    uVar21 = (ulong)pUVar59 & 0xffffffff;
                    pZVar36[uVar21].mlen = UVar15;
                    pZVar36[uVar21].off = UVar14;
                    pZVar36[uVar21].litlen = uVar12;
                    pZVar36[uVar21].price = iVar57 + UVar13 + iVar32;
                    *(long *)pZVar36[uVar21].rep = rVar63.rep._0_8_;
                    pZVar36[uVar21].rep[2] = rVar63.rep[2];
                    pUVar59 = (U32 *)(ulong)(UVar15 + 1);
                    uVar23 = uVar23 + 0x100;
                  } while (UVar15 + 1 <= uVar19);
                }
                uVar17 = uVar17 + 1;
              } while (uVar17 != (uint)local_1f0 + ((uint)local_1f0 == 0));
              uVar17 = (ulong)((int)pUVar59 - 1);
              iVar32 = 0;
            }
          }
          if (iVar32 == 7) {
LAB_0011fb99:
            iVar32 = (int)local_100;
LAB_0011fbb7:
            uVar19 = (int)uVar28 + 1;
            local_100 = (ulong *)CONCAT44(local_100._4_4_,iVar32);
            pZVar36[uVar19].price = iVar32;
            pZVar36[uVar19].off = local_b4;
            pZVar36[uVar19].mlen = (U32)local_e0;
            pZVar36[uVar19].litlen = (U32)local_80;
            *(undefined8 *)pZVar36[uVar19].rep = local_48;
            pZVar36[uVar19].rep[2] = local_40;
            uVar17 = uVar28 & 0xffffffff;
            uVar21 = uVar28 & 0xffffffff;
            uVar12 = uVar19;
            if ((int)uVar28 != 0) {
              do {
                uVar26 = (uint)uVar21;
                uVar23 = pZVar36[uVar21].litlen + pZVar36[uVar21].mlen;
                uVar12 = (uint)uVar17;
                pZVar18 = pZVar36 + uVar21;
                iVar32 = pZVar18->price;
                UVar14 = pZVar18->off;
                UVar15 = pZVar18->mlen;
                UVar16 = pZVar18->litlen;
                pZVar18 = pZVar36 + uVar21;
                UVar13 = pZVar18->rep[0];
                uVar11 = *(undefined8 *)(&pZVar18->litlen + 2);
                pZVar43 = pZVar36 + uVar17;
                pZVar43->litlen = pZVar18->litlen;
                pZVar43->rep[0] = UVar13;
                *(undefined8 *)(&pZVar43->litlen + 2) = uVar11;
                pZVar18 = pZVar36 + uVar17;
                pZVar18->price = iVar32;
                pZVar18->off = UVar14;
                pZVar18->mlen = UVar15;
                pZVar18->litlen = UVar16;
                uVar17 = (ulong)(uVar12 - 1);
                uVar21 = (ulong)(uVar26 - uVar23);
                if (uVar23 > uVar26) {
                  uVar21 = 0;
                }
              } while (uVar23 <= uVar26 && uVar26 - uVar23 != 0);
            }
            if (uVar12 <= uVar19) {
              local_1e8 = local_f8._4_4_;
              UVar13 = (U32)local_f8;
              do {
                uVar26 = pZVar36[uVar12].litlen;
                uVar17 = (ulong)uVar26;
                UVar14 = pZVar36[uVar12].mlen;
                if (UVar14 == 0) {
                  puVar38 = (ulong *)(uVar17 + (long)local_1d8);
                }
                else {
                  uVar23 = pZVar36[uVar12].off;
                  if (uVar23 < 3) {
                    uVar31 = (uVar17 == 0) + uVar23;
                    UVar15 = UVar13;
                    if (uVar31 != 0) {
                      if (uVar31 == 3) {
                        UVar15 = UVar13 - 1;
                      }
                      else {
                        UVar15 = *(U32 *)((long)&local_f8 + (ulong)uVar31 * 4);
                      }
                      if (uVar31 != 1) {
                        local_f0 = local_1e8;
                      }
                      goto LAB_0011fd1d;
                    }
                  }
                  else {
                    local_f0 = local_1e8;
                    UVar15 = uVar23 - 2;
LAB_0011fd1d:
                    local_f8 = CONCAT44(UVar13,UVar15);
                    local_1e8 = UVar13;
                  }
                  UVar13 = UVar15;
                  ZSTD_updateStats(poVar1,uVar26,(BYTE *)local_1d8,uVar23,UVar14);
                  puVar39 = (ulong *)seqStore->lit;
                  puVar38 = (ulong *)((long)puVar39 + uVar17);
                  puVar35 = local_1d8;
                  do {
                    *puVar39 = *puVar35;
                    puVar39 = puVar39 + 1;
                    puVar35 = puVar35 + 1;
                  } while (puVar39 < puVar38);
                  seqStore->lit = seqStore->lit + uVar17;
                  if (0xffff < uVar26) {
                    seqStore->longLengthID = 1;
                    seqStore->longLengthPos =
                         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart)
                              >> 3);
                  }
                  psVar9 = seqStore->sequences;
                  psVar9->litLength = (U16)uVar26;
                  psVar9->offset = uVar23 + 1;
                  if (0xffff < UVar14 - 3) {
                    seqStore->longLengthID = 2;
                    seqStore->longLengthPos =
                         (U32)((ulong)((long)psVar9 - (long)seqStore->sequencesStart) >> 3);
                  }
                  psVar9->matchLength = (U16)(UVar14 - 3);
                  seqStore->sequences = psVar9 + 1;
                  puVar38 = (ulong *)((long)local_1d8 + (ulong)(UVar14 + uVar26));
                  pZVar36 = local_110;
                  local_1d8 = puVar38;
                }
                uVar12 = uVar12 + 1;
              } while (uVar12 <= uVar19);
            }
            ZSTD_setBasePrices(poVar1,2);
          }
          else if (iVar32 == 0) {
            if ((int)uVar17 != 0) {
              uVar28 = 1;
              do {
                iVar32 = (int)uVar28;
                pZVar18 = pZVar36 + (iVar32 - 1U);
                UVar13 = 1;
                if (pZVar36[iVar32 - 1U].mlen == 0) {
                  UVar13 = pZVar18->litlen + 1;
                }
                puVar39 = (ulong *)((long)puVar38 + uVar28);
                iVar57 = pZVar18->price;
                UVar14 = ZSTD_rawLiteralsCost((BYTE *)((long)puVar39 + -1),1,poVar1,2);
                UVar15 = ZSTD_litLengthPrice(UVar13,poVar1,2);
                UVar16 = ZSTD_litLengthPrice(UVar13 - 1,poVar1,2);
                iVar57 = (UVar15 + UVar14 + iVar57) - UVar16;
                pZVar43 = local_110 + uVar28;
                if (iVar57 <= local_110[uVar28].price) {
                  pZVar43->off = 0;
                  pZVar43->mlen = 0;
                  pZVar43->litlen = UVar13;
                  pZVar43->price = iVar57;
                  *(undefined8 *)pZVar43->rep = *(undefined8 *)pZVar18->rep;
                  pZVar43->rep[2] = pZVar18->rep[2];
                }
                uVar12 = 0x13;
                pZVar36 = local_110;
                if (puVar39 <= puVar50) {
                  if (iVar32 == (int)uVar17) {
                    uVar12 = 0x11;
                  }
                  else {
                    UVar13 = pZVar43->mlen;
                    local_1a0._0_4_ = 0;
                    local_88 = local_88 & 0xffffffff00000000;
                    local_1c0 = (ZSTD_optimal_t *)0x0;
                    local_a0 = (U32 *)CONCAT71(local_a0._1_7_,UVar13 != 0);
                    if (UVar13 == 0) {
                      local_1c0 = (ZSTD_optimal_t *)(ulong)pZVar43->litlen;
                    }
                    local_b0 = (U32 *)CONCAT44(local_b0._4_4_,pZVar43->price);
                    UVar14 = ZSTD_litLengthPrice(0,poVar1,2);
                    pBVar37 = (ms->window).base;
                    uVar12 = ms->nextToUpdate;
                    uVar21 = (ulong)uVar12;
                    if (pBVar37 + uVar21 <= puVar39) {
                      UVar15 = (ms->cParams).minMatch;
                      iVar57 = (int)puVar39;
                      uVar19 = iVar57 - (int)pBVar37;
                      while (uVar12 < uVar19) {
                        UVar16 = ZSTD_insertBt1(ms,pBVar37 + uVar21,(BYTE *)puVar5,UVar15,0);
                        uVar12 = (int)uVar21 + UVar16;
                        uVar21 = (ulong)uVar12;
                      }
                      ms->nextToUpdate = uVar19;
                      local_d8._4_4_ = (undefined4)((ulong)local_d8 >> 0x20);
                      local_108._4_4_ = (undefined4)((ulong)local_108 >> 0x20);
                      local_e8._4_4_ = (undefined4)((ulong)local_e8 >> 0x20);
                      local_178 = local_d0;
                      if (UVar15 - 6 < 2) {
                        uVar21 = (ulong)(UVar13 != 0);
                        uVar12 = (ms->cParams).targetLength;
                        if (0xffe < uVar12) {
                          uVar12 = 0xfff;
                        }
                        local_d8 = (uint *)CONCAT44(local_d8._4_4_,uVar12);
                        pBVar37 = (ms->window).base;
                        uVar26 = iVar57 - (int)pBVar37;
                        local_58 = *puVar39 * -0x30e4432340650000 >>
                                   (-(char)(ms->cParams).hashLog & 0x3fU);
                        pUVar59 = ms->chainTable;
                        uVar19 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                        iVar57 = uVar26 - uVar19;
                        local_198 = (ulong *)0x0;
                        if (uVar26 < uVar19) {
                          iVar57 = 0;
                        }
                        local_108 = (ulong *)CONCAT44(local_108._4_4_,iVar57);
                        UVar15 = (ms->window).lowLimit;
                        local_e8 = (ulong *)CONCAT44(local_e8._4_4_,uVar19);
                        uVar34 = (ulong)((uVar19 & uVar26) * 2);
                        local_1b0 = pUVar59 + uVar34;
                        local_180 = pUVar59 + uVar34 + 1;
                        iVar33 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
                        uVar19 = uVar26 - (ms->window).dictLimit;
                        bVar61 = true;
                        local_60 = ms->hashTable;
                        uVar40 = (ulong)local_60[local_58];
                        local_a8 = (ulong)uVar26;
                        iVar57 = uVar26 + 9;
                        uVar34 = uVar21 + 3;
                        puVar35 = (ulong *)((long)puVar39 + 4);
                        local_50 = (ulong *)((long)puVar39 + 0xc);
                        uVar52 = (ulong)local_c0 >> 0x20;
                        local_c0 = (ulong *)CONCAT44((int)uVar52,uVar19);
                        local_1a0 = local_50;
                        do {
                          if (uVar21 == 3) {
                            UVar16 = pZVar43->rep[0] - 1;
                          }
                          else {
                            UVar16 = pZVar43->rep[uVar21];
                          }
                          puVar44 = (ulong *)0x0;
                          if ((UVar16 - 1 < uVar19) &&
                             ((uint)*puVar39 == *(uint *)((long)puVar39 - (ulong)UVar16))) {
                            puVar41 = (ulong *)((long)puVar35 - (ulong)UVar16);
                            puVar44 = puVar35;
                            if (puVar35 < puVar55) {
                              uVar51 = *puVar35 ^ *puVar41;
                              uVar52 = 0;
                              if (uVar51 != 0) {
                                for (; (uVar51 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                                }
                              }
                              uVar52 = uVar52 >> 3 & 0x1fffffff;
                              iVar49 = (int)uVar52;
                              puVar44 = local_50;
                              if (*puVar41 == *puVar35) {
                                do {
                                  puVar41 = puVar41 + 1;
                                  if (puVar55 <= puVar44) goto LAB_0011e655;
                                  uVar51 = *puVar41;
                                  uVar8 = *puVar44;
                                  uVar10 = 0;
                                  if ((uVar8 ^ uVar51) != 0) {
                                    for (; ((uVar8 ^ uVar51) >> uVar10 & 1) == 0;
                                        uVar10 = uVar10 + 1) {
                                    }
                                  }
                                  puVar30 = (ulong *)((uVar10 >> 3 & 0x1fffffff) + (long)puVar44);
                                  puVar44 = puVar44 + 1;
                                  if (uVar51 != uVar8) {
                                    uVar52 = (long)puVar30 - (long)puVar35;
                                    puVar44 = puVar30;
                                  }
                                  iVar49 = (int)uVar52;
                                } while (uVar51 == uVar8);
                              }
                            }
                            else {
LAB_0011e655:
                              if ((puVar44 < puVar2) && ((uint)*puVar41 == (uint)*puVar44)) {
                                puVar44 = (ulong *)((long)puVar44 + 4);
                                puVar41 = (ulong *)((long)puVar41 + 4);
                              }
                              if ((puVar44 < puVar3) && ((short)*puVar41 == (short)*puVar44)) {
                                puVar44 = (ulong *)((long)puVar44 + 2);
                                puVar41 = (ulong *)((long)puVar41 + 2);
                              }
                              if (puVar44 < puVar5) {
                                puVar44 = (ulong *)((long)puVar44 +
                                                   (ulong)((BYTE)*puVar41 == (BYTE)*puVar44));
                              }
                              iVar49 = (int)puVar44 - (int)puVar35;
                            }
                            puVar44 = (ulong *)(ulong)(iVar49 + 4);
                          }
                          uVar23 = (uint)puVar44;
                          bVar25 = true;
                          if (local_178 < puVar44) {
                            pZVar7[(long)local_198].off = (int)uVar21 - (uint)(UVar13 != 0);
                            uVar31 = (int)local_198 + 1;
                            pZVar7[(long)local_198].len = uVar23;
                            bVar62 = (ulong *)((long)puVar39 + (long)puVar44) != puVar5;
                            bVar25 = bVar62 && uVar23 <= uVar12;
                            local_198 = (ulong *)(ulong)uVar31;
                            local_1a0 = (ulong *)((ulong)local_1a0 & 0xffffffff);
                            local_178 = puVar44;
                            if (!bVar62 || uVar23 > uVar12) {
                              local_1a0 = (ulong *)(ulong)uVar31;
                            }
                          }
                          if (!bVar25) break;
                          uVar21 = uVar21 + 1;
                          bVar61 = uVar21 < uVar34;
                        } while (bVar61);
                        if (!bVar61) {
                          local_60[local_58] = uVar26;
                          local_a8 = (ulong)(uVar26 + 2);
                          local_1a0 = (ulong *)0x0;
                          puVar35 = (ulong *)0x0;
                          do {
                            bVar61 = iVar33 == 0;
                            iVar33 = iVar33 + -1;
                            if ((bVar61) || (uVar12 = (uint)uVar40, uVar12 < UVar15 + (UVar15 == 0))
                               ) break;
                            puVar44 = local_1a0;
                            if (puVar35 < local_1a0) {
                              puVar44 = puVar35;
                            }
                            pBVar46 = pBVar37 + uVar40;
                            puVar41 = (ulong *)((long)puVar39 + (long)puVar44);
                            puVar30 = (ulong *)(pBVar46 + (long)puVar44);
                            puVar29 = puVar41;
                            if (puVar41 < puVar55) {
                              uVar34 = *puVar41 ^ *puVar30;
                              uVar21 = 0;
                              if (uVar34 != 0) {
                                for (; (uVar34 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                                }
                              }
                              pBVar45 = (BYTE *)(uVar21 >> 3 & 0x1fffffff);
                              if (*puVar30 == *puVar41) {
                                do {
                                  puVar29 = puVar29 + 1;
                                  puVar30 = puVar30 + 1;
                                  if (puVar55 <= puVar29) goto LAB_0011e823;
                                  uVar34 = *puVar29 ^ *puVar30;
                                  uVar21 = 0;
                                  if (uVar34 != 0) {
                                    for (; (uVar34 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                                    }
                                  }
                                  pBVar45 = (BYTE *)((long)puVar29 +
                                                    ((uVar21 >> 3 & 0x1fffffff) - (long)puVar41));
                                } while (*puVar30 == *puVar29);
                              }
                            }
                            else {
LAB_0011e823:
                              if ((puVar29 < puVar2) && ((uint)*puVar30 == (uint)*puVar29)) {
                                puVar29 = (ulong *)((long)puVar29 + 4);
                                puVar30 = (ulong *)((long)puVar30 + 4);
                              }
                              if ((puVar29 < puVar3) && ((short)*puVar30 == (short)*puVar29)) {
                                puVar29 = (ulong *)((long)puVar29 + 2);
                                puVar30 = (ulong *)((long)puVar30 + 2);
                              }
                              if (puVar29 < puVar5) {
                                puVar29 = (ulong *)((long)puVar29 +
                                                   (ulong)((BYTE)*puVar30 == (BYTE)*puVar29));
                              }
                              pBVar45 = (BYTE *)((long)puVar29 - (long)puVar41);
                            }
                            puVar44 = (ulong *)(pBVar45 + (long)puVar44);
                            if (local_178 < puVar44) {
                              iVar49 = uVar12 + (U32)puVar44;
                              if (puVar44 <= (ulong *)(ulong)(iVar57 - uVar12)) {
                                iVar49 = iVar57;
                              }
                              pZVar7[(long)local_198].off = (int)local_a8 - uVar12;
                              pZVar7[(long)local_198].len = (U32)puVar44;
                              local_198 = (ulong *)(ulong)((int)local_198 + 1);
                              iVar57 = iVar49;
                              local_178 = puVar44;
                              if ((puVar44 < (ulong *)0x1001) &&
                                 ((ulong *)((long)puVar39 + (long)puVar44) != puVar5))
                              goto LAB_0011e8ee;
LAB_0011e973:
                              bVar61 = false;
                            }
                            else {
LAB_0011e8ee:
                              puVar24 = pUVar59 + (uVar12 & (uint)local_e8) * 2;
                              if (*(byte *)((long)puVar39 + (long)puVar44) <= pBVar46[(long)puVar44]
                                 ) {
                                *local_180 = uVar12;
                                local_1a0 = puVar44;
                                local_180 = puVar24;
                                if ((uint)local_108 < uVar12) goto LAB_0011e947;
                                local_180 = &local_114;
                                goto LAB_0011e973;
                              }
                              *local_1b0 = uVar12;
                              puVar35 = puVar44;
                              if ((uint)local_108 < uVar12) {
                                puVar24 = puVar24 + 1;
                                local_1b0 = puVar24;
LAB_0011e947:
                                uVar40 = (ulong)*puVar24;
                                bVar61 = true;
                              }
                              else {
                                bVar61 = false;
                                local_1b0 = &local_114;
                              }
                            }
                          } while (bVar61);
                          *local_180 = 0;
                          *local_1b0 = 0;
                          ms->nextToUpdate = iVar57 - 8;
                          local_1a0._0_4_ = (int)local_198;
                        }
                      }
                      else {
                        local_a8._4_4_ = (undefined4)(local_a8 >> 0x20);
                        if (UVar15 == 5) {
                          puVar24 = (uint *)(ulong)(UVar13 != 0);
                          uVar12 = (ms->cParams).targetLength;
                          if (0xffe < uVar12) {
                            uVar12 = 0xfff;
                          }
                          pBVar37 = (ms->window).base;
                          uVar26 = iVar57 - (int)pBVar37;
                          local_58 = *puVar39 * -0x30e4432345000000 >>
                                     (-(char)(ms->cParams).hashLog & 0x3fU);
                          local_e8 = (ulong *)ms->chainTable;
                          uVar19 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                          iVar57 = uVar26 - uVar19;
                          local_198 = (ulong *)0x0;
                          if (uVar26 < uVar19) {
                            iVar57 = 0;
                          }
                          local_a8 = CONCAT44(local_a8._4_4_,iVar57);
                          UVar15 = (ms->window).lowLimit;
                          local_108 = (ulong *)CONCAT44(local_108._4_4_,uVar19);
                          uVar21 = (ulong)((uVar19 & uVar26) * 2);
                          local_148 = (uint *)((long)local_e8 + uVar21 * 4);
                          local_1b0 = (uint *)((long)local_e8 + uVar21 * 4 + 4);
                          iVar33 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
                          UVar16 = (ms->window).dictLimit;
                          bVar61 = true;
                          local_60 = ms->hashTable;
                          uVar21 = (ulong)local_60[local_58];
                          local_c0 = (ulong *)(ulong)uVar26;
                          iVar57 = uVar26 + 9;
                          local_d8 = (uint *)((long)puVar24 + 3);
                          puVar35 = (ulong *)((long)puVar39 + 4);
                          local_50 = (ulong *)((long)puVar39 + 0xc);
                          local_1a0 = local_50;
                          do {
                            if (puVar24 == (uint *)0x3) {
                              UVar48 = pZVar43->rep[0] - 1;
                            }
                            else {
                              UVar48 = pZVar43->rep[(long)puVar24];
                            }
                            puVar44 = (ulong *)0x0;
                            if ((UVar48 - 1 < uVar26 - UVar16) &&
                               ((uint)*puVar39 == *(uint *)((long)puVar39 - (ulong)UVar48))) {
                              puVar41 = (ulong *)((long)puVar35 - (ulong)UVar48);
                              puVar44 = puVar35;
                              if (puVar35 < puVar55) {
                                uVar52 = *puVar35 ^ *puVar41;
                                uVar34 = 0;
                                if (uVar52 != 0) {
                                  for (; (uVar52 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                                  }
                                }
                                uVar34 = uVar34 >> 3 & 0x1fffffff;
                                iVar49 = (int)uVar34;
                                puVar44 = local_50;
                                if (*puVar41 == *puVar35) {
                                  do {
                                    puVar41 = puVar41 + 1;
                                    if (puVar55 <= puVar44) goto LAB_0011eba0;
                                    uVar52 = *puVar41;
                                    uVar40 = *puVar44;
                                    uVar51 = 0;
                                    if ((uVar40 ^ uVar52) != 0) {
                                      for (; ((uVar40 ^ uVar52) >> uVar51 & 1) == 0;
                                          uVar51 = uVar51 + 1) {
                                      }
                                    }
                                    puVar30 = (ulong *)((uVar51 >> 3 & 0x1fffffff) + (long)puVar44);
                                    puVar44 = puVar44 + 1;
                                    if (uVar52 != uVar40) {
                                      uVar34 = (long)puVar30 - (long)puVar35;
                                      puVar44 = puVar30;
                                    }
                                    iVar49 = (int)uVar34;
                                  } while (uVar52 == uVar40);
                                }
                              }
                              else {
LAB_0011eba0:
                                if ((puVar44 < puVar2) && ((uint)*puVar41 == (uint)*puVar44)) {
                                  puVar44 = (ulong *)((long)puVar44 + 4);
                                  puVar41 = (ulong *)((long)puVar41 + 4);
                                }
                                if ((puVar44 < puVar3) && ((short)*puVar41 == (short)*puVar44)) {
                                  puVar44 = (ulong *)((long)puVar44 + 2);
                                  puVar41 = (ulong *)((long)puVar41 + 2);
                                }
                                if (puVar44 < puVar5) {
                                  puVar44 = (ulong *)((long)puVar44 +
                                                     (ulong)((BYTE)*puVar41 == (BYTE)*puVar44));
                                }
                                iVar49 = (int)puVar44 - (int)puVar35;
                              }
                              puVar44 = (ulong *)(ulong)(iVar49 + 4);
                            }
                            uVar19 = (uint)puVar44;
                            bVar25 = true;
                            if (local_178 < puVar44) {
                              pZVar7[(long)local_198].off = (int)puVar24 - (uint)(UVar13 != 0);
                              uVar23 = (int)local_198 + 1;
                              pZVar7[(long)local_198].len = uVar19;
                              bVar62 = (ulong *)((long)puVar39 + (long)puVar44) != puVar5;
                              bVar25 = bVar62 && uVar19 <= uVar12;
                              local_198 = (ulong *)(ulong)uVar23;
                              local_1a0 = (ulong *)((ulong)local_1a0 & 0xffffffff);
                              local_178 = puVar44;
                              if (!bVar62 || uVar19 > uVar12) {
                                local_1a0 = (ulong *)(ulong)uVar23;
                              }
                            }
                            if (!bVar25) break;
                            puVar24 = (uint *)((long)puVar24 + 1);
                            bVar61 = puVar24 < local_d8;
                          } while (bVar61);
                          if (!bVar61) {
                            local_60[local_58] = uVar26;
                            local_c0 = (ulong *)(ulong)(uVar26 + 2);
                            local_1a0 = (ulong *)0x0;
                            puVar35 = (ulong *)0x0;
                            do {
                              bVar61 = iVar33 == 0;
                              iVar33 = iVar33 + -1;
                              if ((bVar61) ||
                                 (uVar12 = (uint)uVar21, uVar12 < UVar15 + (UVar15 == 0))) break;
                              puVar44 = local_1a0;
                              if (puVar35 < local_1a0) {
                                puVar44 = puVar35;
                              }
                              pBVar46 = pBVar37 + uVar21;
                              puVar41 = (ulong *)((long)puVar39 + (long)puVar44);
                              puVar30 = (ulong *)(pBVar46 + (long)puVar44);
                              puVar29 = puVar41;
                              if (puVar41 < puVar55) {
                                uVar52 = *puVar41 ^ *puVar30;
                                uVar34 = 0;
                                if (uVar52 != 0) {
                                  for (; (uVar52 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                                  }
                                }
                                pBVar45 = (BYTE *)(uVar34 >> 3 & 0x1fffffff);
                                if (*puVar30 == *puVar41) {
                                  do {
                                    puVar29 = puVar29 + 1;
                                    puVar30 = puVar30 + 1;
                                    if (puVar55 <= puVar29) goto LAB_0011ed6d;
                                    uVar52 = *puVar29 ^ *puVar30;
                                    uVar34 = 0;
                                    if (uVar52 != 0) {
                                      for (; (uVar52 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                                      }
                                    }
                                    pBVar45 = (BYTE *)((long)puVar29 +
                                                      ((uVar34 >> 3 & 0x1fffffff) - (long)puVar41));
                                  } while (*puVar30 == *puVar29);
                                }
                              }
                              else {
LAB_0011ed6d:
                                if ((puVar29 < puVar2) && ((uint)*puVar30 == (uint)*puVar29)) {
                                  puVar29 = (ulong *)((long)puVar29 + 4);
                                  puVar30 = (ulong *)((long)puVar30 + 4);
                                }
                                if ((puVar29 < puVar3) && ((short)*puVar30 == (short)*puVar29)) {
                                  puVar29 = (ulong *)((long)puVar29 + 2);
                                  puVar30 = (ulong *)((long)puVar30 + 2);
                                }
                                if (puVar29 < puVar5) {
                                  puVar29 = (ulong *)((long)puVar29 +
                                                     (ulong)((BYTE)*puVar30 == (BYTE)*puVar29));
                                }
                                pBVar45 = (BYTE *)((long)puVar29 - (long)puVar41);
                              }
                              puVar44 = (ulong *)(pBVar45 + (long)puVar44);
                              if (local_178 < puVar44) {
                                iVar49 = uVar12 + (U32)puVar44;
                                if (puVar44 <= (ulong *)(ulong)(iVar57 - uVar12)) {
                                  iVar49 = iVar57;
                                }
                                pZVar7[(long)local_198].off = (int)local_c0 - uVar12;
                                pZVar7[(long)local_198].len = (U32)puVar44;
                                local_198 = (ulong *)(ulong)((int)local_198 + 1);
                                iVar57 = iVar49;
                                local_178 = puVar44;
                                if ((puVar44 < (ulong *)0x1001) &&
                                   ((ulong *)((long)puVar39 + (long)puVar44) != puVar5))
                                goto LAB_0011ee44;
LAB_0011eed2:
                                bVar61 = false;
                              }
                              else {
LAB_0011ee44:
                                puVar24 = (uint *)((long)local_e8 +
                                                  (ulong)((uVar12 & (uint)local_108) * 2) * 4);
                                if (*(byte *)((long)puVar39 + (long)puVar44) <=
                                    pBVar46[(long)puVar44]) {
                                  *local_1b0 = uVar12;
                                  local_1b0 = puVar24;
                                  local_1a0 = puVar44;
                                  if ((uint)local_a8 < uVar12) goto LAB_0011eea3;
                                  local_1b0 = &local_114;
                                  goto LAB_0011eed2;
                                }
                                *local_148 = uVar12;
                                puVar35 = puVar44;
                                if ((uint)local_a8 < uVar12) {
                                  puVar24 = puVar24 + 1;
                                  local_148 = puVar24;
LAB_0011eea3:
                                  uVar21 = (ulong)*puVar24;
                                  bVar61 = true;
                                }
                                else {
                                  bVar61 = false;
                                  local_148 = &local_114;
                                }
                              }
                            } while (bVar61);
LAB_0011f482:
                            *local_1b0 = 0;
                            *local_148 = 0;
                            ms->nextToUpdate = iVar57 - 8;
                            local_1a0._0_4_ = (int)local_198;
                          }
                        }
                        else if (UVar15 == 3) {
                          uVar21 = (ulong)(UVar13 != 0);
                          uVar12 = (ms->cParams).targetLength;
                          if (0xffe < uVar12) {
                            uVar12 = 0xfff;
                          }
                          local_d8 = (uint *)CONCAT44(local_d8._4_4_,uVar12);
                          pBVar37 = (ms->window).base;
                          uVar26 = iVar57 - (int)pBVar37;
                          local_58 = (ulong)((uint)*puVar39 * -0x61c8864f >>
                                            (-(char)(ms->cParams).hashLog & 0x1fU));
                          pUVar59 = ms->chainTable;
                          uVar19 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                          iVar57 = uVar26 - uVar19;
                          if (uVar26 < uVar19) {
                            iVar57 = 0;
                          }
                          local_108 = (ulong *)CONCAT44(local_108._4_4_,iVar57);
                          UVar15 = (ms->window).lowLimit;
                          uVar23 = UVar15 + (UVar15 == 0);
                          local_e8 = (ulong *)CONCAT44(local_e8._4_4_,uVar19);
                          uVar34 = (ulong)((uVar19 & uVar26) * 2);
                          local_1b0 = pUVar59 + uVar34;
                          local_180 = pUVar59 + uVar34 + 1;
                          iVar33 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
                          UVar15 = (ms->window).dictLimit;
                          bVar61 = true;
                          local_60 = ms->hashTable;
                          local_50 = (ulong *)(ulong)ms->hashTable[local_58];
                          local_a8 = (ulong)uVar26;
                          iVar57 = uVar26 + 9;
                          uVar34 = uVar21 + 3;
                          puVar35 = (ulong *)((long)puVar39 + 3);
                          local_c0 = (ulong *)((long)puVar39 + 0xb);
                          puVar44 = (ulong *)0x0;
                          local_1a0 = local_c0;
                          do {
                            if (uVar21 == 3) {
                              UVar16 = pZVar43->rep[0] - 1;
                            }
                            else {
                              UVar16 = pZVar43->rep[uVar21];
                            }
                            uVar19 = 0;
                            if ((UVar16 - 1 < uVar26 - UVar15) &&
                               (((*(uint *)((long)puVar39 - (ulong)UVar16) ^ (uint)*puVar39) &
                                0xffffff) == 0)) {
                              puVar30 = (ulong *)((long)puVar35 - (ulong)UVar16);
                              puVar41 = puVar35;
                              if (puVar35 < puVar55) {
                                uVar40 = *puVar35 ^ *puVar30;
                                uVar52 = 0;
                                if (uVar40 != 0) {
                                  for (; (uVar40 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                                  }
                                }
                                uVar52 = uVar52 >> 3 & 0x1fffffff;
                                iVar49 = (int)uVar52;
                                puVar41 = local_c0;
                                if (*puVar30 == *puVar35) {
                                  do {
                                    puVar30 = puVar30 + 1;
                                    if (puVar55 <= puVar41) goto LAB_0011e2a3;
                                    uVar40 = *puVar30;
                                    uVar51 = *puVar41;
                                    uVar8 = 0;
                                    if ((uVar51 ^ uVar40) != 0) {
                                      for (; ((uVar51 ^ uVar40) >> uVar8 & 1) == 0;
                                          uVar8 = uVar8 + 1) {
                                      }
                                    }
                                    puVar29 = (ulong *)((uVar8 >> 3 & 0x1fffffff) + (long)puVar41);
                                    puVar41 = puVar41 + 1;
                                    if (uVar40 != uVar51) {
                                      uVar52 = (long)puVar29 - (long)puVar35;
                                      puVar41 = puVar29;
                                    }
                                    iVar49 = (int)uVar52;
                                  } while (uVar40 == uVar51);
                                }
                              }
                              else {
LAB_0011e2a3:
                                if ((puVar41 < puVar2) && ((uint)*puVar30 == (uint)*puVar41)) {
                                  puVar41 = (ulong *)((long)puVar41 + 4);
                                  puVar30 = (ulong *)((long)puVar30 + 4);
                                }
                                if ((puVar41 < puVar3) && ((short)*puVar30 == (short)*puVar41)) {
                                  puVar41 = (ulong *)((long)puVar41 + 2);
                                  puVar30 = (ulong *)((long)puVar30 + 2);
                                }
                                if (puVar41 < puVar5) {
                                  puVar41 = (ulong *)((long)puVar41 +
                                                     (ulong)((BYTE)*puVar30 == (BYTE)*puVar41));
                                }
                                iVar49 = (int)puVar41 - (int)puVar35;
                              }
                              uVar19 = iVar49 + 3;
                            }
                            puVar30 = (ulong *)(ulong)uVar19;
                            bVar25 = true;
                            puVar41 = puVar44;
                            if (local_178 < puVar30) {
                              pZVar7[(long)puVar44].off = (int)uVar21 - (uint)(UVar13 != 0);
                              puVar41 = (ulong *)(ulong)((int)puVar44 + 1);
                              pZVar7[(long)puVar44].len = uVar19;
                              bVar62 = (ulong *)((long)puVar30 + (long)puVar39) != puVar5;
                              bVar25 = bVar62 && uVar19 <= uVar12;
                              local_1a0 = (ulong *)((ulong)local_1a0 & 0xffffffff);
                              local_178 = puVar30;
                              if (!bVar62 || uVar19 > uVar12) {
                                local_1a0 = puVar41;
                              }
                            }
                            if (!bVar25) break;
                            uVar21 = uVar21 + 1;
                            bVar61 = uVar21 < uVar34;
                            puVar44 = puVar41;
                          } while (bVar61);
                          if (!bVar61) {
                            if (local_178 < (ulong *)0x3) {
                              UVar13 = ZSTD_insertAndFindFirstIndexHash3(ms,(BYTE *)puVar39);
                              bVar61 = true;
                              if (uVar23 <= UVar13) {
                                uVar12 = (int)local_a8 - UVar13;
                                if (uVar12 < 0x40000) {
                                  puVar44 = (ulong *)(pBVar37 + UVar13);
                                  puVar35 = puVar39;
                                  if (puVar39 < puVar55) {
                                    uVar34 = *puVar39 ^ *puVar44;
                                    uVar21 = 0;
                                    if (uVar34 != 0) {
                                      for (; (uVar34 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                                      }
                                    }
                                    puVar30 = (ulong *)(uVar21 >> 3 & 0x1fffffff);
                                    if (*puVar44 == *puVar39) {
                                      do {
                                        puVar35 = puVar35 + 1;
                                        puVar44 = puVar44 + 1;
                                        if (puVar55 <= puVar35) goto LAB_0011f4b3;
                                        uVar34 = *puVar35 ^ *puVar44;
                                        uVar21 = 0;
                                        if (uVar34 != 0) {
                                          for (; (uVar34 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                                          }
                                        }
                                        puVar30 = (ulong *)((long)puVar35 +
                                                           ((uVar21 >> 3 & 0x1fffffff) -
                                                           (long)puVar39));
                                      } while (*puVar44 == *puVar35);
                                    }
                                  }
                                  else {
LAB_0011f4b3:
                                    if ((puVar35 < puVar2) && ((uint)*puVar44 == (uint)*puVar35)) {
                                      puVar35 = (ulong *)((long)puVar35 + 4);
                                      puVar44 = (ulong *)((long)puVar44 + 4);
                                    }
                                    if ((puVar35 < puVar3) && ((short)*puVar44 == (short)*puVar35))
                                    {
                                      puVar35 = (ulong *)((long)puVar35 + 2);
                                      puVar44 = (ulong *)((long)puVar44 + 2);
                                    }
                                    if (puVar35 < puVar5) {
                                      puVar35 = (ulong *)((long)puVar35 +
                                                         (ulong)((BYTE)*puVar44 == (BYTE)*puVar35));
                                    }
                                    puVar30 = (ulong *)((long)puVar35 - (long)puVar39);
                                  }
                                  if ((ulong *)0x2 < puVar30) {
                                    pZVar7->off = uVar12 + 2;
                                    pZVar7->len = (U32)puVar30;
                                    local_178 = puVar30;
                                    if (((ulong *)((ulong)local_d8 & 0xffffffff) < puVar30) ||
                                       (puVar41 = (ulong *)0x1,
                                       (ulong *)((long)puVar30 + (long)puVar39) == puVar5)) {
                                      ms->nextToUpdate = (int)local_a8 + 1;
                                      puVar41 = (ulong *)0x1;
                                      bVar61 = false;
                                      local_1a0._0_4_ = 1;
                                    }
                                  }
                                }
                              }
                              if (!bVar61) goto LAB_0011f811;
                            }
                            local_60[local_58] = (U32)local_a8;
                            local_a8 = (ulong)((U32)local_a8 + 2);
                            local_168 = (ZSTD_optimal_t *)0x0;
                            puVar35 = (ulong *)0x0;
                            puVar44 = local_50;
                            local_1a0 = puVar41;
                            do {
                              bVar61 = iVar33 == 0;
                              iVar33 = iVar33 + -1;
                              if ((bVar61) || (uVar12 = (uint)puVar44, uVar12 < uVar23)) break;
                              pZVar36 = local_168;
                              if (puVar35 < local_168) {
                                pZVar36 = (ZSTD_optimal_t *)puVar35;
                              }
                              puVar41 = (ulong *)((long)pZVar36 + (long)puVar39);
                              puVar30 = (ulong *)(pBVar37 + ((ulong)puVar44 & 0xffffffff) +
                                                 (long)pZVar36);
                              puVar29 = puVar41;
                              if (puVar41 < puVar55) {
                                uVar34 = *puVar41 ^ *puVar30;
                                uVar21 = 0;
                                if (uVar34 != 0) {
                                  for (; (uVar34 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                                  }
                                }
                                pBVar46 = (BYTE *)(uVar21 >> 3 & 0x1fffffff);
                                if (*puVar30 == *puVar41) {
                                  do {
                                    puVar29 = puVar29 + 1;
                                    puVar30 = puVar30 + 1;
                                    if (puVar55 <= puVar29) goto LAB_0011f666;
                                    uVar34 = *puVar29 ^ *puVar30;
                                    uVar21 = 0;
                                    if (uVar34 != 0) {
                                      for (; (uVar34 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                                      }
                                    }
                                    pBVar46 = (BYTE *)((long)puVar29 +
                                                      ((uVar21 >> 3 & 0x1fffffff) - (long)puVar41));
                                  } while (*puVar30 == *puVar29);
                                }
                              }
                              else {
LAB_0011f666:
                                if ((puVar29 < puVar2) && ((uint)*puVar30 == (uint)*puVar29)) {
                                  puVar29 = (ulong *)((long)puVar29 + 4);
                                  puVar30 = (ulong *)((long)puVar30 + 4);
                                }
                                if ((puVar29 < puVar3) && ((short)*puVar30 == (short)*puVar29)) {
                                  puVar29 = (ulong *)((long)puVar29 + 2);
                                  puVar30 = (ulong *)((long)puVar30 + 2);
                                }
                                if (puVar29 < puVar5) {
                                  puVar29 = (ulong *)((long)puVar29 +
                                                     (ulong)((BYTE)*puVar30 == (BYTE)*puVar29));
                                }
                                pBVar46 = (BYTE *)((long)puVar29 - (long)puVar41);
                              }
                              puVar41 = (ulong *)(pBVar46 + (long)pZVar36);
                              if (local_178 < puVar41) {
                                iVar49 = uVar12 + (U32)puVar41;
                                if (puVar41 <= (ulong *)(ulong)(iVar57 - uVar12)) {
                                  iVar49 = iVar57;
                                }
                                pZVar7[(long)local_1a0].off = (int)local_a8 - uVar12;
                                pZVar7[(long)local_1a0].len = (U32)puVar41;
                                local_1a0 = (ulong *)(ulong)((int)local_1a0 + 1);
                                iVar57 = iVar49;
                                local_178 = puVar41;
                                if ((puVar41 < (ulong *)0x1001) &&
                                   ((ulong *)((long)puVar41 + (long)puVar39) != puVar5))
                                goto LAB_0011f73c;
LAB_0011f7d2:
                                bVar61 = false;
                              }
                              else {
LAB_0011f73c:
                                puVar24 = pUVar59 + (uVar12 & (uint)local_e8) * 2;
                                if (*(byte *)((long)puVar39 + (long)puVar41) <=
                                    (pBVar37 + ((ulong)puVar44 & 0xffffffff))[(long)puVar41]) {
                                  *local_180 = uVar12;
                                  local_180 = puVar24;
                                  local_168 = (ZSTD_optimal_t *)puVar41;
                                  if ((uint)local_108 < uVar12) goto LAB_0011f7a0;
                                  local_180 = &local_114;
                                  goto LAB_0011f7d2;
                                }
                                *local_1b0 = uVar12;
                                puVar35 = puVar41;
                                if ((uint)local_108 < uVar12) {
                                  puVar24 = puVar24 + 1;
                                  local_1b0 = puVar24;
LAB_0011f7a0:
                                  puVar44 = (ulong *)(ulong)*puVar24;
                                  bVar61 = true;
                                }
                                else {
                                  bVar61 = false;
                                  local_1b0 = &local_114;
                                }
                              }
                            } while (bVar61);
                            *local_180 = 0;
                            *local_1b0 = 0;
                            ms->nextToUpdate = iVar57 - 8;
                          }
                        }
                        else {
                          puVar24 = (uint *)(ulong)(UVar13 != 0);
                          uVar12 = (ms->cParams).targetLength;
                          if (0xffe < uVar12) {
                            uVar12 = 0xfff;
                          }
                          pBVar37 = (ms->window).base;
                          uVar19 = iVar57 - (int)pBVar37;
                          local_58 = (ulong)((uint)*puVar39 * -0x61c8864f >>
                                            (-(char)(ms->cParams).hashLog & 0x1fU));
                          local_e8 = (ulong *)ms->chainTable;
                          uVar26 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                          iVar57 = uVar19 - uVar26;
                          if (uVar19 < uVar26) {
                            iVar57 = 0;
                          }
                          local_a8 = CONCAT44(local_a8._4_4_,iVar57);
                          UVar15 = (ms->window).lowLimit;
                          local_108 = (ulong *)CONCAT44(local_108._4_4_,uVar26);
                          uVar21 = (ulong)((uVar26 & uVar19) * 2);
                          local_148 = (uint *)((long)local_e8 + uVar21 * 4);
                          local_1b0 = (uint *)((long)local_e8 + uVar21 * 4 + 4);
                          iVar33 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
                          UVar16 = (ms->window).dictLimit;
                          bVar61 = true;
                          local_60 = ms->hashTable;
                          uVar21 = (ulong)local_60[local_58];
                          local_c0 = (ulong *)(ulong)uVar19;
                          iVar57 = uVar19 + 9;
                          local_d8 = (uint *)((long)puVar24 + 3);
                          puVar35 = (ulong *)((long)puVar39 + 4);
                          local_50 = (ulong *)((long)puVar39 + 0xc);
                          puVar44 = (ulong *)0x0;
                          local_1a0 = local_50;
                          do {
                            if (puVar24 == (uint *)0x3) {
                              UVar48 = pZVar43->rep[0] - 1;
                            }
                            else {
                              UVar48 = pZVar43->rep[(long)puVar24];
                            }
                            puVar41 = (ulong *)0x0;
                            if ((UVar48 - 1 < uVar19 - UVar16) &&
                               ((uint)*puVar39 == *(uint *)((long)puVar39 - (ulong)UVar48))) {
                              puVar30 = (ulong *)((long)puVar35 - (ulong)UVar48);
                              puVar41 = puVar35;
                              if (puVar35 < puVar55) {
                                uVar52 = *puVar35 ^ *puVar30;
                                uVar34 = 0;
                                if (uVar52 != 0) {
                                  for (; (uVar52 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                                  }
                                }
                                uVar34 = uVar34 >> 3 & 0x1fffffff;
                                iVar49 = (int)uVar34;
                                puVar41 = local_50;
                                if (*puVar30 == *puVar35) {
                                  do {
                                    puVar30 = puVar30 + 1;
                                    if (puVar55 <= puVar41) goto LAB_0011f0fb;
                                    uVar52 = *puVar30;
                                    uVar40 = *puVar41;
                                    uVar51 = 0;
                                    if ((uVar40 ^ uVar52) != 0) {
                                      for (; ((uVar40 ^ uVar52) >> uVar51 & 1) == 0;
                                          uVar51 = uVar51 + 1) {
                                      }
                                    }
                                    puVar29 = (ulong *)((uVar51 >> 3 & 0x1fffffff) + (long)puVar41);
                                    puVar41 = puVar41 + 1;
                                    if (uVar52 != uVar40) {
                                      uVar34 = (long)puVar29 - (long)puVar35;
                                      puVar41 = puVar29;
                                    }
                                    iVar49 = (int)uVar34;
                                  } while (uVar52 == uVar40);
                                }
                              }
                              else {
LAB_0011f0fb:
                                if ((puVar41 < puVar2) && ((uint)*puVar30 == (uint)*puVar41)) {
                                  puVar41 = (ulong *)((long)puVar41 + 4);
                                  puVar30 = (ulong *)((long)puVar30 + 4);
                                }
                                if ((puVar41 < puVar3) && ((short)*puVar30 == (short)*puVar41)) {
                                  puVar41 = (ulong *)((long)puVar41 + 2);
                                  puVar30 = (ulong *)((long)puVar30 + 2);
                                }
                                if (puVar41 < puVar5) {
                                  puVar41 = (ulong *)((long)puVar41 +
                                                     (ulong)((BYTE)*puVar30 == (BYTE)*puVar41));
                                }
                                iVar49 = (int)puVar41 - (int)puVar35;
                              }
                              puVar41 = (ulong *)(ulong)(iVar49 + 4);
                            }
                            uVar26 = (uint)puVar41;
                            bVar25 = true;
                            local_198 = puVar44;
                            if (local_178 < puVar41) {
                              pZVar7[(long)puVar44].off = (int)puVar24 - (uint)(UVar13 != 0);
                              local_198 = (ulong *)(ulong)((int)puVar44 + 1);
                              pZVar7[(long)puVar44].len = uVar26;
                              bVar62 = (ulong *)((long)puVar39 + (long)puVar41) != puVar5;
                              bVar25 = bVar62 && uVar26 <= uVar12;
                              local_1a0 = (ulong *)((ulong)local_1a0 & 0xffffffff);
                              local_178 = puVar41;
                              if (!bVar62 || uVar26 > uVar12) {
                                local_1a0 = local_198;
                              }
                            }
                            if (!bVar25) break;
                            puVar24 = (uint *)((long)puVar24 + 1);
                            bVar61 = puVar24 < local_d8;
                            puVar44 = local_198;
                          } while (bVar61);
                          if (!bVar61) {
                            local_60[local_58] = uVar19;
                            local_c0 = (ulong *)(ulong)(uVar19 + 2);
                            local_1a0 = (ulong *)0x0;
                            puVar35 = (ulong *)0x0;
                            do {
                              bVar61 = iVar33 == 0;
                              iVar33 = iVar33 + -1;
                              if ((bVar61) ||
                                 (uVar12 = (uint)uVar21, uVar12 < UVar15 + (UVar15 == 0))) break;
                              puVar44 = local_1a0;
                              if (puVar35 < local_1a0) {
                                puVar44 = puVar35;
                              }
                              pBVar46 = pBVar37 + uVar21;
                              puVar41 = (ulong *)((long)puVar39 + (long)puVar44);
                              puVar30 = (ulong *)(pBVar46 + (long)puVar44);
                              puVar29 = puVar41;
                              if (puVar41 < puVar55) {
                                uVar52 = *puVar41 ^ *puVar30;
                                uVar34 = 0;
                                if (uVar52 != 0) {
                                  for (; (uVar52 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                                  }
                                }
                                pBVar45 = (BYTE *)(uVar34 >> 3 & 0x1fffffff);
                                if (*puVar30 == *puVar41) {
                                  do {
                                    puVar29 = puVar29 + 1;
                                    puVar30 = puVar30 + 1;
                                    if (puVar55 <= puVar29) goto LAB_0011f2c7;
                                    uVar52 = *puVar29 ^ *puVar30;
                                    uVar34 = 0;
                                    if (uVar52 != 0) {
                                      for (; (uVar52 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                                      }
                                    }
                                    pBVar45 = (BYTE *)((long)puVar29 +
                                                      ((uVar34 >> 3 & 0x1fffffff) - (long)puVar41));
                                  } while (*puVar30 == *puVar29);
                                }
                              }
                              else {
LAB_0011f2c7:
                                if ((puVar29 < puVar2) && ((uint)*puVar30 == (uint)*puVar29)) {
                                  puVar29 = (ulong *)((long)puVar29 + 4);
                                  puVar30 = (ulong *)((long)puVar30 + 4);
                                }
                                if ((puVar29 < puVar3) && ((short)*puVar30 == (short)*puVar29)) {
                                  puVar29 = (ulong *)((long)puVar29 + 2);
                                  puVar30 = (ulong *)((long)puVar30 + 2);
                                }
                                if (puVar29 < puVar5) {
                                  puVar29 = (ulong *)((long)puVar29 +
                                                     (ulong)((BYTE)*puVar30 == (BYTE)*puVar29));
                                }
                                pBVar45 = (BYTE *)((long)puVar29 - (long)puVar41);
                              }
                              puVar44 = (ulong *)(pBVar45 + (long)puVar44);
                              if (local_178 < puVar44) {
                                iVar49 = uVar12 + (U32)puVar44;
                                if (puVar44 <= (ulong *)(ulong)(iVar57 - uVar12)) {
                                  iVar49 = iVar57;
                                }
                                pZVar7[(long)local_198].off = (int)local_c0 - uVar12;
                                pZVar7[(long)local_198].len = (U32)puVar44;
                                local_198 = (ulong *)(ulong)((int)local_198 + 1);
                                iVar57 = iVar49;
                                local_178 = puVar44;
                                if ((puVar44 < (ulong *)0x1001) &&
                                   ((ulong *)((long)puVar39 + (long)puVar44) != puVar5))
                                goto LAB_0011f39d;
LAB_0011f42b:
                                bVar61 = false;
                                puVar44 = puVar35;
                              }
                              else {
LAB_0011f39d:
                                puVar24 = (uint *)((long)local_e8 +
                                                  (ulong)((uVar12 & (uint)local_108) * 2) * 4);
                                if (*(byte *)((long)puVar39 + (long)puVar44) <=
                                    pBVar46[(long)puVar44]) {
                                  *local_1b0 = uVar12;
                                  local_1b0 = puVar24;
                                  local_1a0 = puVar44;
                                  if ((uint)local_a8 < uVar12) goto LAB_0011f3fc;
                                  local_1b0 = &local_114;
                                  goto LAB_0011f42b;
                                }
                                *local_148 = uVar12;
                                if ((uint)local_a8 < uVar12) {
                                  puVar24 = puVar24 + 1;
                                  puVar35 = puVar44;
                                  local_148 = puVar24;
LAB_0011f3fc:
                                  uVar21 = (ulong)*puVar24;
                                  bVar61 = true;
                                  puVar44 = puVar35;
                                }
                                else {
                                  bVar61 = false;
                                  local_148 = &local_114;
                                }
                              }
                              puVar35 = puVar44;
                            } while (bVar61);
                            goto LAB_0011f482;
                          }
                        }
                      }
                    }
LAB_0011f811:
                    uVar12 = 0x13;
                    pZVar36 = local_110;
                    if ((int)local_1a0 != 0) {
                      uVar19 = pZVar7[(int)local_1a0 - 1U].len;
                      puVar39 = (ulong *)(ulong)uVar19;
                      bVar61 = 0xfff < uVar19 + iVar32;
                      uVar12 = 0;
                      if (bVar61 || (uint)local_90 < uVar19) {
                        UVar13 = 0;
                        if (pZVar43->mlen == 0) {
                          UVar13 = pZVar43->litlen;
                        }
                        local_b4 = pZVar7[(int)local_1a0 - 1U].off;
                        uVar12 = iVar32 - UVar13;
                        uVar17 = (ulong)(uVar19 + (U32)local_1c0 + uVar12);
                        if (0x1000 < uVar12) {
                          uVar12 = 0;
                        }
                        uVar28 = (ulong)uVar12;
                        uVar12 = 7;
                        local_80 = local_1c0;
                      }
                      else {
                        puVar39 = (ulong *)((ulong)local_e0 & 0xffffffff);
                      }
                      if (bVar61 || (uint)local_90 < uVar19) {
                        local_e0 = puVar39;
                      }
                      else {
                        local_88 = CONCAT44(local_88._4_4_,
                                            CONCAT31((int3)(local_88 >> 8),local_a0._0_1_));
                        iVar32 = UVar14 + (int)local_b0;
                        pZVar18 = local_110 + uVar28;
                        uVar21 = 0;
                        do {
                          UVar13 = pZVar7[uVar21].off;
                          rVar63 = ZSTD_updateRep(pZVar18->rep,UVar13,(U32)local_88);
                          uVar12 = (uint)local_c8;
                          if (uVar21 != 0) {
                            uVar12 = pZVar7[uVar21 - 1].len + 1;
                          }
                          uVar19 = pZVar7[uVar21].len;
                          if (uVar12 <= uVar19) {
                            uVar26 = 0x1f;
                            if (UVar13 + 1 != 0) {
                              for (; UVar13 + 1 >> uVar26 == 0; uVar26 = uVar26 - 1) {
                              }
                            }
                            do {
                              if ((ms->opt).priceType == zop_predef) {
                                uVar23 = uVar19 - 2;
                                iVar57 = 0x1f;
                                if (uVar23 != 0) {
                                  for (; uVar23 >> iVar57 == 0; iVar57 = iVar57 + -1) {
                                  }
                                }
                                iVar57 = (iVar57 + uVar26) * 0x100 +
                                         (uVar23 * 0x100 >> ((byte)iVar57 & 0x1f)) + 0x1000;
                              }
                              else {
                                uVar31 = uVar19 - 3;
                                uVar23 = (ms->opt).offCodeFreq[uVar26] + 1;
                                iVar57 = 0x1f;
                                if (uVar23 != 0) {
                                  for (; uVar23 >> iVar57 == 0; iVar57 = iVar57 + -1) {
                                  }
                                }
                                if (uVar31 < 0x80) {
                                  uVar31 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar31];
                                }
                                else {
                                  uVar20 = 0x1f;
                                  if (uVar31 != 0) {
                                    for (; uVar31 >> uVar20 == 0; uVar20 = uVar20 - 1) {
                                    }
                                  }
                                  uVar31 = (uVar20 ^ 0xffffffe0) + 0x44;
                                }
                                uVar20 = (ms->opt).matchLengthFreq[uVar31] + 1;
                                iVar33 = 0x1f;
                                if (uVar20 != 0) {
                                  for (; uVar20 >> iVar33 == 0; iVar33 = iVar33 + -1) {
                                  }
                                }
                                iVar57 = (((ms->opt).offCodeSumBasePrice +
                                          (ms->opt).matchLengthSumBasePrice) -
                                         ((uVar23 * 0x100 >> ((byte)iVar57 & 0x1f)) +
                                         (uVar20 * 0x100 >> ((byte)iVar33 & 0x1f)))) +
                                         ((ML_bits[uVar31] + uVar26) - (iVar57 + iVar33)) * 0x100 +
                                         0x33;
                                pZVar36 = local_110;
                              }
                              iVar57 = iVar57 + iVar32;
                              uVar23 = uVar19 + (int)uVar28;
                              uVar34 = (ulong)uVar23;
                              if ((uint)uVar17 < uVar23) {
LAB_0011fa5a:
                                uVar17 = uVar17 & 0xffffffff;
                                pZVar43 = pZVar6 + uVar17;
                                do {
                                  uVar17 = uVar17 + 1;
                                  pZVar43->price = 0x40000000;
                                  pZVar43 = pZVar43 + 1;
                                } while (uVar17 < uVar34);
LAB_0011fa86:
                                pZVar36[uVar34].mlen = uVar19;
                                pZVar36[uVar34].off = UVar13;
                                pZVar36[uVar34].litlen = (U32)local_1c0;
                                pZVar36[uVar34].price = iVar57;
                                *(long *)pZVar36[uVar34].rep = rVar63.rep._0_8_;
                                pZVar36[uVar34].rep[2] = rVar63.rep[2];
                              }
                              else if (iVar57 < pZVar36[uVar34].price) {
                                if ((uint)uVar17 < uVar23) goto LAB_0011fa5a;
                                goto LAB_0011fa86;
                              }
                              uVar19 = uVar19 - 1;
                            } while (uVar12 <= uVar19);
                          }
                          uVar21 = uVar21 + 1;
                        } while (uVar21 != (int)local_1a0 + (uint)((int)local_1a0 == 0));
                        uVar12 = 0;
                        local_e0 = puVar39;
                      }
                    }
                  }
                }
                if (uVar12 < 0x11) {
                  if (uVar12 != 0) {
                    if (uVar12 == 7) goto LAB_0011fb99;
                    goto LAB_0011fe2c;
                  }
                }
                else if (uVar12 != 0x13) {
                  if (uVar12 != 0x11) goto LAB_0011fe2c;
                  break;
                }
                uVar12 = (int)uVar28 + 1;
                uVar28 = (ulong)uVar12;
              } while (uVar12 <= (uint)uVar17);
            }
            uVar28 = uVar17 & 0xffffffff;
            iVar32 = pZVar36[uVar28].price;
            local_b4 = pZVar36[uVar28].off;
            local_e0 = (ulong *)(ulong)pZVar36[uVar28].mlen;
            local_80 = (ZSTD_optimal_t *)(ulong)pZVar36[uVar28].litlen;
            local_40 = pZVar36[uVar28].rep[2];
            local_48 = *(undefined8 *)pZVar36[uVar28].rep;
            uVar19 = pZVar36[uVar28].litlen + pZVar36[uVar28].mlen;
            uVar12 = (uint)uVar17 - uVar19;
            if ((uint)uVar17 < uVar19) {
              uVar12 = 0;
            }
            uVar28 = (ulong)uVar12;
            goto LAB_0011fbb7;
          }
LAB_0011fe2c:
        } while (puVar38 < puVar50);
      }
      ZSTD_resetSeqStore(seqStore);
      ppBVar4 = &(ms->window).base;
      *ppBVar4 = *ppBVar4 + -local_38;
      UVar13 = (ms->window).dictLimit + (int)local_38;
      (ms->window).dictLimit = UVar13;
      (ms->window).lowLimit = UVar13;
      ms->nextToUpdate = UVar13;
      ms->nextToUpdate3 = UVar13;
      if ((ms->opt).literalCompressionMode != ZSTD_lcm_uncompressed) {
        puVar24 = poVar1->litFreq;
        lVar22 = 0;
        UVar13 = 0;
        do {
          iVar32 = puVar24[lVar22] * 0x10;
          puVar24[lVar22] = iVar32 - 1;
          UVar13 = (UVar13 + iVar32) - 1;
          lVar22 = lVar22 + 1;
        } while (lVar22 != 0x100);
        (ms->opt).litSum = UVar13;
      }
      puVar24 = (ms->opt).litLengthFreq;
      lVar22 = 0;
      UVar13 = 0;
      do {
        iVar32 = puVar24[lVar22] * 0x10;
        puVar24[lVar22] = iVar32 - 1;
        UVar13 = (UVar13 + iVar32) - 1;
        lVar22 = lVar22 + 1;
      } while (lVar22 != 0x24);
      (ms->opt).litLengthSum = UVar13;
      puVar24 = (ms->opt).matchLengthFreq;
      lVar22 = 0;
      UVar13 = 0;
      do {
        iVar32 = puVar24[lVar22] * 0x10;
        puVar24[lVar22] = iVar32 - 1;
        UVar13 = (UVar13 + iVar32) - 1;
        lVar22 = lVar22 + 1;
      } while (lVar22 != 0x35);
      (ms->opt).matchLengthSum = UVar13;
      puVar24 = (ms->opt).offCodeFreq;
      lVar22 = 0;
      UVar13 = 0;
      do {
        iVar32 = puVar24[lVar22] * 0x10;
        puVar24[lVar22] = iVar32 - 1;
        UVar13 = (UVar13 + iVar32) - 1;
        lVar22 = lVar22 + 1;
      } while (lVar22 != 0x20);
      (ms->opt).offCodeSum = UVar13;
      srcSize = local_38;
    }
  }
  puVar38 = local_78;
  poVar1 = &ms->opt;
  puVar50 = (ulong *)((long)local_78 + srcSize);
  puVar55 = (ulong *)((long)local_78 + (srcSize - 8));
  uVar12 = (ms->window).dictLimit;
  pBVar37 = (ms->window).base;
  uVar19 = (ms->cParams).targetLength;
  if (0xffe < uVar19) {
    uVar19 = 0xfff;
  }
  local_d8 = (uint *)CONCAT44(local_d8._4_4_,uVar19);
  uVar19 = (ms->cParams).minMatch;
  pZVar36 = (ms->opt).priceTable;
  pZVar7 = (ms->opt).matchTable;
  ms->nextToUpdate3 = ms->nextToUpdate;
  ZSTD_rescaleFreqs(poVar1,(BYTE *)local_78,srcSize,2);
  puVar38 = (ulong *)((ulong)((ulong *)(pBVar37 + uVar12) == puVar38) + (long)puVar38);
  if (puVar38 < puVar55) {
    uVar12 = (uint)(uVar19 != 3);
    local_a8 = (ulong)(uVar12 + 3);
    local_b0 = (U32 *)(ulong)(uVar12 + 2);
    puVar2 = (ulong *)((long)puVar50 + -7);
    puVar3 = (ulong *)((long)puVar50 + -3);
    puVar5 = (ulong *)((long)puVar50 + -1);
    pZVar6 = pZVar36 + 1;
    local_1c0 = pZVar6;
    local_130 = pZVar6;
    local_88 = local_a8;
    local_80 = pZVar6;
    do {
      iVar32 = (int)puVar38;
      local_110 = (ZSTD_optimal_t *)(ulong)(uint)(iVar32 - (int)local_78);
      local_90 = CONCAT71(local_90._1_7_,iVar32 - (int)local_78 == 0);
      pBVar37 = (ms->window).base;
      uVar12 = ms->nextToUpdate;
      uVar28 = (ulong)uVar12;
      iVar57 = 0;
      if (pBVar37 + uVar28 <= puVar38) {
        UVar13 = (ms->cParams).minMatch;
        uVar19 = iVar32 - (int)pBVar37;
        while (uVar12 < uVar19) {
          UVar14 = ZSTD_insertBt1(ms,pBVar37 + uVar28,(BYTE *)puVar50,UVar13,0);
          uVar12 = (int)uVar28 + UVar14;
          uVar28 = (ulong)uVar12;
        }
        ms->nextToUpdate = uVar19;
        local_1d8 = (ulong *)local_b0;
        if (UVar13 - 6 < 2) {
          pZVar18 = (ZSTD_optimal_t *)(ulong)((uint)local_110 == 0);
          uVar12 = (ms->cParams).targetLength;
          if (0xffe < uVar12) {
            uVar12 = 0xfff;
          }
          local_e0 = (ulong *)(ms->window).base;
          uVar31 = iVar32 - (int)local_e0;
          local_108 = (ulong *)(*puVar38 * -0x30e4432340650000 >>
                               (-(char)(ms->cParams).hashLog & 0x3fU));
          pUVar59 = ms->chainTable;
          uVar23 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          uVar26 = uVar31 - uVar23;
          uVar19 = 0;
          if (uVar31 < uVar23) {
            uVar26 = 0;
          }
          UVar13 = (ms->window).lowLimit;
          uVar28 = (ulong)((uVar23 & uVar31) * 2);
          local_1b8 = pUVar59 + uVar28;
          local_1a8 = pUVar59 + uVar28 + 1;
          iVar33 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
          UVar14 = (ms->window).dictLimit;
          bVar61 = true;
          local_a0 = ms->hashTable;
          uVar28 = (ulong)local_a0[(long)local_108];
          iVar32 = uVar31 + 9;
          local_c8 = (ZSTD_optimal_t *)((long)&pZVar18->price + 3);
          puVar39 = (ulong *)((long)puVar38 + 4);
          local_100 = (ulong *)((long)puVar38 + 0xc);
          pZVar60 = ms;
          do {
            if (pZVar18 == (ZSTD_optimal_t *)0x3) {
              UVar15 = *local_98 - 1;
            }
            else {
              UVar15 = local_98[(long)pZVar18];
            }
            pBVar37 = (BYTE *)0x0;
            if ((UVar15 - 1 < uVar31 - UVar14) &&
               ((uint)*puVar38 == *(uint *)((long)puVar38 - (ulong)UVar15))) {
              puVar44 = (ulong *)((long)puVar39 - (ulong)UVar15);
              puVar35 = puVar39;
              if (puVar39 < puVar2) {
                uVar21 = *puVar39 ^ *puVar44;
                uVar17 = 0;
                if (uVar21 != 0) {
                  for (; (uVar21 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                  }
                }
                uVar17 = uVar17 >> 3 & 0x1fffffff;
                iVar57 = (int)uVar17;
                puVar35 = local_100;
                if (*puVar44 == *puVar39) {
                  do {
                    puVar44 = puVar44 + 1;
                    if (puVar2 <= puVar35) goto LAB_00120592;
                    uVar21 = *puVar44;
                    uVar34 = *puVar35;
                    uVar52 = 0;
                    if ((uVar34 ^ uVar21) != 0) {
                      for (; ((uVar34 ^ uVar21) >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                      }
                    }
                    puVar41 = (ulong *)((uVar52 >> 3 & 0x1fffffff) + (long)puVar35);
                    puVar35 = puVar35 + 1;
                    if (uVar21 != uVar34) {
                      uVar17 = (long)puVar41 - (long)puVar39;
                      puVar35 = puVar41;
                    }
                    iVar57 = (int)uVar17;
                  } while (uVar21 == uVar34);
                }
              }
              else {
LAB_00120592:
                if ((puVar35 < puVar3) && ((uint)*puVar44 == (uint)*puVar35)) {
                  puVar35 = (ulong *)((long)puVar35 + 4);
                  puVar44 = (ulong *)((long)puVar44 + 4);
                }
                if ((puVar35 < puVar5) && ((short)*puVar44 == (short)*puVar35)) {
                  puVar35 = (ulong *)((long)puVar35 + 2);
                  puVar44 = (ulong *)((long)puVar44 + 2);
                }
                if (puVar35 < puVar50) {
                  puVar35 = (ulong *)((long)puVar35 + (ulong)((BYTE)*puVar44 == (BYTE)*puVar35));
                }
                iVar57 = (int)puVar35 - (int)puVar39;
              }
              pBVar37 = (BYTE *)(ulong)(iVar57 + 4);
            }
            uVar20 = (uint)pBVar37;
            bVar25 = true;
            if (local_1d8 < pBVar37) {
              pZVar7[uVar19].off = (int)pZVar18 - (uint)((uint)local_110 == 0);
              uVar54 = uVar19 + 1;
              pZVar7[uVar19].len = uVar20;
              bVar62 = (ulong *)((long)puVar38 + (long)pBVar37) != puVar50;
              bVar25 = bVar62 && uVar20 <= uVar12;
              pZVar60 = (ZSTD_matchState_t *)((ulong)pZVar60 & 0xffffffff);
              local_1d8 = (ulong *)pBVar37;
              uVar19 = uVar54;
              if (!bVar62 || uVar20 > uVar12) {
                pZVar60 = (ZSTD_matchState_t *)(ulong)uVar54;
              }
            }
            iVar57 = (int)pZVar60;
            if (!bVar25) break;
            pZVar18 = (ZSTD_optimal_t *)((long)&pZVar18->price + 1);
            bVar61 = pZVar18 < local_c8;
          } while (bVar61);
          if (!bVar61) {
            local_a0[(long)local_108] = uVar31;
            local_128 = (BYTE *)0x0;
            pBVar37 = (BYTE *)0x0;
            uVar17 = (ulong)uVar19;
            do {
              iVar57 = (int)uVar17;
              bVar61 = iVar33 == 0;
              iVar33 = iVar33 + -1;
              if ((bVar61) || (uVar12 = (uint)uVar28, uVar12 < UVar13 + (UVar13 == 0))) break;
              pBVar46 = local_128;
              if (pBVar37 < local_128) {
                pBVar46 = pBVar37;
              }
              puVar39 = (ulong *)((long)puVar38 + (long)pBVar46);
              puVar35 = (ulong *)((long)local_e0 + (long)(pBVar46 + uVar28));
              puVar44 = puVar39;
              if (puVar39 < puVar2) {
                uVar34 = *puVar39 ^ *puVar35;
                uVar21 = 0;
                if (uVar34 != 0) {
                  for (; (uVar34 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                  }
                }
                pBVar45 = (BYTE *)(uVar21 >> 3 & 0x1fffffff);
                if (*puVar35 == *puVar39) {
                  do {
                    puVar44 = puVar44 + 1;
                    puVar35 = puVar35 + 1;
                    if (puVar2 <= puVar44) goto LAB_00120756;
                    uVar34 = *puVar44 ^ *puVar35;
                    uVar21 = 0;
                    if (uVar34 != 0) {
                      for (; (uVar34 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                      }
                    }
                    pBVar45 = (BYTE *)((long)puVar44 + ((uVar21 >> 3 & 0x1fffffff) - (long)puVar39))
                    ;
                  } while (*puVar35 == *puVar44);
                }
              }
              else {
LAB_00120756:
                if ((puVar44 < puVar3) && ((uint)*puVar35 == (uint)*puVar44)) {
                  puVar44 = (ulong *)((long)puVar44 + 4);
                  puVar35 = (ulong *)((long)puVar35 + 4);
                }
                if ((puVar44 < puVar5) && ((short)*puVar35 == (short)*puVar44)) {
                  puVar44 = (ulong *)((long)puVar44 + 2);
                  puVar35 = (ulong *)((long)puVar35 + 2);
                }
                if (puVar44 < puVar50) {
                  puVar44 = (ulong *)((long)puVar44 + (ulong)((BYTE)*puVar35 == (BYTE)*puVar44));
                }
                pBVar45 = (BYTE *)((long)puVar44 - (long)puVar39);
              }
              pBVar45 = pBVar45 + (long)pBVar46;
              if (local_1d8 < pBVar45) {
                iVar49 = uVar12 + (U32)pBVar45;
                if (pBVar45 <= (BYTE *)(ulong)(iVar32 - uVar12)) {
                  iVar49 = iVar32;
                }
                pZVar7[uVar17].off = (uVar31 + 2) - uVar12;
                pZVar7[uVar17].len = (U32)pBVar45;
                uVar17 = (ulong)(iVar57 + 1);
                bVar61 = false;
                iVar32 = iVar49;
                local_1d8 = (ulong *)pBVar45;
                if ((pBVar45 < (BYTE *)0x1001) &&
                   ((ulong *)((long)puVar38 + (long)pBVar45) != puVar50)) goto LAB_0012081c;
              }
              else {
LAB_0012081c:
                puVar24 = pUVar59 + (uVar12 & uVar23) * 2;
                if (*(byte *)((long)local_e0 + (long)(pBVar45 + uVar28)) <
                    *(byte *)((long)puVar38 + (long)pBVar45)) {
                  *local_1b8 = uVar12;
                  pBVar37 = pBVar45;
                  if (uVar26 < uVar12) {
                    puVar24 = puVar24 + 1;
                    local_1b8 = puVar24;
LAB_00120871:
                    uVar28 = (ulong)*puVar24;
                    bVar61 = true;
                  }
                  else {
                    bVar61 = false;
                    local_1b8 = (uint *)&local_f8;
                  }
                }
                else {
                  *local_1a8 = uVar12;
                  local_1a8 = puVar24;
                  local_128 = pBVar45;
                  if (uVar26 < uVar12) goto LAB_00120871;
                  bVar61 = false;
                  local_1a8 = (uint *)&local_f8;
                }
              }
              iVar57 = (int)uVar17;
            } while (bVar61);
LAB_001212f2:
            local_100 = (ulong *)((long)puVar38 + 0xc);
            *local_1a8 = 0;
            *local_1b8 = 0;
            ms->nextToUpdate = iVar32 - 8;
          }
        }
        else if (UVar13 == 5) {
          pZVar18 = (ZSTD_optimal_t *)(ulong)((uint)local_110 == 0);
          uVar12 = (ms->cParams).targetLength;
          if (0xffe < uVar12) {
            uVar12 = 0xfff;
          }
          local_e0 = (ulong *)(ms->window).base;
          uVar31 = iVar32 - (int)local_e0;
          local_108 = (ulong *)(*puVar38 * -0x30e4432345000000 >>
                               (-(char)(ms->cParams).hashLog & 0x3fU));
          pUVar59 = ms->chainTable;
          uVar23 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          uVar26 = uVar31 - uVar23;
          uVar19 = 0;
          if (uVar31 < uVar23) {
            uVar26 = 0;
          }
          UVar13 = (ms->window).lowLimit;
          uVar28 = (ulong)((uVar23 & uVar31) * 2);
          local_1b8 = pUVar59 + uVar28;
          local_1a8 = pUVar59 + uVar28 + 1;
          iVar33 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
          UVar14 = (ms->window).dictLimit;
          bVar61 = true;
          local_a0 = ms->hashTable;
          uVar28 = (ulong)local_a0[(long)local_108];
          iVar32 = uVar31 + 9;
          local_c8 = (ZSTD_optimal_t *)((long)&pZVar18->price + 3);
          puVar39 = (ulong *)((long)puVar38 + 4);
          local_100 = (ulong *)((long)puVar38 + 0xc);
          pZVar60 = ms;
          do {
            if (pZVar18 == (ZSTD_optimal_t *)0x3) {
              UVar15 = *local_98 - 1;
            }
            else {
              UVar15 = local_98[(long)pZVar18];
            }
            pBVar37 = (BYTE *)0x0;
            if ((UVar15 - 1 < uVar31 - UVar14) &&
               ((uint)*puVar38 == *(uint *)((long)puVar38 - (ulong)UVar15))) {
              puVar44 = (ulong *)((long)puVar39 - (ulong)UVar15);
              puVar35 = puVar39;
              if (puVar39 < puVar2) {
                uVar21 = *puVar39 ^ *puVar44;
                uVar17 = 0;
                if (uVar21 != 0) {
                  for (; (uVar21 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                  }
                }
                uVar17 = uVar17 >> 3 & 0x1fffffff;
                iVar57 = (int)uVar17;
                puVar35 = local_100;
                if (*puVar44 == *puVar39) {
                  do {
                    puVar44 = puVar44 + 1;
                    if (puVar2 <= puVar35) goto LAB_00120ab3;
                    uVar21 = *puVar44;
                    uVar34 = *puVar35;
                    uVar52 = 0;
                    if ((uVar34 ^ uVar21) != 0) {
                      for (; ((uVar34 ^ uVar21) >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                      }
                    }
                    puVar41 = (ulong *)((uVar52 >> 3 & 0x1fffffff) + (long)puVar35);
                    puVar35 = puVar35 + 1;
                    if (uVar21 != uVar34) {
                      uVar17 = (long)puVar41 - (long)puVar39;
                      puVar35 = puVar41;
                    }
                    iVar57 = (int)uVar17;
                  } while (uVar21 == uVar34);
                }
              }
              else {
LAB_00120ab3:
                if ((puVar35 < puVar3) && ((uint)*puVar44 == (uint)*puVar35)) {
                  puVar35 = (ulong *)((long)puVar35 + 4);
                  puVar44 = (ulong *)((long)puVar44 + 4);
                }
                if ((puVar35 < puVar5) && ((short)*puVar44 == (short)*puVar35)) {
                  puVar35 = (ulong *)((long)puVar35 + 2);
                  puVar44 = (ulong *)((long)puVar44 + 2);
                }
                if (puVar35 < puVar50) {
                  puVar35 = (ulong *)((long)puVar35 + (ulong)((BYTE)*puVar44 == (BYTE)*puVar35));
                }
                iVar57 = (int)puVar35 - (int)puVar39;
              }
              pBVar37 = (BYTE *)(ulong)(iVar57 + 4);
            }
            uVar20 = (uint)pBVar37;
            bVar25 = true;
            if (local_1d8 < pBVar37) {
              pZVar7[uVar19].off = (int)pZVar18 - (uint)((uint)local_110 == 0);
              uVar54 = uVar19 + 1;
              pZVar7[uVar19].len = uVar20;
              bVar62 = (ulong *)((long)puVar38 + (long)pBVar37) != puVar50;
              bVar25 = bVar62 && uVar20 <= uVar12;
              pZVar60 = (ZSTD_matchState_t *)((ulong)pZVar60 & 0xffffffff);
              local_1d8 = (ulong *)pBVar37;
              uVar19 = uVar54;
              if (!bVar62 || uVar20 > uVar12) {
                pZVar60 = (ZSTD_matchState_t *)(ulong)uVar54;
              }
            }
            iVar57 = (int)pZVar60;
            if (!bVar25) break;
            pZVar18 = (ZSTD_optimal_t *)((long)&pZVar18->price + 1);
            bVar61 = pZVar18 < local_c8;
          } while (bVar61);
          if (!bVar61) {
            local_a0[(long)local_108] = uVar31;
            local_128 = (BYTE *)0x0;
            pBVar37 = (BYTE *)0x0;
            uVar17 = (ulong)uVar19;
            do {
              iVar57 = (int)uVar17;
              bVar61 = iVar33 == 0;
              iVar33 = iVar33 + -1;
              if ((bVar61) || (uVar12 = (uint)uVar28, uVar12 < UVar13 + (UVar13 == 0))) break;
              pBVar46 = local_128;
              if (pBVar37 < local_128) {
                pBVar46 = pBVar37;
              }
              puVar39 = (ulong *)((long)puVar38 + (long)pBVar46);
              puVar35 = (ulong *)((long)local_e0 + (long)(pBVar46 + uVar28));
              puVar44 = puVar39;
              if (puVar39 < puVar2) {
                uVar34 = *puVar39 ^ *puVar35;
                uVar21 = 0;
                if (uVar34 != 0) {
                  for (; (uVar34 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                  }
                }
                pBVar45 = (BYTE *)(uVar21 >> 3 & 0x1fffffff);
                if (*puVar35 == *puVar39) {
                  do {
                    puVar44 = puVar44 + 1;
                    puVar35 = puVar35 + 1;
                    if (puVar2 <= puVar44) goto LAB_00120c77;
                    uVar34 = *puVar44 ^ *puVar35;
                    uVar21 = 0;
                    if (uVar34 != 0) {
                      for (; (uVar34 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                      }
                    }
                    pBVar45 = (BYTE *)((long)puVar44 + ((uVar21 >> 3 & 0x1fffffff) - (long)puVar39))
                    ;
                  } while (*puVar35 == *puVar44);
                }
              }
              else {
LAB_00120c77:
                if ((puVar44 < puVar3) && ((uint)*puVar35 == (uint)*puVar44)) {
                  puVar44 = (ulong *)((long)puVar44 + 4);
                  puVar35 = (ulong *)((long)puVar35 + 4);
                }
                if ((puVar44 < puVar5) && ((short)*puVar35 == (short)*puVar44)) {
                  puVar44 = (ulong *)((long)puVar44 + 2);
                  puVar35 = (ulong *)((long)puVar35 + 2);
                }
                if (puVar44 < puVar50) {
                  puVar44 = (ulong *)((long)puVar44 + (ulong)((BYTE)*puVar35 == (BYTE)*puVar44));
                }
                pBVar45 = (BYTE *)((long)puVar44 - (long)puVar39);
              }
              pBVar45 = pBVar45 + (long)pBVar46;
              if (local_1d8 < pBVar45) {
                iVar49 = uVar12 + (U32)pBVar45;
                if (pBVar45 <= (BYTE *)(ulong)(iVar32 - uVar12)) {
                  iVar49 = iVar32;
                }
                pZVar7[uVar17].off = (uVar31 + 2) - uVar12;
                pZVar7[uVar17].len = (U32)pBVar45;
                uVar17 = (ulong)(iVar57 + 1);
                bVar61 = false;
                iVar32 = iVar49;
                local_1d8 = (ulong *)pBVar45;
                if ((pBVar45 < (BYTE *)0x1001) &&
                   ((ulong *)((long)puVar38 + (long)pBVar45) != puVar50)) goto LAB_00120d3d;
              }
              else {
LAB_00120d3d:
                puVar24 = pUVar59 + (uVar12 & uVar23) * 2;
                if (*(byte *)((long)local_e0 + (long)(pBVar45 + uVar28)) <
                    *(byte *)((long)puVar38 + (long)pBVar45)) {
                  *local_1b8 = uVar12;
                  pBVar37 = pBVar45;
                  if (uVar26 < uVar12) {
                    puVar24 = puVar24 + 1;
                    local_1b8 = puVar24;
LAB_00120d92:
                    uVar28 = (ulong)*puVar24;
                    bVar61 = true;
                  }
                  else {
                    bVar61 = false;
                    local_1b8 = (uint *)&local_f8;
                  }
                }
                else {
                  *local_1a8 = uVar12;
                  local_1a8 = puVar24;
                  local_128 = pBVar45;
                  if (uVar26 < uVar12) goto LAB_00120d92;
                  bVar61 = false;
                  local_1a8 = (uint *)&local_f8;
                }
              }
              iVar57 = (int)uVar17;
            } while (bVar61);
            goto LAB_001212f2;
          }
        }
        else if (UVar13 == 3) {
          uVar28 = (ulong)((uint)local_110 == 0);
          uVar12 = (ms->cParams).targetLength;
          if (0xffe < uVar12) {
            uVar12 = 0xfff;
          }
          pBVar37 = (ms->window).base;
          uVar23 = iVar32 - (int)pBVar37;
          local_100 = (ulong *)(ulong)((uint)*puVar38 * -0x61c8864f >>
                                      (-(char)(ms->cParams).hashLog & 0x1fU));
          local_e0 = (ulong *)ms->chainTable;
          uVar26 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          uVar19 = uVar23 - uVar26;
          if (uVar23 < uVar26) {
            uVar19 = 0;
          }
          UVar13 = (ms->window).lowLimit;
          uVar17 = (ulong)local_c8 >> 0x20;
          local_c8 = (ZSTD_optimal_t *)CONCAT44((int)uVar17,UVar13 + (UVar13 == 0));
          uVar17 = (ulong)((uVar26 & uVar23) * 2);
          local_198 = (ulong *)((long)local_e0 + uVar17 * 4);
          local_140 = (uint *)((long)local_e0 + uVar17 * 4 + 4);
          iVar33 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
          UVar13 = (ms->window).dictLimit;
          bVar61 = true;
          local_108 = (ulong *)ms->hashTable;
          uVar31 = *(uint *)((long)local_108 + (long)local_100 * 4);
          iVar32 = uVar23 + 9;
          uVar17 = uVar28 + 3;
          puVar39 = (ulong *)((long)puVar38 + 3);
          pBVar46 = (BYTE *)local_b0;
          uVar21 = 0;
          pZVar60 = ms;
          do {
            if (uVar28 == 3) {
              UVar14 = *local_98 - 1;
            }
            else {
              UVar14 = local_98[uVar28];
            }
            pBVar45 = (BYTE *)0x0;
            if ((UVar14 - 1 < uVar23 - UVar13) &&
               (((*(uint *)((long)puVar38 - (ulong)UVar14) ^ (uint)*puVar38) & 0xffffff) == 0)) {
              puVar44 = (ulong *)((long)puVar39 - (ulong)UVar14);
              puVar35 = puVar39;
              if (puVar39 < puVar2) {
                uVar52 = *puVar39 ^ *puVar44;
                uVar34 = 0;
                if (uVar52 != 0) {
                  for (; (uVar52 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                  }
                }
                uVar34 = uVar34 >> 3 & 0x1fffffff;
                iVar57 = (int)uVar34;
                puVar35 = (ulong *)((long)puVar38 + 0xb);
                if (*puVar44 == *puVar39) {
                  do {
                    puVar44 = puVar44 + 1;
                    if (puVar2 <= puVar35) goto LAB_001202bc;
                    uVar52 = *puVar44;
                    uVar40 = *puVar35;
                    uVar51 = 0;
                    if ((uVar40 ^ uVar52) != 0) {
                      for (; ((uVar40 ^ uVar52) >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                      }
                    }
                    puVar41 = (ulong *)((uVar51 >> 3 & 0x1fffffff) + (long)puVar35);
                    puVar35 = puVar35 + 1;
                    if (uVar52 != uVar40) {
                      uVar34 = (long)puVar41 - (long)puVar39;
                      puVar35 = puVar41;
                    }
                    iVar57 = (int)uVar34;
                  } while (uVar52 == uVar40);
                }
              }
              else {
LAB_001202bc:
                if ((puVar35 < puVar3) && ((uint)*puVar44 == (uint)*puVar35)) {
                  puVar35 = (ulong *)((long)puVar35 + 4);
                  puVar44 = (ulong *)((long)puVar44 + 4);
                }
                if ((puVar35 < puVar5) && ((short)*puVar44 == (short)*puVar35)) {
                  puVar35 = (ulong *)((long)puVar35 + 2);
                  puVar44 = (ulong *)((long)puVar44 + 2);
                }
                if (puVar35 < puVar50) {
                  puVar35 = (ulong *)((long)puVar35 + (ulong)((BYTE)*puVar44 == (BYTE)*puVar35));
                }
                iVar57 = (int)puVar35 - (int)puVar39;
              }
              pBVar45 = (BYTE *)(ulong)(iVar57 + 3);
            }
            uVar20 = (uint)pBVar45;
            bVar25 = true;
            uVar34 = uVar21;
            if (pBVar46 < pBVar45) {
              pZVar7[uVar21].off = (int)uVar28 - (uint)((uint)local_110 == 0);
              uVar54 = (int)uVar21 + 1;
              uVar34 = (ulong)uVar54;
              pZVar7[uVar21].len = uVar20;
              bVar62 = (ulong *)((long)puVar38 + (long)pBVar45) != puVar50;
              bVar25 = bVar62 && uVar20 <= uVar12;
              pZVar60 = (ZSTD_matchState_t *)((ulong)pZVar60 & 0xffffffff);
              pBVar46 = pBVar45;
              if (!bVar62 || uVar20 > uVar12) {
                pZVar60 = (ZSTD_matchState_t *)(ulong)uVar54;
              }
            }
            iVar57 = (int)pZVar60;
            uVar20 = (uint)uVar34;
            if (!bVar25) break;
            uVar28 = uVar28 + 1;
            bVar61 = uVar28 < uVar17;
            uVar21 = uVar34;
          } while (bVar61);
          if (!bVar61) {
            if (pBVar46 < (BYTE *)0x3) {
              UVar13 = ZSTD_insertAndFindFirstIndexHash3(ms,(BYTE *)puVar38);
              bVar61 = true;
              if (((uint)local_c8 <= UVar13) && (uVar23 - UVar13 < 0x40000)) {
                puVar35 = (ulong *)(pBVar37 + UVar13);
                puVar39 = puVar38;
                if (puVar38 < puVar2) {
                  uVar17 = *puVar38 ^ *puVar35;
                  uVar28 = 0;
                  if (uVar17 != 0) {
                    for (; (uVar17 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                    }
                  }
                  pBVar45 = (BYTE *)(uVar28 >> 3 & 0x1fffffff);
                  if (*puVar35 == *puVar38) {
                    do {
                      puVar39 = puVar39 + 1;
                      puVar35 = puVar35 + 1;
                      if (puVar2 <= puVar39) goto LAB_001213d7;
                      uVar17 = *puVar39 ^ *puVar35;
                      uVar28 = 0;
                      if (uVar17 != 0) {
                        for (; (uVar17 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                        }
                      }
                      pBVar45 = (BYTE *)((long)puVar39 +
                                        ((uVar28 >> 3 & 0x1fffffff) - (long)puVar38));
                    } while (*puVar35 == *puVar39);
                  }
                }
                else {
LAB_001213d7:
                  if ((puVar39 < puVar3) && ((uint)*puVar35 == (uint)*puVar39)) {
                    puVar39 = (ulong *)((long)puVar39 + 4);
                    puVar35 = (ulong *)((long)puVar35 + 4);
                  }
                  if ((puVar39 < puVar5) && ((short)*puVar35 == (short)*puVar39)) {
                    puVar39 = (ulong *)((long)puVar39 + 2);
                    puVar35 = (ulong *)((long)puVar35 + 2);
                  }
                  if (puVar39 < puVar50) {
                    puVar39 = (ulong *)((long)puVar39 + (ulong)((BYTE)*puVar35 == (BYTE)*puVar39));
                  }
                  pBVar45 = (BYTE *)((long)puVar39 - (long)puVar38);
                }
                if ((BYTE *)0x2 < pBVar45) {
                  pZVar7->off = (uVar23 - UVar13) + 2;
                  pZVar7->len = (U32)pBVar45;
                  pBVar46 = pBVar45;
                  if (((BYTE *)(ulong)uVar12 < pBVar45) ||
                     (uVar20 = 1, (ulong *)((long)puVar38 + (long)pBVar45) == puVar50)) {
                    ms->nextToUpdate = uVar23 + 1;
                    uVar20 = 1;
                    bVar61 = false;
                    iVar57 = 1;
                  }
                }
              }
              if (!bVar61) goto LAB_001216fe;
            }
            *(uint *)((long)local_108 + (long)local_100 * 4) = uVar23;
            uVar28 = (ulong)uVar20;
            pBVar58 = (BYTE *)0x0;
            pBVar45 = (BYTE *)0x0;
            do {
              iVar57 = (int)uVar28;
              bVar61 = iVar33 == 0;
              iVar33 = iVar33 + -1;
              if ((bVar61) || (uVar31 < (uint)local_c8)) break;
              pBVar53 = pBVar58;
              if (pBVar45 < pBVar58) {
                pBVar53 = pBVar45;
              }
              puVar44 = (ulong *)((long)puVar38 + (long)pBVar53);
              puVar39 = (ulong *)(pBVar37 + (long)(pBVar53 + uVar31));
              puVar35 = puVar44;
              if (puVar44 < puVar2) {
                uVar21 = *puVar44 ^ *puVar39;
                uVar17 = 0;
                if (uVar21 != 0) {
                  for (; (uVar21 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                  }
                }
                pBVar56 = (BYTE *)(uVar17 >> 3 & 0x1fffffff);
                if (*puVar39 == *puVar44) {
                  do {
                    puVar35 = puVar35 + 1;
                    puVar39 = puVar39 + 1;
                    if (puVar2 <= puVar35) goto LAB_00121568;
                    uVar21 = *puVar35 ^ *puVar39;
                    uVar17 = 0;
                    if (uVar21 != 0) {
                      for (; (uVar21 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                      }
                    }
                    pBVar56 = (BYTE *)((long)puVar35 + ((uVar17 >> 3 & 0x1fffffff) - (long)puVar44))
                    ;
                  } while (*puVar39 == *puVar35);
                }
              }
              else {
LAB_00121568:
                if ((puVar35 < puVar3) && ((uint)*puVar39 == (uint)*puVar35)) {
                  puVar35 = (ulong *)((long)puVar35 + 4);
                  puVar39 = (ulong *)((long)puVar39 + 4);
                }
                if ((puVar35 < puVar5) && ((short)*puVar39 == (short)*puVar35)) {
                  puVar35 = (ulong *)((long)puVar35 + 2);
                  puVar39 = (ulong *)((long)puVar39 + 2);
                }
                if (puVar35 < puVar50) {
                  puVar35 = (ulong *)((long)puVar35 + (ulong)((BYTE)*puVar39 == (BYTE)*puVar35));
                }
                pBVar56 = (BYTE *)((long)puVar35 - (long)puVar44);
              }
              pBVar56 = pBVar56 + (long)pBVar53;
              if (pBVar46 < pBVar56) {
                iVar49 = uVar31 + (U32)pBVar56;
                if (pBVar56 <= (BYTE *)(ulong)(iVar32 - uVar31)) {
                  iVar49 = iVar32;
                }
                pZVar7[uVar28].off = (uVar23 + 2) - uVar31;
                pZVar7[uVar28].len = (U32)pBVar56;
                uVar28 = (ulong)(iVar57 + 1);
                pBVar46 = pBVar56;
                iVar32 = iVar49;
                if ((pBVar56 < (BYTE *)0x1001) &&
                   ((ulong *)((long)puVar38 + (long)pBVar56) != puVar50)) goto LAB_0012162a;
LAB_001216ba:
                bVar61 = false;
              }
              else {
LAB_0012162a:
                puVar24 = (uint *)((long)local_e0 + (ulong)((uVar31 & uVar26) * 2) * 4);
                if (*(byte *)((long)puVar38 + (long)pBVar56) <= pBVar37[(long)(pBVar56 + uVar31)]) {
                  *local_140 = uVar31;
                  local_140 = puVar24;
                  if (uVar19 < uVar31) goto LAB_0012168a;
                  local_140 = (uint *)&local_f8;
                  pBVar58 = pBVar56;
                  goto LAB_001216ba;
                }
                *(uint *)local_198 = uVar31;
                pBVar45 = pBVar56;
                if (uVar19 < uVar31) {
                  puVar24 = puVar24 + 1;
                  pBVar56 = pBVar58;
                  local_198 = (ulong *)puVar24;
LAB_0012168a:
                  uVar31 = *puVar24;
                  bVar61 = true;
                  pBVar58 = pBVar56;
                }
                else {
                  bVar61 = false;
                  local_198 = &local_f8;
                }
              }
              iVar57 = (int)uVar28;
            } while (bVar61);
            *local_140 = 0;
            *(uint *)local_198 = 0;
            ms->nextToUpdate = iVar32 - 8;
          }
        }
        else {
          pZVar18 = (ZSTD_optimal_t *)(ulong)((uint)local_110 == 0);
          uVar12 = (ms->cParams).targetLength;
          if (0xffe < uVar12) {
            uVar12 = 0xfff;
          }
          local_e0 = (ulong *)(ms->window).base;
          uVar23 = iVar32 - (int)local_e0;
          local_108 = (ulong *)(ulong)((uint)*puVar38 * -0x61c8864f >>
                                      (-(char)(ms->cParams).hashLog & 0x1fU));
          pUVar59 = ms->chainTable;
          uVar31 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          uVar26 = uVar23 - uVar31;
          uVar19 = 0;
          if (uVar23 < uVar31) {
            uVar26 = 0;
          }
          UVar13 = (ms->window).lowLimit;
          uVar28 = (ulong)((uVar31 & uVar23) * 2);
          local_1b8 = pUVar59 + uVar28;
          local_1a8 = pUVar59 + uVar28 + 1;
          iVar33 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
          UVar14 = (ms->window).dictLimit;
          bVar61 = true;
          local_a0 = ms->hashTable;
          uVar28 = (ulong)local_a0[(long)local_108];
          iVar32 = uVar23 + 9;
          local_c8 = (ZSTD_optimal_t *)((long)&pZVar18->price + 3);
          puVar39 = (ulong *)((long)puVar38 + 4);
          local_100 = (ulong *)((long)puVar38 + 0xc);
          pZVar60 = ms;
          do {
            if (pZVar18 == (ZSTD_optimal_t *)0x3) {
              UVar15 = *local_98 - 1;
            }
            else {
              UVar15 = local_98[(long)pZVar18];
            }
            pBVar37 = (BYTE *)0x0;
            if ((UVar15 - 1 < uVar23 - UVar14) &&
               ((uint)*puVar38 == *(uint *)((long)puVar38 - (ulong)UVar15))) {
              puVar44 = (ulong *)((long)puVar39 - (ulong)UVar15);
              puVar35 = puVar39;
              if (puVar39 < puVar2) {
                uVar21 = *puVar39 ^ *puVar44;
                uVar17 = 0;
                if (uVar21 != 0) {
                  for (; (uVar21 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                  }
                }
                uVar17 = uVar17 >> 3 & 0x1fffffff;
                iVar57 = (int)uVar17;
                puVar35 = local_100;
                if (*puVar44 == *puVar39) {
                  do {
                    puVar44 = puVar44 + 1;
                    if (puVar2 <= puVar35) goto LAB_00120fcc;
                    uVar21 = *puVar44;
                    uVar34 = *puVar35;
                    uVar52 = 0;
                    if ((uVar34 ^ uVar21) != 0) {
                      for (; ((uVar34 ^ uVar21) >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                      }
                    }
                    puVar41 = (ulong *)((uVar52 >> 3 & 0x1fffffff) + (long)puVar35);
                    puVar35 = puVar35 + 1;
                    if (uVar21 != uVar34) {
                      uVar17 = (long)puVar41 - (long)puVar39;
                      puVar35 = puVar41;
                    }
                    iVar57 = (int)uVar17;
                  } while (uVar21 == uVar34);
                }
              }
              else {
LAB_00120fcc:
                if ((puVar35 < puVar3) && ((uint)*puVar44 == (uint)*puVar35)) {
                  puVar35 = (ulong *)((long)puVar35 + 4);
                  puVar44 = (ulong *)((long)puVar44 + 4);
                }
                if ((puVar35 < puVar5) && ((short)*puVar44 == (short)*puVar35)) {
                  puVar35 = (ulong *)((long)puVar35 + 2);
                  puVar44 = (ulong *)((long)puVar44 + 2);
                }
                if (puVar35 < puVar50) {
                  puVar35 = (ulong *)((long)puVar35 + (ulong)((BYTE)*puVar44 == (BYTE)*puVar35));
                }
                iVar57 = (int)puVar35 - (int)puVar39;
              }
              pBVar37 = (BYTE *)(ulong)(iVar57 + 4);
            }
            uVar20 = (uint)pBVar37;
            bVar25 = true;
            if (local_1d8 < pBVar37) {
              pZVar7[uVar19].off = (int)pZVar18 - (uint)((uint)local_110 == 0);
              uVar54 = uVar19 + 1;
              pZVar7[uVar19].len = uVar20;
              bVar62 = (ulong *)((long)puVar38 + (long)pBVar37) != puVar50;
              bVar25 = bVar62 && uVar20 <= uVar12;
              pZVar60 = (ZSTD_matchState_t *)((ulong)pZVar60 & 0xffffffff);
              local_1d8 = (ulong *)pBVar37;
              uVar19 = uVar54;
              if (!bVar62 || uVar20 > uVar12) {
                pZVar60 = (ZSTD_matchState_t *)(ulong)uVar54;
              }
            }
            iVar57 = (int)pZVar60;
            if (!bVar25) break;
            pZVar18 = (ZSTD_optimal_t *)((long)&pZVar18->price + 1);
            bVar61 = pZVar18 < local_c8;
          } while (bVar61);
          if (!bVar61) {
            local_a0[(long)local_108] = uVar23;
            local_128 = (BYTE *)0x0;
            pBVar37 = (BYTE *)0x0;
            uVar17 = (ulong)uVar19;
            do {
              iVar57 = (int)uVar17;
              bVar61 = iVar33 == 0;
              iVar33 = iVar33 + -1;
              if ((bVar61) || (uVar12 = (uint)uVar28, uVar12 < UVar13 + (UVar13 == 0))) break;
              pBVar46 = local_128;
              if (pBVar37 < local_128) {
                pBVar46 = pBVar37;
              }
              puVar39 = (ulong *)((long)puVar38 + (long)pBVar46);
              puVar35 = (ulong *)((long)local_e0 + (long)(pBVar46 + uVar28));
              puVar44 = puVar39;
              if (puVar39 < puVar2) {
                uVar34 = *puVar39 ^ *puVar35;
                uVar21 = 0;
                if (uVar34 != 0) {
                  for (; (uVar34 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                  }
                }
                pBVar45 = (BYTE *)(uVar21 >> 3 & 0x1fffffff);
                if (*puVar35 == *puVar39) {
                  do {
                    puVar44 = puVar44 + 1;
                    puVar35 = puVar35 + 1;
                    if (puVar2 <= puVar44) goto LAB_0012118e;
                    uVar34 = *puVar44 ^ *puVar35;
                    uVar21 = 0;
                    if (uVar34 != 0) {
                      for (; (uVar34 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                      }
                    }
                    pBVar45 = (BYTE *)((long)puVar44 + ((uVar21 >> 3 & 0x1fffffff) - (long)puVar39))
                    ;
                  } while (*puVar35 == *puVar44);
                }
              }
              else {
LAB_0012118e:
                if ((puVar44 < puVar3) && ((uint)*puVar35 == (uint)*puVar44)) {
                  puVar44 = (ulong *)((long)puVar44 + 4);
                  puVar35 = (ulong *)((long)puVar35 + 4);
                }
                if ((puVar44 < puVar5) && ((short)*puVar35 == (short)*puVar44)) {
                  puVar44 = (ulong *)((long)puVar44 + 2);
                  puVar35 = (ulong *)((long)puVar35 + 2);
                }
                if (puVar44 < puVar50) {
                  puVar44 = (ulong *)((long)puVar44 + (ulong)((BYTE)*puVar35 == (BYTE)*puVar44));
                }
                pBVar45 = (BYTE *)((long)puVar44 - (long)puVar39);
              }
              pBVar45 = pBVar45 + (long)pBVar46;
              if (local_1d8 < pBVar45) {
                iVar49 = uVar12 + (U32)pBVar45;
                if (pBVar45 <= (BYTE *)(ulong)(iVar32 - uVar12)) {
                  iVar49 = iVar32;
                }
                pZVar7[uVar17].off = (uVar23 + 2) - uVar12;
                pZVar7[uVar17].len = (U32)pBVar45;
                uVar17 = (ulong)(iVar57 + 1);
                bVar61 = false;
                iVar32 = iVar49;
                local_1d8 = (ulong *)pBVar45;
                if ((pBVar45 < (BYTE *)0x1001) &&
                   ((ulong *)((long)puVar38 + (long)pBVar45) != puVar50)) goto LAB_00121254;
              }
              else {
LAB_00121254:
                puVar24 = pUVar59 + (uVar12 & uVar31) * 2;
                if (*(byte *)((long)local_e0 + (long)(pBVar45 + uVar28)) <
                    *(byte *)((long)puVar38 + (long)pBVar45)) {
                  *local_1b8 = uVar12;
                  pBVar37 = pBVar45;
                  if (uVar26 < uVar12) {
                    puVar24 = puVar24 + 1;
                    local_1b8 = puVar24;
LAB_001212a9:
                    uVar28 = (ulong)*puVar24;
                    bVar61 = true;
                  }
                  else {
                    bVar61 = false;
                    local_1b8 = (uint *)&local_f8;
                  }
                }
                else {
                  *local_1a8 = uVar12;
                  local_1a8 = puVar24;
                  local_128 = pBVar45;
                  if (uVar26 < uVar12) goto LAB_001212a9;
                  bVar61 = false;
                  local_1a8 = (uint *)&local_f8;
                }
              }
              iVar57 = (int)uVar17;
            } while (bVar61);
            goto LAB_001212f2;
          }
        }
      }
LAB_001216fe:
      if (iVar57 == 0) {
        puVar38 = (ulong *)((long)puVar38 + 1);
        uVar28 = 0;
        iVar32 = 2;
      }
      else {
        uVar12 = (uint)(byte)local_90;
        lVar22 = 0;
        do {
          pZVar36->rep[lVar22] = local_98[lVar22];
          lVar22 = lVar22 + 1;
        } while (lVar22 != 3);
        pZVar36->mlen = 0;
        pZVar36->litlen = (U32)local_110;
        iVar32 = ZSTD_literalsContribution((BYTE *)local_78,(U32)local_110,poVar1,2);
        pZVar36->price = iVar32;
        uVar19 = pZVar7[iVar57 - 1U].len;
        if ((uint)local_d8 < uVar19) {
          local_b4 = pZVar7[iVar57 - 1U].off;
          uVar28 = (ulong)(uVar19 + (int)local_110);
          local_1c0 = (ZSTD_optimal_t *)0x0;
          iVar32 = 7;
          local_130 = (ZSTD_optimal_t *)(ulong)uVar19;
          local_80 = (ZSTD_optimal_t *)((ulong)local_110 & 0xffffffff);
        }
        else {
          UVar13 = ZSTD_litLengthPrice(0,poVar1,2);
          uVar28 = 1;
          pZVar18 = pZVar6;
          do {
            pZVar18->price = 0x40000000;
            uVar28 = uVar28 + 1;
            pZVar18 = pZVar18 + 1;
          } while (local_a8 != uVar28);
          uVar17 = 0;
          do {
            UVar14 = pZVar7[uVar17].off;
            uVar19 = pZVar7[uVar17].len;
            rVar63 = ZSTD_updateRep(local_98,UVar14,uVar12);
            if ((uint)uVar28 <= uVar19) {
              uVar26 = 0x1f;
              if (UVar14 + 1 != 0) {
                for (; UVar14 + 1 >> uVar26 == 0; uVar26 = uVar26 - 1) {
                }
              }
              uVar23 = (uint)uVar28 * 0x100 - 0x200;
              do {
                UVar15 = (U32)uVar28;
                if ((ms->opt).priceType == zop_predef) {
                  iVar33 = 0x1f;
                  if (UVar15 - 2 != 0) {
                    for (; UVar15 - 2 >> iVar33 == 0; iVar33 = iVar33 + -1) {
                    }
                  }
                  iVar33 = (iVar33 + uVar26) * 0x100 + (uVar23 >> ((byte)iVar33 & 0x1f)) + 0x1000;
                }
                else {
                  uVar20 = UVar15 - 3;
                  uVar31 = (ms->opt).offCodeFreq[uVar26] + 1;
                  iVar33 = 0x1f;
                  if (uVar31 != 0) {
                    for (; uVar31 >> iVar33 == 0; iVar33 = iVar33 + -1) {
                    }
                  }
                  if (uVar20 < 0x80) {
                    uVar20 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar20];
                  }
                  else {
                    uVar54 = 0x1f;
                    if (uVar20 != 0) {
                      for (; uVar20 >> uVar54 == 0; uVar54 = uVar54 - 1) {
                      }
                    }
                    uVar20 = (uVar54 ^ 0xffffffe0) + 0x44;
                  }
                  uVar54 = (ms->opt).matchLengthFreq[uVar20] + 1;
                  iVar49 = 0x1f;
                  if (uVar54 != 0) {
                    for (; uVar54 >> iVar49 == 0; iVar49 = iVar49 + -1) {
                    }
                  }
                  iVar33 = (((ms->opt).offCodeSumBasePrice + (ms->opt).matchLengthSumBasePrice) -
                           ((uVar31 * 0x100 >> ((byte)iVar33 & 0x1f)) +
                           (uVar54 * 0x100 >> ((byte)iVar49 & 0x1f)))) +
                           ((ML_bits[uVar20] + uVar26) - (iVar33 + iVar49)) * 0x100 + 0x33;
                }
                uVar28 = uVar28 & 0xffffffff;
                pZVar36[uVar28].mlen = UVar15;
                pZVar36[uVar28].off = UVar14;
                pZVar36[uVar28].litlen = (U32)local_110;
                pZVar36[uVar28].price = iVar33 + UVar13 + iVar32;
                *(long *)pZVar36[uVar28].rep = rVar63.rep._0_8_;
                pZVar36[uVar28].rep[2] = rVar63.rep[2];
                uVar28 = (ulong)(UVar15 + 1);
                uVar23 = uVar23 + 0x100;
              } while (UVar15 + 1 <= uVar19);
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 != iVar57 + (uint)(iVar57 == 0));
          uVar28 = (ulong)((int)uVar28 - 1);
          iVar32 = 0;
        }
      }
      if (iVar32 == 7) {
LAB_001236aa:
        iVar32 = (uint)local_e8;
LAB_001236c8:
        uVar12 = (int)local_1c0 + 1;
        local_110 = (ZSTD_optimal_t *)(ulong)uVar12;
        local_e8 = (ulong *)CONCAT44(local_e8._4_4_,iVar32);
        pZVar36[(long)local_110].price = iVar32;
        pZVar36[(long)local_110].off = local_b4;
        pZVar36[(long)local_110].mlen = (U32)local_130;
        pZVar36[(long)local_110].litlen = (U32)local_80;
        *(undefined8 *)pZVar36[(long)local_110].rep = local_48;
        pZVar36[(long)local_110].rep[2] = local_40;
        uVar21 = (ulong)local_1c0 & 0xffffffff;
        uVar28 = (ulong)local_1c0 & 0xffffffff;
        uVar17 = (ulong)local_110;
        if ((int)local_1c0 != 0) {
          do {
            uVar17 = uVar28;
            uVar19 = (uint)uVar21;
            uVar26 = pZVar36[uVar21].litlen + pZVar36[uVar21].mlen;
            pZVar18 = pZVar36 + uVar21;
            iVar32 = pZVar18->price;
            UVar14 = pZVar18->off;
            UVar15 = pZVar18->mlen;
            UVar16 = pZVar18->litlen;
            pZVar18 = pZVar36 + uVar21;
            UVar13 = pZVar18->rep[0];
            uVar11 = *(undefined8 *)(&pZVar18->litlen + 2);
            pZVar43 = pZVar36 + uVar17;
            pZVar43->litlen = pZVar18->litlen;
            pZVar43->rep[0] = UVar13;
            *(undefined8 *)(&pZVar43->litlen + 2) = uVar11;
            pZVar18 = pZVar36 + uVar17;
            pZVar18->price = iVar32;
            pZVar18->off = UVar14;
            pZVar18->mlen = UVar15;
            pZVar18->litlen = UVar16;
            uVar21 = (ulong)(uVar19 - uVar26);
            if (uVar26 > uVar19) {
              uVar21 = 0;
            }
            uVar28 = (ulong)((int)uVar17 - 1);
          } while (uVar26 <= uVar19 && uVar19 - uVar26 != 0);
        }
        if ((uint)uVar17 <= uVar12) {
          do {
            puVar38 = local_78;
            uVar12 = pZVar36[uVar17].litlen;
            uVar28 = (ulong)uVar12;
            UVar13 = pZVar36[uVar17].mlen;
            if (UVar13 == 0) {
              puVar38 = (ulong *)(uVar28 + (long)local_78);
            }
            else {
              uVar19 = pZVar36[uVar17].off;
              if (uVar19 < 3) {
                uVar26 = (uVar28 == 0) + uVar19;
                if (uVar26 != 0) {
                  if (uVar26 == 3) {
                    UVar14 = *local_98 - 1;
                  }
                  else {
                    UVar14 = local_98[uVar26];
                  }
                  if (uVar26 != 1) {
                    local_98[2] = local_98[1];
                  }
                  local_98[1] = *local_98;
                  goto LAB_0012383b;
                }
              }
              else {
                *(undefined8 *)(local_98 + 1) = *(undefined8 *)local_98;
                UVar14 = uVar19 - 2;
LAB_0012383b:
                *local_98 = UVar14;
              }
              ZSTD_updateStats(poVar1,uVar12,(BYTE *)local_78,uVar19,UVar13);
              puVar35 = (ulong *)seqStore->lit;
              puVar39 = (ulong *)((long)puVar35 + uVar28);
              do {
                *puVar35 = *puVar38;
                puVar35 = puVar35 + 1;
                puVar38 = puVar38 + 1;
              } while (puVar35 < puVar39);
              seqStore->lit = seqStore->lit + uVar28;
              if (0xffff < uVar12) {
                seqStore->longLengthID = 1;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              psVar9 = seqStore->sequences;
              psVar9->litLength = (U16)uVar12;
              psVar9->offset = uVar19 + 1;
              if (0xffff < UVar13 - 3) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar9 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar9->matchLength = (U16)(UVar13 - 3);
              seqStore->sequences = psVar9 + 1;
              puVar38 = (ulong *)((long)local_78 + (ulong)(UVar13 + uVar12));
              local_78 = puVar38;
            }
            uVar12 = (int)uVar17 + 1;
            uVar17 = (ulong)uVar12;
          } while (uVar12 <= (uint)local_110);
        }
        ZSTD_setBasePrices(poVar1,2);
      }
      else if (iVar32 == 0) {
        if ((int)uVar28 != 0) {
          local_1c0 = (ZSTD_optimal_t *)0x1;
          do {
            iVar32 = (int)local_1c0;
            pZVar18 = pZVar36 + (iVar32 - 1U);
            UVar13 = 1;
            if (pZVar36[iVar32 - 1U].mlen == 0) {
              UVar13 = pZVar18->litlen + 1;
            }
            puVar39 = (ulong *)((long)puVar38 + (long)local_1c0);
            local_110 = (ZSTD_optimal_t *)CONCAT44(local_110._4_4_,pZVar18->price);
            UVar14 = ZSTD_rawLiteralsCost((BYTE *)((long)puVar39 + -1),1,poVar1,2);
            UVar15 = ZSTD_litLengthPrice(UVar13,poVar1,2);
            iVar57 = UVar15 + UVar14 + (uint)local_110;
            UVar14 = ZSTD_litLengthPrice(UVar13 - 1,poVar1,2);
            iVar57 = iVar57 - UVar14;
            pZVar43 = pZVar36 + (long)local_1c0;
            if (iVar57 <= pZVar36[(long)local_1c0].price) {
              pZVar43->off = 0;
              pZVar43->mlen = 0;
              pZVar43->litlen = UVar13;
              pZVar43->price = iVar57;
              *(undefined8 *)pZVar43->rep = *(undefined8 *)pZVar18->rep;
              pZVar43->rep[2] = pZVar18->rep[2];
            }
            uVar12 = 0x13;
            if (puVar39 <= puVar55) {
              if (iVar32 == (int)uVar28) {
                uVar12 = 0x11;
              }
              else {
                UVar13 = pZVar43->mlen;
                local_1f0._0_4_ = 0;
                local_168 = (ZSTD_optimal_t *)0x0;
                local_108 = (ulong *)CONCAT71(local_108._1_7_,UVar13 != 0);
                if (UVar13 == 0) {
                  local_168 = (ZSTD_optimal_t *)(ulong)pZVar43->litlen;
                }
                local_a0 = (U32 *)CONCAT44(local_a0._4_4_,pZVar43->price);
                local_c8 = pZVar43;
                UVar14 = ZSTD_litLengthPrice(0,poVar1,2);
                local_110 = (ZSTD_optimal_t *)CONCAT44(local_110._4_4_,UVar14);
                pBVar37 = (ms->window).base;
                uVar12 = ms->nextToUpdate;
                uVar17 = (ulong)uVar12;
                if (pBVar37 + uVar17 <= puVar39) {
                  UVar14 = (ms->cParams).minMatch;
                  iVar57 = (int)puVar39;
                  uVar19 = iVar57 - (int)pBVar37;
                  while (uVar12 < uVar19) {
                    UVar15 = ZSTD_insertBt1(ms,pBVar37 + uVar17,(BYTE *)puVar50,UVar14,0);
                    uVar12 = (int)uVar17 + UVar15;
                    uVar17 = (ulong)uVar12;
                  }
                  ms->nextToUpdate = uVar19;
                  local_e0._4_4_ = (undefined4)((ulong)local_e0 >> 0x20);
                  local_100._4_4_ = (undefined4)((ulong)local_100 >> 0x20);
                  if (UVar14 - 6 < 2) {
                    uVar17 = (ulong)(UVar13 != 0);
                    uVar12 = (ms->cParams).targetLength;
                    if (0xffe < uVar12) {
                      uVar12 = 0xfff;
                    }
                    local_e0 = (ulong *)CONCAT44(local_e0._4_4_,uVar12);
                    pBVar37 = (ms->window).base;
                    uVar26 = iVar57 - (int)pBVar37;
                    local_d0 = (ulong *)(ulong)uVar26;
                    local_68 = (U32 *)(*puVar39 * -0x30e4432340650000 >>
                                      (-(char)(ms->cParams).hashLog & 0x3fU));
                    pUVar59 = ms->chainTable;
                    uVar23 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                    uVar19 = uVar26 - uVar23;
                    local_1c8 = (BYTE *)0x0;
                    if (uVar26 < uVar23) {
                      uVar19 = 0;
                    }
                    local_100 = (ulong *)CONCAT44(local_100._4_4_,uVar19);
                    UVar13 = (ms->window).lowLimit;
                    uVar21 = (ulong)((uVar23 & uVar26) * 2);
                    local_180 = pUVar59 + uVar21;
                    local_188 = pUVar59 + uVar21 + 1;
                    iVar33 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
                    UVar14 = (ms->window).dictLimit;
                    local_90 = -uVar17;
                    bVar61 = true;
                    local_70 = ms->hashTable;
                    uVar34 = (ulong)local_70[(long)local_68];
                    iVar57 = uVar26 + 9;
                    uVar21 = uVar17 + 3;
                    puVar35 = (ulong *)((long)puVar39 + 4);
                    local_c0 = (ulong *)((long)puVar39 + 0xc);
                    pBVar46 = (BYTE *)local_b0;
                    local_1f0 = local_c0;
                    do {
                      if (uVar17 == 3) {
                        UVar15 = local_c8->rep[0] - 1;
                      }
                      else {
                        UVar15 = local_c8->rep[uVar17];
                      }
                      pBVar45 = (BYTE *)0x0;
                      if ((UVar15 - 1 < uVar26 - UVar14) &&
                         ((uint)*puVar39 == *(uint *)((long)puVar39 - (ulong)UVar15))) {
                        puVar41 = (ulong *)((long)puVar35 - (ulong)UVar15);
                        puVar44 = puVar35;
                        if (puVar35 < puVar2) {
                          uVar40 = *puVar35 ^ *puVar41;
                          uVar52 = 0;
                          if (uVar40 != 0) {
                            for (; (uVar40 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                            }
                          }
                          uVar52 = uVar52 >> 3 & 0x1fffffff;
                          iVar49 = (int)uVar52;
                          puVar44 = local_c0;
                          if (*puVar41 == *puVar35) {
                            do {
                              puVar41 = puVar41 + 1;
                              if (puVar2 <= puVar44) goto LAB_001221d7;
                              uVar40 = *puVar41;
                              uVar51 = *puVar44;
                              uVar8 = 0;
                              if ((uVar51 ^ uVar40) != 0) {
                                for (; ((uVar51 ^ uVar40) >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                                }
                              }
                              puVar30 = (ulong *)((uVar8 >> 3 & 0x1fffffff) + (long)puVar44);
                              puVar44 = puVar44 + 1;
                              if (uVar40 != uVar51) {
                                uVar52 = (long)puVar30 - (long)puVar35;
                                puVar44 = puVar30;
                              }
                              iVar49 = (int)uVar52;
                            } while (uVar40 == uVar51);
                          }
                        }
                        else {
LAB_001221d7:
                          if ((puVar44 < puVar3) && ((uint)*puVar41 == (uint)*puVar44)) {
                            puVar44 = (ulong *)((long)puVar44 + 4);
                            puVar41 = (ulong *)((long)puVar41 + 4);
                          }
                          if ((puVar44 < puVar5) && ((short)*puVar41 == (short)*puVar44)) {
                            puVar44 = (ulong *)((long)puVar44 + 2);
                            puVar41 = (ulong *)((long)puVar41 + 2);
                          }
                          if (puVar44 < puVar50) {
                            puVar44 = (ulong *)((long)puVar44 +
                                               (ulong)((BYTE)*puVar41 == (BYTE)*puVar44));
                          }
                          iVar49 = (int)puVar44 - (int)puVar35;
                        }
                        pBVar45 = (BYTE *)(ulong)(iVar49 + 4);
                      }
                      uVar31 = (uint)pBVar45;
                      bVar25 = true;
                      if (pBVar46 < pBVar45) {
                        pZVar7[(long)local_1c8].off = (int)local_90 + (int)uVar17;
                        uVar20 = (int)local_1c8 + 1;
                        pZVar7[(long)local_1c8].len = uVar31;
                        bVar62 = (ulong *)((long)puVar39 + (long)pBVar45) != puVar50;
                        bVar25 = bVar62 && uVar31 <= uVar12;
                        local_1c8 = (BYTE *)(ulong)uVar20;
                        local_1f0 = (ulong *)((ulong)local_1f0 & 0xffffffff);
                        pBVar46 = pBVar45;
                        if (!bVar62 || uVar31 > uVar12) {
                          local_1f0 = (ulong *)(ulong)uVar20;
                        }
                      }
                      if (!bVar25) break;
                      uVar17 = uVar17 + 1;
                      bVar61 = uVar17 < uVar21;
                    } while (bVar61);
                    if (!bVar61) {
                      local_70[(long)local_68] = uVar26;
                      local_d0 = (ulong *)(ulong)(uVar26 + 2);
                      local_1f0 = (ulong *)0x0;
                      pBVar45 = (BYTE *)0x0;
                      do {
                        bVar61 = iVar33 == 0;
                        iVar33 = iVar33 + -1;
                        if ((bVar61) || (uVar12 = (uint)uVar34, uVar12 < UVar13 + (UVar13 == 0)))
                        break;
                        puVar35 = local_1f0;
                        if (pBVar45 < local_1f0) {
                          puVar35 = (ulong *)pBVar45;
                        }
                        puVar44 = (ulong *)((long)puVar39 + (long)puVar35);
                        puVar41 = (ulong *)(pBVar37 + (long)((long)puVar35 + uVar34));
                        puVar30 = puVar44;
                        if (puVar44 < puVar2) {
                          uVar21 = *puVar44 ^ *puVar41;
                          uVar17 = 0;
                          if (uVar21 != 0) {
                            for (; (uVar21 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                            }
                          }
                          pBVar58 = (BYTE *)(uVar17 >> 3 & 0x1fffffff);
                          if (*puVar41 == *puVar44) {
                            do {
                              puVar30 = puVar30 + 1;
                              puVar41 = puVar41 + 1;
                              if (puVar2 <= puVar30) goto LAB_001223aa;
                              uVar21 = *puVar30 ^ *puVar41;
                              uVar17 = 0;
                              if (uVar21 != 0) {
                                for (; (uVar21 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                                }
                              }
                              pBVar58 = (BYTE *)((long)puVar30 +
                                                ((uVar17 >> 3 & 0x1fffffff) - (long)puVar44));
                            } while (*puVar41 == *puVar30);
                          }
                        }
                        else {
LAB_001223aa:
                          if ((puVar30 < puVar3) && ((uint)*puVar41 == (uint)*puVar30)) {
                            puVar30 = (ulong *)((long)puVar30 + 4);
                            puVar41 = (ulong *)((long)puVar41 + 4);
                          }
                          if ((puVar30 < puVar5) && ((short)*puVar41 == (short)*puVar30)) {
                            puVar30 = (ulong *)((long)puVar30 + 2);
                            puVar41 = (ulong *)((long)puVar41 + 2);
                          }
                          if (puVar30 < puVar50) {
                            puVar30 = (ulong *)((long)puVar30 +
                                               (ulong)((BYTE)*puVar41 == (BYTE)*puVar30));
                          }
                          pBVar58 = (BYTE *)((long)puVar30 - (long)puVar44);
                        }
                        pBVar58 = pBVar58 + (long)puVar35;
                        if (pBVar46 < pBVar58) {
                          iVar49 = uVar12 + (U32)pBVar58;
                          if (pBVar58 <= (BYTE *)(ulong)(iVar57 - uVar12)) {
                            iVar49 = iVar57;
                          }
                          pZVar7[(long)local_1c8].off = (int)local_d0 - uVar12;
                          pZVar7[(long)local_1c8].len = (U32)pBVar58;
                          local_1c8 = (BYTE *)(ulong)((int)local_1c8 + 1);
                          bVar61 = false;
                          pBVar46 = pBVar58;
                          iVar57 = iVar49;
                          if ((pBVar58 < (BYTE *)0x1001) &&
                             ((ulong *)((long)puVar39 + (long)pBVar58) != puVar50))
                          goto LAB_0012246f;
                        }
                        else {
LAB_0012246f:
                          puVar24 = pUVar59 + (uVar12 & uVar23) * 2;
                          if (pBVar37[(long)(pBVar58 + uVar34)] <
                              *(byte *)((long)puVar39 + (long)pBVar58)) {
                            *local_180 = uVar12;
                            pBVar45 = pBVar58;
                            if (uVar19 < uVar12) {
                              puVar24 = puVar24 + 1;
                              local_180 = puVar24;
LAB_001224cd:
                              uVar34 = (ulong)*puVar24;
                              bVar61 = true;
                            }
                            else {
                              bVar61 = false;
                              local_180 = (uint *)&local_f8;
                            }
                          }
                          else {
                            *local_188 = uVar12;
                            local_1f0 = (ulong *)pBVar58;
                            local_188 = puVar24;
                            if (uVar19 < uVar12) goto LAB_001224cd;
                            bVar61 = false;
                            local_188 = (uint *)&local_f8;
                          }
                        }
                      } while (bVar61);
LAB_00122faa:
                      *local_188 = 0;
                      *local_180 = 0;
                      ms->nextToUpdate = iVar57 - 8;
                      local_1f0._0_4_ = (int)local_1c8;
                    }
                  }
                  else if (UVar14 == 5) {
                    uVar17 = (ulong)(UVar13 != 0);
                    uVar12 = (ms->cParams).targetLength;
                    if (0xffe < uVar12) {
                      uVar12 = 0xfff;
                    }
                    local_e0 = (ulong *)CONCAT44(local_e0._4_4_,uVar12);
                    pBVar37 = (ms->window).base;
                    uVar23 = iVar57 - (int)pBVar37;
                    local_d0 = (ulong *)(ulong)uVar23;
                    local_68 = (U32 *)(*puVar39 * -0x30e4432345000000 >>
                                      (-(char)(ms->cParams).hashLog & 0x3fU));
                    pUVar59 = ms->chainTable;
                    uVar26 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                    uVar19 = uVar23 - uVar26;
                    local_1c8 = (BYTE *)0x0;
                    if (uVar23 < uVar26) {
                      uVar19 = 0;
                    }
                    local_100 = (ulong *)CONCAT44(local_100._4_4_,uVar19);
                    UVar13 = (ms->window).lowLimit;
                    uVar21 = (ulong)((uVar26 & uVar23) * 2);
                    local_180 = pUVar59 + uVar21;
                    local_188 = pUVar59 + uVar21 + 1;
                    iVar33 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
                    UVar14 = (ms->window).dictLimit;
                    local_90 = -uVar17;
                    bVar61 = true;
                    local_70 = ms->hashTable;
                    uVar34 = (ulong)local_70[(long)local_68];
                    iVar57 = uVar23 + 9;
                    uVar21 = uVar17 + 3;
                    puVar35 = (ulong *)((long)puVar39 + 4);
                    local_c0 = (ulong *)((long)puVar39 + 0xc);
                    pBVar46 = (BYTE *)local_b0;
                    local_1f0 = local_c0;
                    do {
                      if (uVar17 == 3) {
                        UVar15 = local_c8->rep[0] - 1;
                      }
                      else {
                        UVar15 = local_c8->rep[uVar17];
                      }
                      pBVar45 = (BYTE *)0x0;
                      if ((UVar15 - 1 < uVar23 - UVar14) &&
                         ((uint)*puVar39 == *(uint *)((long)puVar39 - (ulong)UVar15))) {
                        puVar41 = (ulong *)((long)puVar35 - (ulong)UVar15);
                        puVar44 = puVar35;
                        if (puVar35 < puVar2) {
                          uVar40 = *puVar35 ^ *puVar41;
                          uVar52 = 0;
                          if (uVar40 != 0) {
                            for (; (uVar40 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                            }
                          }
                          uVar52 = uVar52 >> 3 & 0x1fffffff;
                          iVar49 = (int)uVar52;
                          puVar44 = local_c0;
                          if (*puVar41 == *puVar35) {
                            do {
                              puVar41 = puVar41 + 1;
                              if (puVar2 <= puVar44) goto LAB_00122720;
                              uVar40 = *puVar41;
                              uVar51 = *puVar44;
                              uVar8 = 0;
                              if ((uVar51 ^ uVar40) != 0) {
                                for (; ((uVar51 ^ uVar40) >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                                }
                              }
                              puVar30 = (ulong *)((uVar8 >> 3 & 0x1fffffff) + (long)puVar44);
                              puVar44 = puVar44 + 1;
                              if (uVar40 != uVar51) {
                                uVar52 = (long)puVar30 - (long)puVar35;
                                puVar44 = puVar30;
                              }
                              iVar49 = (int)uVar52;
                            } while (uVar40 == uVar51);
                          }
                        }
                        else {
LAB_00122720:
                          if ((puVar44 < puVar3) && ((uint)*puVar41 == (uint)*puVar44)) {
                            puVar44 = (ulong *)((long)puVar44 + 4);
                            puVar41 = (ulong *)((long)puVar41 + 4);
                          }
                          if ((puVar44 < puVar5) && ((short)*puVar41 == (short)*puVar44)) {
                            puVar44 = (ulong *)((long)puVar44 + 2);
                            puVar41 = (ulong *)((long)puVar41 + 2);
                          }
                          if (puVar44 < puVar50) {
                            puVar44 = (ulong *)((long)puVar44 +
                                               (ulong)((BYTE)*puVar41 == (BYTE)*puVar44));
                          }
                          iVar49 = (int)puVar44 - (int)puVar35;
                        }
                        pBVar45 = (BYTE *)(ulong)(iVar49 + 4);
                      }
                      uVar31 = (uint)pBVar45;
                      bVar25 = true;
                      if (pBVar46 < pBVar45) {
                        pZVar7[(long)local_1c8].off = (int)local_90 + (int)uVar17;
                        uVar20 = (int)local_1c8 + 1;
                        pZVar7[(long)local_1c8].len = uVar31;
                        bVar62 = (ulong *)((long)puVar39 + (long)pBVar45) != puVar50;
                        bVar25 = bVar62 && uVar31 <= uVar12;
                        local_1c8 = (BYTE *)(ulong)uVar20;
                        local_1f0 = (ulong *)((ulong)local_1f0 & 0xffffffff);
                        pBVar46 = pBVar45;
                        if (!bVar62 || uVar31 > uVar12) {
                          local_1f0 = (ulong *)(ulong)uVar20;
                        }
                      }
                      if (!bVar25) break;
                      uVar17 = uVar17 + 1;
                      bVar61 = uVar17 < uVar21;
                    } while (bVar61);
                    if (!bVar61) {
                      local_70[(long)local_68] = uVar23;
                      local_d0 = (ulong *)(ulong)(uVar23 + 2);
                      local_1f0 = (ulong *)0x0;
                      pBVar45 = (BYTE *)0x0;
                      do {
                        bVar61 = iVar33 == 0;
                        iVar33 = iVar33 + -1;
                        if ((bVar61) || (uVar12 = (uint)uVar34, uVar12 < UVar13 + (UVar13 == 0)))
                        break;
                        puVar35 = local_1f0;
                        if (pBVar45 < local_1f0) {
                          puVar35 = (ulong *)pBVar45;
                        }
                        puVar44 = (ulong *)((long)puVar39 + (long)puVar35);
                        puVar41 = (ulong *)(pBVar37 + (long)((long)puVar35 + uVar34));
                        puVar30 = puVar44;
                        if (puVar44 < puVar2) {
                          uVar21 = *puVar44 ^ *puVar41;
                          uVar17 = 0;
                          if (uVar21 != 0) {
                            for (; (uVar21 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                            }
                          }
                          pBVar58 = (BYTE *)(uVar17 >> 3 & 0x1fffffff);
                          if (*puVar41 == *puVar44) {
                            do {
                              puVar30 = puVar30 + 1;
                              puVar41 = puVar41 + 1;
                              if (puVar2 <= puVar30) goto LAB_001228ec;
                              uVar21 = *puVar30 ^ *puVar41;
                              uVar17 = 0;
                              if (uVar21 != 0) {
                                for (; (uVar21 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                                }
                              }
                              pBVar58 = (BYTE *)((long)puVar30 +
                                                ((uVar17 >> 3 & 0x1fffffff) - (long)puVar44));
                            } while (*puVar41 == *puVar30);
                          }
                        }
                        else {
LAB_001228ec:
                          if ((puVar30 < puVar3) && ((uint)*puVar41 == (uint)*puVar30)) {
                            puVar30 = (ulong *)((long)puVar30 + 4);
                            puVar41 = (ulong *)((long)puVar41 + 4);
                          }
                          if ((puVar30 < puVar5) && ((short)*puVar41 == (short)*puVar30)) {
                            puVar30 = (ulong *)((long)puVar30 + 2);
                            puVar41 = (ulong *)((long)puVar41 + 2);
                          }
                          if (puVar30 < puVar50) {
                            puVar30 = (ulong *)((long)puVar30 +
                                               (ulong)((BYTE)*puVar41 == (BYTE)*puVar30));
                          }
                          pBVar58 = (BYTE *)((long)puVar30 - (long)puVar44);
                        }
                        pBVar58 = pBVar58 + (long)puVar35;
                        if (pBVar46 < pBVar58) {
                          iVar49 = uVar12 + (U32)pBVar58;
                          if (pBVar58 <= (BYTE *)(ulong)(iVar57 - uVar12)) {
                            iVar49 = iVar57;
                          }
                          pZVar7[(long)local_1c8].off = (int)local_d0 - uVar12;
                          pZVar7[(long)local_1c8].len = (U32)pBVar58;
                          local_1c8 = (BYTE *)(ulong)((int)local_1c8 + 1);
                          bVar61 = false;
                          pBVar46 = pBVar58;
                          iVar57 = iVar49;
                          if ((pBVar58 < (BYTE *)0x1001) &&
                             ((ulong *)((long)puVar39 + (long)pBVar58) != puVar50))
                          goto LAB_001229b1;
                        }
                        else {
LAB_001229b1:
                          puVar24 = pUVar59 + (uVar12 & uVar26) * 2;
                          if (pBVar37[(long)(pBVar58 + uVar34)] <
                              *(byte *)((long)puVar39 + (long)pBVar58)) {
                            *local_180 = uVar12;
                            pBVar45 = pBVar58;
                            if (uVar19 < uVar12) {
                              puVar24 = puVar24 + 1;
                              local_180 = puVar24;
LAB_00122a0f:
                              uVar34 = (ulong)*puVar24;
                              bVar61 = true;
                            }
                            else {
                              bVar61 = false;
                              local_180 = (uint *)&local_f8;
                            }
                          }
                          else {
                            *local_188 = uVar12;
                            local_1f0 = (ulong *)pBVar58;
                            local_188 = puVar24;
                            if (uVar19 < uVar12) goto LAB_00122a0f;
                            bVar61 = false;
                            local_188 = (uint *)&local_f8;
                          }
                        }
                      } while (bVar61);
                      goto LAB_00122faa;
                    }
                  }
                  else if (UVar14 == 3) {
                    uVar17 = (ulong)(uint)(UVar13 != 0);
                    uVar12 = (ms->cParams).targetLength;
                    if (0xffe < uVar12) {
                      uVar12 = 0xfff;
                    }
                    local_e0 = (ulong *)CONCAT44(local_e0._4_4_,uVar12);
                    pBVar37 = (ms->window).base;
                    uVar31 = iVar57 - (int)pBVar37;
                    local_100 = (ulong *)(ulong)uVar31;
                    uVar19 = 0;
                    local_68 = (U32 *)(ulong)((uint)*puVar39 * -0x61c8864f >>
                                             (-(char)(ms->cParams).hashLog & 0x1fU));
                    pUVar59 = ms->chainTable;
                    uVar23 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                    uVar26 = uVar31 - uVar23;
                    if (uVar31 < uVar23) {
                      uVar26 = uVar19;
                    }
                    UVar14 = (ms->window).lowLimit;
                    local_90._4_4_ = (undefined4)((ulong)local_90 >> 0x20);
                    local_90 = CONCAT44(local_90._4_4_,UVar14 + (UVar14 == 0));
                    uVar21 = (ulong)((uVar23 & uVar31) * 2);
                    local_188 = pUVar59 + uVar21;
                    local_1b8 = pUVar59 + uVar21 + 1;
                    iVar33 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
                    UVar14 = (ms->window).dictLimit;
                    bVar61 = true;
                    local_70 = ms->hashTable;
                    local_c0 = (ulong *)(ulong)local_70[(long)local_68];
                    iVar57 = uVar31 + 9;
                    uVar21 = uVar17 + 3;
                    puVar35 = (ulong *)((long)puVar39 + 3);
                    local_d0 = (ulong *)((long)puVar39 + 0xb);
                    local_1f0 = local_d0;
                    local_1c8 = (BYTE *)local_b0;
                    do {
                      if (uVar17 == 3) {
                        UVar15 = local_c8->rep[0] - 1;
                      }
                      else {
                        UVar15 = local_c8->rep[uVar17];
                      }
                      pBVar46 = (BYTE *)0x0;
                      if ((UVar15 - 1 < uVar31 - UVar14) &&
                         (((*(uint *)((long)puVar39 - (ulong)UVar15) ^ (uint)*puVar39) & 0xffffff)
                          == 0)) {
                        puVar41 = (ulong *)((long)puVar35 - (ulong)UVar15);
                        puVar44 = puVar35;
                        if (puVar35 < puVar2) {
                          uVar52 = *puVar35 ^ *puVar41;
                          uVar34 = 0;
                          if (uVar52 != 0) {
                            for (; (uVar52 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                            }
                          }
                          uVar34 = uVar34 >> 3 & 0x1fffffff;
                          iVar49 = (int)uVar34;
                          puVar44 = local_d0;
                          if (*puVar41 == *puVar35) {
                            do {
                              puVar41 = puVar41 + 1;
                              if (puVar2 <= puVar44) goto LAB_00121e0c;
                              uVar52 = *puVar41;
                              uVar40 = *puVar44;
                              uVar51 = 0;
                              if ((uVar40 ^ uVar52) != 0) {
                                for (; ((uVar40 ^ uVar52) >> uVar51 & 1) == 0; uVar51 = uVar51 + 1)
                                {
                                }
                              }
                              puVar30 = (ulong *)((uVar51 >> 3 & 0x1fffffff) + (long)puVar44);
                              puVar44 = puVar44 + 1;
                              if (uVar52 != uVar40) {
                                uVar34 = (long)puVar30 - (long)puVar35;
                                puVar44 = puVar30;
                              }
                              iVar49 = (int)uVar34;
                            } while (uVar52 == uVar40);
                          }
                        }
                        else {
LAB_00121e0c:
                          if ((puVar44 < puVar3) && ((uint)*puVar41 == (uint)*puVar44)) {
                            puVar44 = (ulong *)((long)puVar44 + 4);
                            puVar41 = (ulong *)((long)puVar41 + 4);
                          }
                          if ((puVar44 < puVar5) && ((short)*puVar41 == (short)*puVar44)) {
                            puVar44 = (ulong *)((long)puVar44 + 2);
                            puVar41 = (ulong *)((long)puVar41 + 2);
                          }
                          if (puVar44 < puVar50) {
                            puVar44 = (ulong *)((long)puVar44 +
                                               (ulong)((BYTE)*puVar41 == (BYTE)*puVar44));
                          }
                          iVar49 = (int)puVar44 - (int)puVar35;
                        }
                        pBVar46 = (BYTE *)(ulong)(iVar49 + 3);
                      }
                      uVar20 = (uint)pBVar46;
                      bVar25 = true;
                      if (local_1c8 < pBVar46) {
                        pZVar7[uVar19].off = (int)uVar17 - (uint)(UVar13 != 0);
                        uVar54 = uVar19 + 1;
                        pZVar7[uVar19].len = uVar20;
                        bVar62 = (ulong *)((long)puVar39 + (long)pBVar46) != puVar50;
                        bVar25 = bVar62 && uVar20 <= uVar12;
                        local_1f0 = (ulong *)((ulong)local_1f0 & 0xffffffff);
                        uVar19 = uVar54;
                        local_1c8 = pBVar46;
                        if (!bVar62 || uVar20 > uVar12) {
                          local_1f0 = (ulong *)(ulong)uVar54;
                        }
                      }
                      if (!bVar25) break;
                      uVar17 = uVar17 + 1;
                      bVar61 = uVar17 < uVar21;
                    } while (bVar61);
                    if (!bVar61) {
                      if (local_1c8 < (BYTE *)0x3) {
                        UVar13 = ZSTD_insertAndFindFirstIndexHash3(ms,(BYTE *)puVar39);
                        bVar61 = true;
                        if ((uint)local_90 <= UVar13) {
                          uVar12 = (int)local_100 - UVar13;
                          if (uVar12 < 0x40000) {
                            puVar44 = (ulong *)(pBVar37 + UVar13);
                            puVar35 = puVar39;
                            if (puVar39 < puVar2) {
                              uVar21 = *puVar39 ^ *puVar44;
                              uVar17 = 0;
                              if (uVar21 != 0) {
                                for (; (uVar21 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                                }
                              }
                              pBVar46 = (BYTE *)(uVar17 >> 3 & 0x1fffffff);
                              if (*puVar44 == *puVar39) {
                                do {
                                  puVar35 = puVar35 + 1;
                                  puVar44 = puVar44 + 1;
                                  if (puVar2 <= puVar35) goto LAB_001232f4;
                                  uVar21 = *puVar35 ^ *puVar44;
                                  uVar17 = 0;
                                  if (uVar21 != 0) {
                                    for (; (uVar21 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                                    }
                                  }
                                  pBVar46 = (BYTE *)((long)puVar35 +
                                                    ((uVar17 >> 3 & 0x1fffffff) - (long)puVar39));
                                } while (*puVar44 == *puVar35);
                              }
                            }
                            else {
LAB_001232f4:
                              if ((puVar35 < puVar3) && ((uint)*puVar44 == (uint)*puVar35)) {
                                puVar35 = (ulong *)((long)puVar35 + 4);
                                puVar44 = (ulong *)((long)puVar44 + 4);
                              }
                              if ((puVar35 < puVar5) && ((short)*puVar44 == (short)*puVar35)) {
                                puVar35 = (ulong *)((long)puVar35 + 2);
                                puVar44 = (ulong *)((long)puVar44 + 2);
                              }
                              if (puVar35 < puVar50) {
                                puVar35 = (ulong *)((long)puVar35 +
                                                   (ulong)((BYTE)*puVar44 == (BYTE)*puVar35));
                              }
                              pBVar46 = (BYTE *)((long)puVar35 - (long)puVar39);
                            }
                            if ((BYTE *)0x2 < pBVar46) {
                              pZVar7->off = uVar12 + 2;
                              pZVar7->len = (U32)pBVar46;
                              local_1c8 = pBVar46;
                              if (((BYTE *)((ulong)local_e0 & 0xffffffff) < pBVar46) ||
                                 (uVar19 = 1, (ulong *)((long)puVar39 + (long)pBVar46) == puVar50))
                              {
                                ms->nextToUpdate = (int)local_100 + 1;
                                uVar19 = 1;
                                bVar61 = false;
                                local_1f0._0_4_ = 1;
                              }
                            }
                          }
                        }
                        if (!bVar61) goto LAB_00122fcb;
                      }
                      local_70[(long)local_68] = (U32)local_100;
                      uVar12 = (U32)local_100 + 2;
                      local_100 = (ulong *)(ulong)uVar12;
                      local_1f0 = (ulong *)(ulong)uVar19;
                      pBVar45 = (BYTE *)0x0;
                      pBVar46 = (BYTE *)0x0;
                      puVar35 = local_c0;
                      do {
                        bVar61 = iVar33 == 0;
                        iVar33 = iVar33 + -1;
                        if (bVar61) break;
                        uVar19 = (uint)puVar35;
                        if (uVar19 < (uint)local_90) break;
                        pBVar58 = pBVar45;
                        if (pBVar46 < pBVar45) {
                          pBVar58 = pBVar46;
                        }
                        puVar44 = (ulong *)((long)puVar39 + (long)pBVar58);
                        puVar41 = (ulong *)(pBVar37 +
                                           (long)(pBVar58 + ((ulong)puVar35 & 0xffffffff)));
                        puVar30 = puVar44;
                        if (puVar44 < puVar2) {
                          uVar21 = *puVar44 ^ *puVar41;
                          uVar17 = 0;
                          if (uVar21 != 0) {
                            for (; (uVar21 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                            }
                          }
                          pBVar53 = (BYTE *)(uVar17 >> 3 & 0x1fffffff);
                          if (*puVar41 == *puVar44) {
                            do {
                              puVar30 = puVar30 + 1;
                              puVar41 = puVar41 + 1;
                              if (puVar2 <= puVar30) goto LAB_001234ab;
                              uVar21 = *puVar30 ^ *puVar41;
                              uVar17 = 0;
                              if (uVar21 != 0) {
                                for (; (uVar21 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                                }
                              }
                              pBVar53 = (BYTE *)((long)puVar30 +
                                                ((uVar17 >> 3 & 0x1fffffff) - (long)puVar44));
                            } while (*puVar41 == *puVar30);
                          }
                        }
                        else {
LAB_001234ab:
                          if ((puVar30 < puVar3) && ((uint)*puVar41 == (uint)*puVar30)) {
                            puVar30 = (ulong *)((long)puVar30 + 4);
                            puVar41 = (ulong *)((long)puVar41 + 4);
                          }
                          if ((puVar30 < puVar5) && ((short)*puVar41 == (short)*puVar30)) {
                            puVar30 = (ulong *)((long)puVar30 + 2);
                            puVar41 = (ulong *)((long)puVar41 + 2);
                          }
                          if (puVar30 < puVar50) {
                            puVar30 = (ulong *)((long)puVar30 +
                                               (ulong)((BYTE)*puVar41 == (BYTE)*puVar30));
                          }
                          pBVar53 = (BYTE *)((long)puVar30 - (long)puVar44);
                        }
                        pBVar53 = pBVar53 + (long)pBVar58;
                        if (local_1c8 < pBVar53) {
                          iVar49 = uVar19 + (U32)pBVar53;
                          if (pBVar53 <= (BYTE *)(ulong)(iVar57 - uVar19)) {
                            iVar49 = iVar57;
                          }
                          pZVar7[(long)local_1f0].off = uVar12 - uVar19;
                          pZVar7[(long)local_1f0].len = (U32)pBVar53;
                          local_1f0 = (ulong *)(ulong)((uint)local_1f0 + 1);
                          iVar57 = iVar49;
                          local_1c8 = pBVar53;
                          if ((pBVar53 < (BYTE *)0x1001) &&
                             ((ulong *)((long)puVar39 + (long)pBVar53) != puVar50))
                          goto LAB_00123586;
LAB_00123610:
                          bVar61 = false;
                        }
                        else {
LAB_00123586:
                          puVar24 = pUVar59 + (uVar19 & uVar23) * 2;
                          if (*(byte *)((long)puVar39 + (long)pBVar53) <=
                              pBVar37[(long)(pBVar53 + ((ulong)puVar35 & 0xffffffff))]) {
                            *local_1b8 = uVar19;
                            local_1b8 = puVar24;
                            if (uVar26 < uVar19) goto LAB_001235e3;
                            local_1b8 = (uint *)&local_f8;
                            pBVar45 = pBVar53;
                            goto LAB_00123610;
                          }
                          *local_188 = uVar19;
                          pBVar46 = pBVar53;
                          if (uVar26 < uVar19) {
                            puVar24 = puVar24 + 1;
                            pBVar53 = pBVar45;
                            local_188 = puVar24;
LAB_001235e3:
                            puVar35 = (ulong *)(ulong)*puVar24;
                            bVar61 = true;
                            pBVar45 = pBVar53;
                          }
                          else {
                            bVar61 = false;
                            local_188 = (uint *)&local_f8;
                          }
                        }
                      } while (bVar61);
                      *local_1b8 = 0;
                      *local_188 = 0;
                      ms->nextToUpdate = iVar57 - 8;
                    }
                  }
                  else {
                    uVar17 = (ulong)(UVar13 != 0);
                    uVar12 = (ms->cParams).targetLength;
                    if (0xffe < uVar12) {
                      uVar12 = 0xfff;
                    }
                    local_e0 = (ulong *)CONCAT44(local_e0._4_4_,uVar12);
                    pBVar37 = (ms->window).base;
                    uVar23 = iVar57 - (int)pBVar37;
                    local_d0 = (ulong *)(ulong)uVar23;
                    local_68 = (U32 *)(ulong)((uint)*puVar39 * -0x61c8864f >>
                                             (-(char)(ms->cParams).hashLog & 0x1fU));
                    pUVar59 = ms->chainTable;
                    uVar26 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                    uVar19 = uVar23 - uVar26;
                    local_1c8 = (BYTE *)0x0;
                    if (uVar23 < uVar26) {
                      uVar19 = 0;
                    }
                    local_100 = (ulong *)CONCAT44(local_100._4_4_,uVar19);
                    UVar13 = (ms->window).lowLimit;
                    uVar21 = (ulong)((uVar26 & uVar23) * 2);
                    local_180 = pUVar59 + uVar21;
                    local_188 = pUVar59 + uVar21 + 1;
                    iVar33 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
                    UVar14 = (ms->window).dictLimit;
                    local_90 = -uVar17;
                    bVar61 = true;
                    local_70 = ms->hashTable;
                    uVar34 = (ulong)local_70[(long)local_68];
                    iVar57 = uVar23 + 9;
                    uVar21 = uVar17 + 3;
                    puVar35 = (ulong *)((long)puVar39 + 4);
                    local_c0 = (ulong *)((long)puVar39 + 0xc);
                    pBVar46 = (BYTE *)local_b0;
                    local_1f0 = local_c0;
                    do {
                      if (uVar17 == 3) {
                        uVar31 = local_c8->rep[0] - 1;
                      }
                      else {
                        uVar31 = local_c8->rep[uVar17];
                      }
                      pBVar45 = (BYTE *)0x0;
                      if ((uVar31 - 1 < uVar23 - UVar14) &&
                         ((uint)*puVar39 == *(uint *)((long)puVar39 - (ulong)uVar31))) {
                        puVar41 = (ulong *)((long)puVar35 - (ulong)uVar31);
                        puVar44 = puVar35;
                        if (puVar35 < puVar2) {
                          uVar40 = *puVar35 ^ *puVar41;
                          uVar52 = 0;
                          if (uVar40 != 0) {
                            for (; (uVar40 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                            }
                          }
                          uVar52 = uVar52 >> 3 & 0x1fffffff;
                          iVar49 = (int)uVar52;
                          puVar44 = local_c0;
                          if (*puVar41 == *puVar35) {
                            do {
                              puVar41 = puVar41 + 1;
                              if (puVar2 <= puVar44) goto LAB_00122c6f;
                              uVar40 = *puVar41;
                              uVar51 = *puVar44;
                              uVar8 = 0;
                              if ((uVar51 ^ uVar40) != 0) {
                                for (; ((uVar51 ^ uVar40) >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                                }
                              }
                              puVar30 = (ulong *)((uVar8 >> 3 & 0x1fffffff) + (long)puVar44);
                              puVar44 = puVar44 + 1;
                              if (uVar40 != uVar51) {
                                uVar52 = (long)puVar30 - (long)puVar35;
                                puVar44 = puVar30;
                              }
                              iVar49 = (int)uVar52;
                            } while (uVar40 == uVar51);
                          }
                        }
                        else {
LAB_00122c6f:
                          if ((puVar44 < puVar3) && ((uint)*puVar41 == (uint)*puVar44)) {
                            puVar44 = (ulong *)((long)puVar44 + 4);
                            puVar41 = (ulong *)((long)puVar41 + 4);
                          }
                          if ((puVar44 < puVar5) && ((short)*puVar41 == (short)*puVar44)) {
                            puVar44 = (ulong *)((long)puVar44 + 2);
                            puVar41 = (ulong *)((long)puVar41 + 2);
                          }
                          if (puVar44 < puVar50) {
                            puVar44 = (ulong *)((long)puVar44 +
                                               (ulong)((BYTE)*puVar41 == (BYTE)*puVar44));
                          }
                          iVar49 = (int)puVar44 - (int)puVar35;
                        }
                        pBVar45 = (BYTE *)(ulong)(iVar49 + 4);
                      }
                      uVar31 = (uint)pBVar45;
                      bVar25 = true;
                      if (pBVar46 < pBVar45) {
                        pZVar7[(long)local_1c8].off = (int)local_90 + (int)uVar17;
                        uVar20 = (int)local_1c8 + 1;
                        pZVar7[(long)local_1c8].len = uVar31;
                        bVar62 = (ulong *)((long)puVar39 + (long)pBVar45) != puVar50;
                        bVar25 = bVar62 && uVar31 <= uVar12;
                        local_1c8 = (BYTE *)(ulong)uVar20;
                        local_1f0 = (ulong *)((ulong)local_1f0 & 0xffffffff);
                        pBVar46 = pBVar45;
                        if (!bVar62 || uVar31 > uVar12) {
                          local_1f0 = (ulong *)(ulong)uVar20;
                        }
                      }
                      if (!bVar25) break;
                      uVar17 = uVar17 + 1;
                      bVar61 = uVar17 < uVar21;
                    } while (bVar61);
                    if (!bVar61) {
                      local_70[(long)local_68] = uVar23;
                      local_d0 = (ulong *)(ulong)(uVar23 + 2);
                      local_1f0 = (ulong *)0x0;
                      pBVar45 = (BYTE *)0x0;
                      do {
                        bVar61 = iVar33 == 0;
                        iVar33 = iVar33 + -1;
                        if ((bVar61) || (uVar12 = (uint)uVar34, uVar12 < UVar13 + (UVar13 == 0)))
                        break;
                        puVar35 = local_1f0;
                        if (pBVar45 < local_1f0) {
                          puVar35 = (ulong *)pBVar45;
                        }
                        puVar44 = (ulong *)((long)puVar39 + (long)puVar35);
                        puVar41 = (ulong *)(pBVar37 + (long)((long)puVar35 + uVar34));
                        puVar30 = puVar44;
                        if (puVar44 < puVar2) {
                          uVar21 = *puVar44 ^ *puVar41;
                          uVar17 = 0;
                          if (uVar21 != 0) {
                            for (; (uVar21 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                            }
                          }
                          pBVar58 = (BYTE *)(uVar17 >> 3 & 0x1fffffff);
                          if (*puVar41 == *puVar44) {
                            do {
                              puVar30 = puVar30 + 1;
                              puVar41 = puVar41 + 1;
                              if (puVar2 <= puVar30) goto LAB_00122e3a;
                              uVar21 = *puVar30 ^ *puVar41;
                              uVar17 = 0;
                              if (uVar21 != 0) {
                                for (; (uVar21 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                                }
                              }
                              pBVar58 = (BYTE *)((long)puVar30 +
                                                ((uVar17 >> 3 & 0x1fffffff) - (long)puVar44));
                            } while (*puVar41 == *puVar30);
                          }
                        }
                        else {
LAB_00122e3a:
                          if ((puVar30 < puVar3) && ((uint)*puVar41 == (uint)*puVar30)) {
                            puVar30 = (ulong *)((long)puVar30 + 4);
                            puVar41 = (ulong *)((long)puVar41 + 4);
                          }
                          if ((puVar30 < puVar5) && ((short)*puVar41 == (short)*puVar30)) {
                            puVar30 = (ulong *)((long)puVar30 + 2);
                            puVar41 = (ulong *)((long)puVar41 + 2);
                          }
                          if (puVar30 < puVar50) {
                            puVar30 = (ulong *)((long)puVar30 +
                                               (ulong)((BYTE)*puVar41 == (BYTE)*puVar30));
                          }
                          pBVar58 = (BYTE *)((long)puVar30 - (long)puVar44);
                        }
                        pBVar58 = pBVar58 + (long)puVar35;
                        if (pBVar46 < pBVar58) {
                          iVar49 = uVar12 + (U32)pBVar58;
                          if (pBVar58 <= (BYTE *)(ulong)(iVar57 - uVar12)) {
                            iVar49 = iVar57;
                          }
                          pZVar7[(long)local_1c8].off = (int)local_d0 - uVar12;
                          pZVar7[(long)local_1c8].len = (U32)pBVar58;
                          local_1c8 = (BYTE *)(ulong)((int)local_1c8 + 1);
                          pBVar46 = pBVar58;
                          iVar57 = iVar49;
                          if ((pBVar58 < (BYTE *)0x1001) &&
                             ((ulong *)((long)puVar39 + (long)pBVar58) != puVar50))
                          goto LAB_00122f01;
LAB_00122f89:
                          bVar61 = false;
                        }
                        else {
LAB_00122f01:
                          puVar24 = pUVar59 + (uVar12 & uVar26) * 2;
                          if (*(byte *)((long)puVar39 + (long)pBVar58) <=
                              pBVar37[(long)(pBVar58 + uVar34)]) {
                            *local_188 = uVar12;
                            local_1f0 = (ulong *)pBVar58;
                            local_188 = puVar24;
                            if (uVar19 < uVar12) goto LAB_00122f5d;
                            local_188 = (uint *)&local_f8;
                            goto LAB_00122f89;
                          }
                          *local_180 = uVar12;
                          pBVar45 = pBVar58;
                          if (uVar19 < uVar12) {
                            puVar24 = puVar24 + 1;
                            local_180 = puVar24;
LAB_00122f5d:
                            uVar34 = (ulong)*puVar24;
                            bVar61 = true;
                          }
                          else {
                            bVar61 = false;
                            local_180 = (uint *)&local_f8;
                          }
                        }
                      } while (bVar61);
                      goto LAB_00122faa;
                    }
                  }
                }
LAB_00122fcb:
                if ((uint)local_1f0 == 0) {
                  uVar12 = 0x13;
                }
                else {
                  uVar19 = pZVar7[(uint)local_1f0 - 1].len;
                  pZVar18 = (ZSTD_optimal_t *)(ulong)uVar19;
                  bVar61 = 0xfff < uVar19 + iVar32;
                  uVar12 = 0;
                  if (bVar61 || (uint)local_d8 < uVar19) {
                    UVar13 = 0;
                    if (local_c8->mlen == 0) {
                      UVar13 = local_c8->litlen;
                    }
                    local_b4 = pZVar7[(uint)local_1f0 - 1].off;
                    uVar12 = iVar32 - UVar13;
                    uVar28 = (ulong)(uVar19 + (U32)local_168 + uVar12);
                    if (0x1000 < uVar12) {
                      uVar12 = 0;
                    }
                    local_1c0 = (ZSTD_optimal_t *)(ulong)uVar12;
                    uVar12 = 7;
                    local_80 = local_168;
                  }
                  else {
                    pZVar18 = (ZSTD_optimal_t *)((ulong)local_130 & 0xffffffff);
                  }
                  local_130 = pZVar18;
                  if (!bVar61 && (uint)local_d8 >= uVar19) {
                    uVar12 = (uint)(byte)local_108;
                    local_110 = (ZSTD_optimal_t *)
                                CONCAT44(local_110._4_4_,(uint)local_110 + (int)local_a0);
                    uVar17 = 0;
                    local_c8 = pZVar18;
                    do {
                      UVar13 = pZVar7[uVar17].off;
                      rVar63 = ZSTD_updateRep(pZVar36[(long)local_1c0].rep,UVar13,uVar12);
                      uVar19 = (uint)local_88;
                      if (uVar17 != 0) {
                        uVar19 = pZVar7[uVar17 - 1].len + 1;
                      }
                      uVar26 = pZVar7[uVar17].len;
                      if (uVar19 <= uVar26) {
                        uVar23 = 0x1f;
                        if (UVar13 + 1 != 0) {
                          for (; UVar13 + 1 >> uVar23 == 0; uVar23 = uVar23 - 1) {
                          }
                        }
                        do {
                          if ((ms->opt).priceType == zop_predef) {
                            uVar31 = uVar26 - 2;
                            iVar32 = 0x1f;
                            if (uVar31 != 0) {
                              for (; uVar31 >> iVar32 == 0; iVar32 = iVar32 + -1) {
                              }
                            }
                            iVar32 = (iVar32 + uVar23) * 0x100 +
                                     (uVar31 * 0x100 >> ((byte)iVar32 & 0x1f)) + 0x1000;
                          }
                          else {
                            uVar20 = uVar26 - 3;
                            uVar31 = (ms->opt).offCodeFreq[uVar23] + 1;
                            iVar32 = 0x1f;
                            if (uVar31 != 0) {
                              for (; uVar31 >> iVar32 == 0; iVar32 = iVar32 + -1) {
                              }
                            }
                            if (uVar20 < 0x80) {
                              uVar20 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar20];
                            }
                            else {
                              uVar54 = 0x1f;
                              if (uVar20 != 0) {
                                for (; uVar20 >> uVar54 == 0; uVar54 = uVar54 - 1) {
                                }
                              }
                              uVar20 = (uVar54 ^ 0xffffffe0) + 0x44;
                            }
                            uVar54 = (ms->opt).matchLengthFreq[uVar20] + 1;
                            iVar57 = 0x1f;
                            if (uVar54 != 0) {
                              for (; uVar54 >> iVar57 == 0; iVar57 = iVar57 + -1) {
                              }
                            }
                            iVar32 = (((ms->opt).offCodeSumBasePrice +
                                      (ms->opt).matchLengthSumBasePrice) -
                                     ((uVar31 * 0x100 >> ((byte)iVar32 & 0x1f)) +
                                     (uVar54 * 0x100 >> ((byte)iVar57 & 0x1f)))) +
                                     ((ML_bits[uVar20] + uVar23) - (iVar32 + iVar57)) * 0x100 + 0x33
                            ;
                          }
                          uVar31 = uVar26 + (int)local_1c0;
                          uVar21 = (ulong)uVar31;
                          if (((uint)uVar28 < uVar31) ||
                             ((int)(iVar32 + (uint)local_110) < pZVar36[uVar21].price)) {
                            if ((uint)uVar28 < uVar31) {
                              uVar28 = uVar28 & 0xffffffff;
                              pZVar18 = pZVar6 + uVar28;
                              do {
                                uVar28 = uVar28 + 1;
                                pZVar18->price = 0x40000000;
                                pZVar18 = pZVar18 + 1;
                              } while (uVar28 < uVar21);
                            }
                            pZVar36[uVar21].mlen = uVar26;
                            pZVar36[uVar21].off = UVar13;
                            pZVar36[uVar21].litlen = (U32)local_168;
                            pZVar36[uVar21].price = iVar32 + (uint)local_110;
                            *(long *)pZVar36[uVar21].rep = rVar63.rep._0_8_;
                            pZVar36[uVar21].rep[2] = rVar63.rep[2];
                          }
                          uVar26 = uVar26 - 1;
                        } while (uVar19 <= uVar26);
                      }
                      uVar17 = uVar17 + 1;
                    } while (uVar17 != (uint)local_1f0 + ((uint)local_1f0 == 0));
                    uVar12 = 0;
                    local_130 = local_c8;
                  }
                }
              }
            }
            if (uVar12 < 0x11) {
              if (uVar12 != 0) {
                if (uVar12 == 7) goto LAB_001236aa;
                goto LAB_00123922;
              }
            }
            else if (uVar12 != 0x13) {
              if (uVar12 != 0x11) goto LAB_00123922;
              break;
            }
            uVar12 = (int)local_1c0 + 1;
            local_1c0 = (ZSTD_optimal_t *)(ulong)uVar12;
          } while (uVar12 <= (uint)uVar28);
        }
        uVar17 = uVar28 & 0xffffffff;
        iVar32 = pZVar36[uVar17].price;
        local_b4 = pZVar36[uVar17].off;
        local_130 = (ZSTD_optimal_t *)(ulong)pZVar36[uVar17].mlen;
        local_80 = (ZSTD_optimal_t *)(ulong)pZVar36[uVar17].litlen;
        local_40 = pZVar36[uVar17].rep[2];
        local_48 = *(undefined8 *)pZVar36[uVar17].rep;
        uVar12 = pZVar36[uVar17].litlen + pZVar36[uVar17].mlen;
        uVar19 = (uint)uVar28 - uVar12;
        if ((uint)uVar28 < uVar12) {
          uVar19 = 0;
        }
        local_1c0 = (ZSTD_optimal_t *)(ulong)uVar19;
        goto LAB_001236c8;
      }
LAB_00123922:
    } while (puVar38 < puVar55);
  }
  return (long)puVar50 - (long)local_78;
}

Assistant:

size_t ZSTD_compressBlock_btultra2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        const void* src, size_t srcSize)
{
    U32 const current = (U32)((const BYTE*)src - ms->window.base);
    DEBUGLOG(5, "ZSTD_compressBlock_btultra2 (srcSize=%zu)", srcSize);

    /* 2-pass strategy:
     * this strategy makes a first pass over first block to collect statistics
     * and seed next round's statistics with it.
     * After 1st pass, function forgets everything, and starts a new block.
     * Consequently, this can only work if no data has been previously loaded in tables,
     * aka, no dictionary, no prefix, no ldm preprocessing.
     * The compression ratio gain is generally small (~0.5% on first block),
     * the cost is 2x cpu time on first block. */
    assert(srcSize <= ZSTD_BLOCKSIZE_MAX);
    if ( (ms->opt.litLengthSum==0)   /* first block */
      && (seqStore->sequences == seqStore->sequencesStart)  /* no ldm */
      && (ms->window.dictLimit == ms->window.lowLimit)   /* no dictionary */
      && (current == ms->window.dictLimit)   /* start of frame, nothing already loaded nor skipped */
      && (srcSize > ZSTD_PREDEF_THRESHOLD)
      ) {
        ZSTD_initStats_ultra(ms, seqStore, rep, src, srcSize);
    }

    return ZSTD_compressBlock_opt_generic(ms, seqStore, rep, src, srcSize, 2 /*optLevel*/, ZSTD_noDict);
}